

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  uint uVar76;
  uint uVar77;
  undefined1 (*pauVar78) [32];
  ulong uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  int iVar83;
  ulong uVar84;
  long lVar85;
  float fVar86;
  float fVar115;
  float fVar117;
  __m128 a;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar119;
  undefined1 auVar104 [32];
  float fVar116;
  float fVar118;
  float fVar120;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar90 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar124;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar155;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar154;
  float fVar156;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar159 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar200;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [28];
  float fVar198;
  float fVar199;
  float fVar201;
  float fVar202;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar203;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar204;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [28];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar232 [16];
  float fVar231;
  undefined1 auVar233 [16];
  float fVar230;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar247;
  float fVar249;
  float fVar253;
  float fVar255;
  float fVar257;
  undefined1 auVar238 [32];
  float fVar251;
  undefined1 auVar239 [32];
  float fVar248;
  float fVar250;
  float fVar252;
  float fVar254;
  float fVar256;
  float fVar258;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar262 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar277;
  float fVar280;
  float fVar286;
  float fVar289;
  float fVar292;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar283;
  undefined1 auVar269 [32];
  float fVar278;
  float fVar281;
  float fVar284;
  float fVar287;
  float fVar290;
  float fVar293;
  undefined1 auVar270 [32];
  float fVar279;
  float fVar282;
  float fVar285;
  float fVar288;
  float fVar291;
  float fVar294;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [64];
  float fVar295;
  float fVar296;
  float fVar306;
  float fVar308;
  float fVar311;
  float fVar314;
  float fVar317;
  float fVar320;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar307;
  float fVar309;
  float fVar312;
  float fVar315;
  float fVar318;
  float fVar321;
  float fVar323;
  undefined1 auVar304 [32];
  float fVar310;
  float fVar313;
  float fVar316;
  float fVar319;
  float fVar322;
  undefined1 auVar305 [32];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar328 [32];
  undefined1 auVar327 [32];
  undefined1 auVar329 [64];
  float fVar358;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar334;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  float fVar335;
  undefined1 auVar336 [16];
  float fVar344;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar345;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar351 [64];
  undefined1 auVar360 [16];
  float fVar359;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float in_register_0000151c;
  undefined1 auVar361 [32];
  float fVar369;
  undefined1 auVar362 [64];
  float fVar370;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar384 [16];
  float in_register_0000159c;
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [64];
  float fVar392;
  float fVar396;
  float fVar397;
  float in_register_000015dc;
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  float local_bc0;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 auStack_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 (*local_928) [16];
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  ulong local_8c0;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  uint local_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  undefined1 auStack_5e0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_470 [16];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar9 = prim[1];
  uVar84 = (ulong)(byte)PVar9;
  lVar85 = uVar84 * 5;
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar173 = *(float *)(prim + uVar84 * 0x19 + 0x12);
  auVar17 = vsubps_avx(auVar17,*(undefined1 (*) [16])(prim + uVar84 * 0x19 + 6));
  auVar125._0_4_ = fVar173 * auVar17._0_4_;
  auVar125._4_4_ = fVar173 * auVar17._4_4_;
  auVar125._8_4_ = fVar173 * auVar17._8_4_;
  auVar125._12_4_ = fVar173 * auVar17._12_4_;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 6)));
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 10)));
  auVar97._0_4_ = fVar173 * auVar18._0_4_;
  auVar97._4_4_ = fVar173 * auVar18._4_4_;
  auVar97._8_4_ = fVar173 * auVar18._8_4_;
  auVar97._12_4_ = fVar173 * auVar18._12_4_;
  auVar99._16_16_ = auVar127;
  auVar99._0_16_ = auVar17;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar85 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar85 + 10)));
  auVar162._16_16_ = auVar18;
  auVar162._0_16_ = auVar17;
  auVar153 = vcvtdq2ps_avx(auVar162);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 10)));
  auVar190._16_16_ = auVar18;
  auVar190._0_16_ = auVar17;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xb + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xb + 10)));
  auVar349 = vcvtdq2ps_avx(auVar190);
  auVar191._16_16_ = auVar18;
  auVar191._0_16_ = auVar17;
  auVar13 = vcvtdq2ps_avx(auVar191);
  uVar79 = (ulong)((uint)(byte)PVar9 * 0xc);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 10)));
  auVar265._16_16_ = auVar18;
  auVar265._0_16_ = auVar17;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + uVar84 + 6)));
  auVar165 = vcvtdq2ps_avx(auVar265);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + uVar84 + 10)));
  auVar297._16_16_ = auVar18;
  auVar297._0_16_ = auVar17;
  lVar11 = uVar84 * 9;
  uVar79 = (ulong)(uint)((int)lVar11 * 2);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar297);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 10)));
  auVar298._16_16_ = auVar18;
  auVar298._0_16_ = auVar17;
  auVar377 = vcvtdq2ps_avx(auVar298);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + uVar84 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + uVar84 + 10)));
  auVar330._16_16_ = auVar18;
  auVar330._0_16_ = auVar17;
  uVar79 = (ulong)(uint)((int)lVar85 << 2);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 10)));
  auVar15 = vcvtdq2ps_avx(auVar330);
  auVar337._16_16_ = auVar18;
  auVar337._0_16_ = auVar17;
  auVar16 = vcvtdq2ps_avx(auVar337);
  auVar17 = vshufps_avx(auVar97,auVar97,0);
  auVar18 = vshufps_avx(auVar97,auVar97,0x55);
  auVar127 = vshufps_avx(auVar97,auVar97,0xaa);
  fVar173 = auVar127._0_4_;
  fVar198 = auVar127._4_4_;
  fVar199 = auVar127._8_4_;
  fVar200 = auVar127._12_4_;
  fVar201 = auVar18._0_4_;
  fVar202 = auVar18._4_4_;
  fVar203 = auVar18._8_4_;
  fVar204 = auVar18._12_4_;
  fVar220 = auVar17._0_4_;
  fVar221 = auVar17._4_4_;
  fVar222 = auVar17._8_4_;
  fVar224 = auVar17._12_4_;
  auVar361._0_4_ = fVar220 * auVar99._0_4_ + fVar201 * auVar153._0_4_ + fVar173 * auVar349._0_4_;
  auVar361._4_4_ = fVar221 * auVar99._4_4_ + fVar202 * auVar153._4_4_ + fVar198 * auVar349._4_4_;
  auVar361._8_4_ = fVar222 * auVar99._8_4_ + fVar203 * auVar153._8_4_ + fVar199 * auVar349._8_4_;
  auVar361._12_4_ = fVar224 * auVar99._12_4_ + fVar204 * auVar153._12_4_ + fVar200 * auVar349._12_4_
  ;
  auVar361._16_4_ = fVar220 * auVar99._16_4_ + fVar201 * auVar153._16_4_ + fVar173 * auVar349._16_4_
  ;
  auVar361._20_4_ = fVar221 * auVar99._20_4_ + fVar202 * auVar153._20_4_ + fVar198 * auVar349._20_4_
  ;
  auVar361._24_4_ = fVar222 * auVar99._24_4_ + fVar203 * auVar153._24_4_ + fVar199 * auVar349._24_4_
  ;
  auVar361._28_4_ = fVar204 + in_register_000015dc + in_register_0000151c;
  auVar346._0_4_ = fVar220 * auVar13._0_4_ + fVar201 * auVar165._0_4_ + auVar14._0_4_ * fVar173;
  auVar346._4_4_ = fVar221 * auVar13._4_4_ + fVar202 * auVar165._4_4_ + auVar14._4_4_ * fVar198;
  auVar346._8_4_ = fVar222 * auVar13._8_4_ + fVar203 * auVar165._8_4_ + auVar14._8_4_ * fVar199;
  auVar346._12_4_ = fVar224 * auVar13._12_4_ + fVar204 * auVar165._12_4_ + auVar14._12_4_ * fVar200;
  auVar346._16_4_ = fVar220 * auVar13._16_4_ + fVar201 * auVar165._16_4_ + auVar14._16_4_ * fVar173;
  auVar346._20_4_ = fVar221 * auVar13._20_4_ + fVar202 * auVar165._20_4_ + auVar14._20_4_ * fVar198;
  auVar346._24_4_ = fVar222 * auVar13._24_4_ + fVar203 * auVar165._24_4_ + auVar14._24_4_ * fVar199;
  auVar346._28_4_ = fVar204 + in_register_000015dc + in_register_0000159c;
  auVar238._0_4_ = fVar220 * auVar377._0_4_ + fVar201 * auVar15._0_4_ + auVar16._0_4_ * fVar173;
  auVar238._4_4_ = fVar221 * auVar377._4_4_ + fVar202 * auVar15._4_4_ + auVar16._4_4_ * fVar198;
  auVar238._8_4_ = fVar222 * auVar377._8_4_ + fVar203 * auVar15._8_4_ + auVar16._8_4_ * fVar199;
  auVar238._12_4_ = fVar224 * auVar377._12_4_ + fVar204 * auVar15._12_4_ + auVar16._12_4_ * fVar200;
  auVar238._16_4_ = fVar220 * auVar377._16_4_ + fVar201 * auVar15._16_4_ + auVar16._16_4_ * fVar173;
  auVar238._20_4_ = fVar221 * auVar377._20_4_ + fVar202 * auVar15._20_4_ + auVar16._20_4_ * fVar198;
  auVar238._24_4_ = fVar222 * auVar377._24_4_ + fVar203 * auVar15._24_4_ + auVar16._24_4_ * fVar199;
  auVar238._28_4_ = fVar224 + fVar204 + fVar200;
  auVar17 = vshufps_avx(auVar125,auVar125,0);
  auVar18 = vshufps_avx(auVar125,auVar125,0x55);
  auVar127 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar198 = auVar127._0_4_;
  fVar199 = auVar127._4_4_;
  fVar200 = auVar127._8_4_;
  fVar201 = auVar127._12_4_;
  fVar221 = auVar18._0_4_;
  fVar222 = auVar18._4_4_;
  fVar224 = auVar18._8_4_;
  fVar226 = auVar18._12_4_;
  fVar202 = auVar17._0_4_;
  fVar203 = auVar17._4_4_;
  fVar204 = auVar17._8_4_;
  fVar220 = auVar17._12_4_;
  fVar173 = auVar99._28_4_;
  auVar266._0_4_ = fVar202 * auVar99._0_4_ + fVar221 * auVar153._0_4_ + fVar198 * auVar349._0_4_;
  auVar266._4_4_ = fVar203 * auVar99._4_4_ + fVar222 * auVar153._4_4_ + fVar199 * auVar349._4_4_;
  auVar266._8_4_ = fVar204 * auVar99._8_4_ + fVar224 * auVar153._8_4_ + fVar200 * auVar349._8_4_;
  auVar266._12_4_ = fVar220 * auVar99._12_4_ + fVar226 * auVar153._12_4_ + fVar201 * auVar349._12_4_
  ;
  auVar266._16_4_ = fVar202 * auVar99._16_4_ + fVar221 * auVar153._16_4_ + fVar198 * auVar349._16_4_
  ;
  auVar266._20_4_ = fVar203 * auVar99._20_4_ + fVar222 * auVar153._20_4_ + fVar199 * auVar349._20_4_
  ;
  auVar266._24_4_ = fVar204 * auVar99._24_4_ + fVar224 * auVar153._24_4_ + fVar200 * auVar349._24_4_
  ;
  auVar266._28_4_ = fVar173 + auVar153._28_4_ + auVar349._28_4_;
  auVar141._0_4_ = fVar202 * auVar13._0_4_ + auVar14._0_4_ * fVar198 + fVar221 * auVar165._0_4_;
  auVar141._4_4_ = fVar203 * auVar13._4_4_ + auVar14._4_4_ * fVar199 + fVar222 * auVar165._4_4_;
  auVar141._8_4_ = fVar204 * auVar13._8_4_ + auVar14._8_4_ * fVar200 + fVar224 * auVar165._8_4_;
  auVar141._12_4_ = fVar220 * auVar13._12_4_ + auVar14._12_4_ * fVar201 + fVar226 * auVar165._12_4_;
  auVar141._16_4_ = fVar202 * auVar13._16_4_ + auVar14._16_4_ * fVar198 + fVar221 * auVar165._16_4_;
  auVar141._20_4_ = fVar203 * auVar13._20_4_ + auVar14._20_4_ * fVar199 + fVar222 * auVar165._20_4_;
  auVar141._24_4_ = fVar204 * auVar13._24_4_ + auVar14._24_4_ * fVar200 + fVar224 * auVar165._24_4_;
  auVar141._28_4_ = fVar173 + auVar14._28_4_ + auVar349._28_4_;
  auVar299._8_4_ = 0x7fffffff;
  auVar299._0_8_ = 0x7fffffff7fffffff;
  auVar299._12_4_ = 0x7fffffff;
  auVar299._16_4_ = 0x7fffffff;
  auVar299._20_4_ = 0x7fffffff;
  auVar299._24_4_ = 0x7fffffff;
  auVar299._28_4_ = 0x7fffffff;
  auVar331._8_4_ = 0x219392ef;
  auVar331._0_8_ = 0x219392ef219392ef;
  auVar331._12_4_ = 0x219392ef;
  auVar331._16_4_ = 0x219392ef;
  auVar331._20_4_ = 0x219392ef;
  auVar331._24_4_ = 0x219392ef;
  auVar331._28_4_ = 0x219392ef;
  auVar99 = vandps_avx(auVar361,auVar299);
  auVar99 = vcmpps_avx(auVar99,auVar331,1);
  auVar153 = vblendvps_avx(auVar361,auVar331,auVar99);
  auVar99 = vandps_avx(auVar346,auVar299);
  auVar99 = vcmpps_avx(auVar99,auVar331,1);
  auVar349 = vblendvps_avx(auVar346,auVar331,auVar99);
  auVar99 = vandps_avx(auVar238,auVar299);
  auVar99 = vcmpps_avx(auVar99,auVar331,1);
  auVar99 = vblendvps_avx(auVar238,auVar331,auVar99);
  auVar163._0_4_ = fVar221 * auVar15._0_4_ + auVar16._0_4_ * fVar198 + fVar202 * auVar377._0_4_;
  auVar163._4_4_ = fVar222 * auVar15._4_4_ + auVar16._4_4_ * fVar199 + fVar203 * auVar377._4_4_;
  auVar163._8_4_ = fVar224 * auVar15._8_4_ + auVar16._8_4_ * fVar200 + fVar204 * auVar377._8_4_;
  auVar163._12_4_ = fVar226 * auVar15._12_4_ + auVar16._12_4_ * fVar201 + fVar220 * auVar377._12_4_;
  auVar163._16_4_ = fVar221 * auVar15._16_4_ + auVar16._16_4_ * fVar198 + fVar202 * auVar377._16_4_;
  auVar163._20_4_ = fVar222 * auVar15._20_4_ + auVar16._20_4_ * fVar199 + fVar203 * auVar377._20_4_;
  auVar163._24_4_ = fVar224 * auVar15._24_4_ + auVar16._24_4_ * fVar200 + fVar204 * auVar377._24_4_;
  auVar163._28_4_ = auVar165._28_4_ + fVar201 + fVar173;
  auVar13 = vrcpps_avx(auVar153);
  fVar173 = auVar13._0_4_;
  fVar198 = auVar13._4_4_;
  auVar165._4_4_ = auVar153._4_4_ * fVar198;
  auVar165._0_4_ = auVar153._0_4_ * fVar173;
  fVar199 = auVar13._8_4_;
  auVar165._8_4_ = auVar153._8_4_ * fVar199;
  fVar200 = auVar13._12_4_;
  auVar165._12_4_ = auVar153._12_4_ * fVar200;
  fVar201 = auVar13._16_4_;
  auVar165._16_4_ = auVar153._16_4_ * fVar201;
  fVar202 = auVar13._20_4_;
  auVar165._20_4_ = auVar153._20_4_ * fVar202;
  fVar203 = auVar13._24_4_;
  auVar165._24_4_ = auVar153._24_4_ * fVar203;
  auVar165._28_4_ = auVar153._28_4_;
  auVar326._8_4_ = 0x3f800000;
  auVar326._0_8_ = 0x3f8000003f800000;
  auVar326._12_4_ = 0x3f800000;
  auVar326._16_4_ = 0x3f800000;
  auVar326._20_4_ = 0x3f800000;
  auVar326._24_4_ = 0x3f800000;
  auVar326._28_4_ = 0x3f800000;
  auVar165 = vsubps_avx(auVar326,auVar165);
  auVar153 = vrcpps_avx(auVar349);
  fVar173 = fVar173 + fVar173 * auVar165._0_4_;
  fVar198 = fVar198 + fVar198 * auVar165._4_4_;
  fVar199 = fVar199 + fVar199 * auVar165._8_4_;
  fVar200 = fVar200 + fVar200 * auVar165._12_4_;
  fVar201 = fVar201 + fVar201 * auVar165._16_4_;
  fVar202 = fVar202 + fVar202 * auVar165._20_4_;
  fVar203 = fVar203 + fVar203 * auVar165._24_4_;
  fVar230 = auVar153._0_4_;
  fVar247 = auVar153._4_4_;
  auVar14._4_4_ = fVar247 * auVar349._4_4_;
  auVar14._0_4_ = fVar230 * auVar349._0_4_;
  fVar249 = auVar153._8_4_;
  auVar14._8_4_ = fVar249 * auVar349._8_4_;
  fVar251 = auVar153._12_4_;
  auVar14._12_4_ = fVar251 * auVar349._12_4_;
  fVar253 = auVar153._16_4_;
  auVar14._16_4_ = fVar253 * auVar349._16_4_;
  fVar255 = auVar153._20_4_;
  auVar14._20_4_ = fVar255 * auVar349._20_4_;
  fVar257 = auVar153._24_4_;
  auVar14._24_4_ = fVar257 * auVar349._24_4_;
  auVar14._28_4_ = auVar13._28_4_;
  auVar153 = vsubps_avx(auVar326,auVar14);
  fVar230 = fVar230 + fVar230 * auVar153._0_4_;
  fVar247 = fVar247 + fVar247 * auVar153._4_4_;
  fVar249 = fVar249 + fVar249 * auVar153._8_4_;
  fVar251 = fVar251 + fVar251 * auVar153._12_4_;
  fVar253 = fVar253 + fVar253 * auVar153._16_4_;
  fVar255 = fVar255 + fVar255 * auVar153._20_4_;
  fVar257 = fVar257 + fVar257 * auVar153._24_4_;
  auVar153 = vrcpps_avx(auVar99);
  fVar204 = auVar153._0_4_;
  fVar220 = auVar153._4_4_;
  auVar377._4_4_ = fVar220 * auVar99._4_4_;
  auVar377._0_4_ = fVar204 * auVar99._0_4_;
  fVar221 = auVar153._8_4_;
  auVar377._8_4_ = fVar221 * auVar99._8_4_;
  fVar222 = auVar153._12_4_;
  auVar377._12_4_ = fVar222 * auVar99._12_4_;
  fVar224 = auVar153._16_4_;
  auVar377._16_4_ = fVar224 * auVar99._16_4_;
  fVar226 = auVar153._20_4_;
  auVar377._20_4_ = fVar226 * auVar99._20_4_;
  fVar228 = auVar153._24_4_;
  auVar377._24_4_ = fVar228 * auVar99._24_4_;
  auVar377._28_4_ = auVar349._28_4_;
  auVar99 = vsubps_avx(auVar326,auVar377);
  fVar204 = fVar204 + fVar204 * auVar99._0_4_;
  fVar220 = fVar220 + fVar220 * auVar99._4_4_;
  fVar221 = fVar221 + fVar221 * auVar99._8_4_;
  fVar222 = fVar222 + fVar222 * auVar99._12_4_;
  fVar224 = fVar224 + fVar224 * auVar99._16_4_;
  fVar226 = fVar226 + fVar226 * auVar99._20_4_;
  fVar228 = fVar228 + fVar228 * auVar99._24_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar84 * 7 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar84 * 7 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar100._16_16_ = auVar18;
  auVar100._0_16_ = auVar17;
  auVar99 = vcvtdq2ps_avx(auVar100);
  auVar99 = vsubps_avx(auVar99,auVar266);
  auVar87._0_4_ = fVar173 * auVar99._0_4_;
  auVar87._4_4_ = fVar198 * auVar99._4_4_;
  auVar87._8_4_ = fVar199 * auVar99._8_4_;
  auVar87._12_4_ = fVar200 * auVar99._12_4_;
  auVar349._16_4_ = fVar201 * auVar99._16_4_;
  auVar349._0_16_ = auVar87;
  auVar349._20_4_ = fVar202 * auVar99._20_4_;
  auVar349._24_4_ = fVar203 * auVar99._24_4_;
  auVar349._28_4_ = auVar99._28_4_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + lVar11 + 6);
  auVar17 = vpmovsxwd_avx(auVar127);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + lVar11 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar4);
  auVar300._16_16_ = auVar18;
  auVar300._0_16_ = auVar17;
  auVar99 = vcvtdq2ps_avx(auVar300);
  auVar99 = vsubps_avx(auVar99,auVar266);
  auVar174._0_4_ = fVar173 * auVar99._0_4_;
  auVar174._4_4_ = fVar198 * auVar99._4_4_;
  auVar174._8_4_ = fVar199 * auVar99._8_4_;
  auVar174._12_4_ = fVar200 * auVar99._12_4_;
  auVar15._16_4_ = fVar201 * auVar99._16_4_;
  auVar15._0_16_ = auVar174;
  auVar15._20_4_ = fVar202 * auVar99._20_4_;
  auVar15._24_4_ = fVar203 * auVar99._24_4_;
  auVar15._28_4_ = auVar13._28_4_ + auVar165._28_4_;
  lVar85 = (ulong)(byte)PVar9 * 0x10;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + lVar85 + 6);
  auVar17 = vpmovsxwd_avx(auVar233);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar85 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar5);
  lVar85 = lVar85 + uVar84 * -2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar85 + 6);
  auVar127 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar85 + 0xe);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar267._16_16_ = auVar4;
  auVar267._0_16_ = auVar127;
  auVar99 = vcvtdq2ps_avx(auVar267);
  auVar99 = vsubps_avx(auVar99,auVar141);
  auVar262._0_4_ = fVar230 * auVar99._0_4_;
  auVar262._4_4_ = fVar247 * auVar99._4_4_;
  auVar262._8_4_ = fVar249 * auVar99._8_4_;
  auVar262._12_4_ = fVar251 * auVar99._12_4_;
  auVar13._16_4_ = fVar253 * auVar99._16_4_;
  auVar13._0_16_ = auVar262;
  auVar13._20_4_ = fVar255 * auVar99._20_4_;
  auVar13._24_4_ = fVar257 * auVar99._24_4_;
  auVar13._28_4_ = auVar99._28_4_;
  auVar301._16_16_ = auVar18;
  auVar301._0_16_ = auVar17;
  auVar99 = vcvtdq2ps_avx(auVar301);
  auVar99 = vsubps_avx(auVar99,auVar141);
  auVar126._0_4_ = fVar230 * auVar99._0_4_;
  auVar126._4_4_ = fVar247 * auVar99._4_4_;
  auVar126._8_4_ = fVar249 * auVar99._8_4_;
  auVar126._12_4_ = fVar251 * auVar99._12_4_;
  auVar16._16_4_ = fVar253 * auVar99._16_4_;
  auVar16._0_16_ = auVar126;
  auVar16._20_4_ = fVar255 * auVar99._20_4_;
  auVar16._24_4_ = fVar257 * auVar99._24_4_;
  auVar16._28_4_ = auVar99._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar79 + uVar84 + 6);
  auVar17 = vpmovsxwd_avx(auVar8);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar79 + uVar84 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar128);
  auVar239._16_16_ = auVar18;
  auVar239._0_16_ = auVar17;
  auVar99 = vcvtdq2ps_avx(auVar239);
  auVar99 = vsubps_avx(auVar99,auVar163);
  auVar232._0_4_ = fVar204 * auVar99._0_4_;
  auVar232._4_4_ = fVar220 * auVar99._4_4_;
  auVar232._8_4_ = fVar221 * auVar99._8_4_;
  auVar232._12_4_ = fVar222 * auVar99._12_4_;
  auVar350._16_4_ = fVar224 * auVar99._16_4_;
  auVar350._0_16_ = auVar232;
  auVar350._20_4_ = fVar226 * auVar99._20_4_;
  auVar350._24_4_ = fVar228 * auVar99._24_4_;
  auVar350._28_4_ = auVar99._28_4_;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar84 * 0x17 + 6);
  auVar17 = vpmovsxwd_avx(auVar182);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar84 * 0x17 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar95);
  auVar302._16_16_ = auVar18;
  auVar302._0_16_ = auVar17;
  auVar99 = vcvtdq2ps_avx(auVar302);
  auVar99 = vsubps_avx(auVar99,auVar163);
  auVar157._0_4_ = fVar204 * auVar99._0_4_;
  auVar157._4_4_ = fVar220 * auVar99._4_4_;
  auVar157._8_4_ = fVar221 * auVar99._8_4_;
  auVar157._12_4_ = fVar222 * auVar99._12_4_;
  auVar26._16_4_ = fVar224 * auVar99._16_4_;
  auVar26._0_16_ = auVar157;
  auVar26._20_4_ = fVar226 * auVar99._20_4_;
  auVar26._24_4_ = fVar228 * auVar99._24_4_;
  auVar26._28_4_ = auVar99._28_4_;
  auVar17 = vpminsd_avx(auVar349._16_16_,auVar15._16_16_);
  auVar18 = vpminsd_avx(auVar87,auVar174);
  auVar327._16_16_ = auVar17;
  auVar327._0_16_ = auVar18;
  auVar17 = vpminsd_avx(auVar13._16_16_,auVar16._16_16_);
  auVar18 = vpminsd_avx(auVar262,auVar126);
  auVar347._16_16_ = auVar17;
  auVar347._0_16_ = auVar18;
  auVar99 = vmaxps_avx(auVar327,auVar347);
  auVar17 = vpminsd_avx(auVar350._16_16_,auVar26._16_16_);
  auVar18 = vpminsd_avx(auVar232,auVar157);
  auVar371._16_16_ = auVar17;
  auVar371._0_16_ = auVar18;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar385._4_4_ = uVar2;
  auVar385._0_4_ = uVar2;
  auVar385._8_4_ = uVar2;
  auVar385._12_4_ = uVar2;
  auVar385._16_4_ = uVar2;
  auVar385._20_4_ = uVar2;
  auVar385._24_4_ = uVar2;
  auVar385._28_4_ = uVar2;
  auVar153 = vmaxps_avx(auVar371,auVar385);
  auVar99 = vmaxps_avx(auVar99,auVar153);
  local_320._4_4_ = auVar99._4_4_ * 0.99999964;
  local_320._0_4_ = auVar99._0_4_ * 0.99999964;
  local_320._8_4_ = auVar99._8_4_ * 0.99999964;
  local_320._12_4_ = auVar99._12_4_ * 0.99999964;
  local_320._16_4_ = auVar99._16_4_ * 0.99999964;
  local_320._20_4_ = auVar99._20_4_ * 0.99999964;
  local_320._24_4_ = auVar99._24_4_ * 0.99999964;
  local_320._28_4_ = auVar99._28_4_;
  auVar17 = vpmaxsd_avx(auVar349._16_16_,auVar15._16_16_);
  auVar18 = vpmaxsd_avx(auVar87,auVar174);
  auVar101._16_16_ = auVar17;
  auVar101._0_16_ = auVar18;
  auVar17 = vpmaxsd_avx(auVar13._16_16_,auVar16._16_16_);
  auVar18 = vpmaxsd_avx(auVar262,auVar126);
  auVar142._16_16_ = auVar17;
  auVar142._0_16_ = auVar18;
  auVar99 = vminps_avx(auVar101,auVar142);
  auVar17 = vpmaxsd_avx(auVar350._16_16_,auVar26._16_16_);
  auVar18 = vpmaxsd_avx(auVar232,auVar157);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar192._4_4_ = uVar2;
  auVar192._0_4_ = uVar2;
  auVar192._8_4_ = uVar2;
  auVar192._12_4_ = uVar2;
  auVar192._16_4_ = uVar2;
  auVar192._20_4_ = uVar2;
  auVar192._24_4_ = uVar2;
  auVar192._28_4_ = uVar2;
  auVar143._16_16_ = auVar17;
  auVar143._0_16_ = auVar18;
  auVar153 = vminps_avx(auVar143,auVar192);
  auVar99 = vminps_avx(auVar99,auVar153);
  auVar153._4_4_ = auVar99._4_4_ * 1.0000004;
  auVar153._0_4_ = auVar99._0_4_ * 1.0000004;
  auVar153._8_4_ = auVar99._8_4_ * 1.0000004;
  auVar153._12_4_ = auVar99._12_4_ * 1.0000004;
  auVar153._16_4_ = auVar99._16_4_ * 1.0000004;
  auVar153._20_4_ = auVar99._20_4_ * 1.0000004;
  auVar153._24_4_ = auVar99._24_4_ * 1.0000004;
  auVar153._28_4_ = auVar99._28_4_;
  auVar99 = vcmpps_avx(local_320,auVar153,2);
  auVar17 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar144._16_16_ = auVar17;
  auVar144._0_16_ = auVar17;
  auVar153 = vcvtdq2ps_avx(auVar144);
  auVar153 = vcmpps_avx(_DAT_01faff40,auVar153,1);
  auVar99 = vandps_avx(auVar99,auVar153);
  uVar76 = vmovmskps_avx(auVar99);
  if (uVar76 == 0) {
    return;
  }
  uVar76 = uVar76 & 0xff;
  auVar102._16_16_ = mm_lookupmask_ps._240_16_;
  auVar102._0_16_ = mm_lookupmask_ps._240_16_;
  local_400 = vblendps_avx(auVar102,ZEXT832(0) << 0x20,0x80);
  local_928 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7e8 = prim;
LAB_01044cec:
  lVar85 = 0;
  if (uVar76 != 0) {
    for (; (uVar76 >> lVar85 & 1) == 0; lVar85 = lVar85 + 1) {
    }
  }
  uVar82 = *(uint *)(local_7e8 + 2);
  local_8c0 = (ulong)*(uint *)(local_7e8 + lVar85 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar82].ptr;
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  uVar84 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           local_8c0 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar17 = *(undefined1 (*) [16])(lVar11 + (long)pGVar10[1].intersectionFilterN * uVar84);
  auVar18 = *(undefined1 (*) [16])(lVar11 + (long)pGVar10[1].intersectionFilterN * (uVar84 + 1));
  auVar127 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar4 = vinsertps_avx(auVar127,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar173 = *(float *)(ray + k * 4 + 0x40);
  auVar336._4_4_ = fVar173;
  auVar336._0_4_ = fVar173;
  auVar336._8_4_ = fVar173;
  auVar336._12_4_ = fVar173;
  fStack_770 = fVar173;
  _local_780 = auVar336;
  fStack_76c = fVar173;
  fStack_768 = fVar173;
  fStack_764 = fVar173;
  fVar198 = *(float *)(ray + k * 4 + 0x50);
  auVar360._4_4_ = fVar198;
  auVar360._0_4_ = fVar198;
  auVar360._8_4_ = fVar198;
  auVar360._12_4_ = fVar198;
  fStack_890 = fVar198;
  _local_8a0 = auVar360;
  fStack_88c = fVar198;
  fStack_888 = fVar198;
  fStack_884 = fVar198;
  auVar127 = vunpcklps_avx(auVar336,auVar360);
  fVar199 = *(float *)(ray + k * 4 + 0x60);
  auVar384._4_4_ = fVar199;
  auVar384._0_4_ = fVar199;
  auVar384._8_4_ = fVar199;
  auVar384._12_4_ = fVar199;
  fStack_710 = fVar199;
  _local_720 = auVar384;
  fStack_70c = fVar199;
  fStack_708 = fVar199;
  register0x0000159c = fVar199;
  _local_8f0 = vinsertps_avx(auVar127,auVar384,0x28);
  pfVar1 = (float *)(pGVar10[2].intersectionFilterN + uVar84 * (long)pGVar10[2].pointQueryFunc);
  auVar205._0_4_ = auVar17._0_4_ + *pfVar1 * 0.33333334;
  auVar205._4_4_ = auVar17._4_4_ + pfVar1[1] * 0.33333334;
  auVar205._8_4_ = auVar17._8_4_ + pfVar1[2] * 0.33333334;
  auVar205._12_4_ = auVar17._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar10[2].intersectionFilterN + (long)pGVar10[2].pointQueryFunc * (uVar84 + 1)
                    );
  auVar88._0_4_ = *pfVar1 * 0.33333334;
  auVar88._4_4_ = pfVar1[1] * 0.33333334;
  auVar88._8_4_ = pfVar1[2] * 0.33333334;
  auVar88._12_4_ = pfVar1[3] * 0.33333334;
  auVar5 = vsubps_avx(auVar18,auVar88);
  auVar89._0_4_ = (auVar18._0_4_ + auVar17._0_4_ + auVar205._0_4_ + auVar5._0_4_) * 0.25;
  auVar89._4_4_ = (auVar18._4_4_ + auVar17._4_4_ + auVar205._4_4_ + auVar5._4_4_) * 0.25;
  auVar89._8_4_ = (auVar18._8_4_ + auVar17._8_4_ + auVar205._8_4_ + auVar5._8_4_) * 0.25;
  auVar89._12_4_ = (auVar18._12_4_ + auVar17._12_4_ + auVar205._12_4_ + auVar5._12_4_) * 0.25;
  auVar127 = vsubps_avx(auVar89,auVar4);
  auVar127 = vdpps_avx(auVar127,_local_8f0,0x7f);
  local_900 = vdpps_avx(_local_8f0,_local_8f0,0x7f);
  auVar233 = vrcpss_avx(local_900,local_900);
  fVar200 = auVar127._0_4_ * auVar233._0_4_ * (2.0 - local_900._0_4_ * auVar233._0_4_);
  auVar233 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
  auVar175._0_4_ = auVar4._0_4_ + local_8f0._0_4_ * auVar233._0_4_;
  auVar175._4_4_ = auVar4._4_4_ + local_8f0._4_4_ * auVar233._4_4_;
  auVar175._8_4_ = auVar4._8_4_ + local_8f0._8_4_ * auVar233._8_4_;
  auVar175._12_4_ = auVar4._12_4_ + local_8f0._12_4_ * auVar233._12_4_;
  auVar127 = vblendps_avx(auVar175,_DAT_01f7aa10,8);
  auVar6 = vsubps_avx(auVar17,auVar127);
  auVar5 = vsubps_avx(auVar5,auVar127);
  auVar7 = vsubps_avx(auVar205,auVar127);
  auVar8 = vsubps_avx(auVar18,auVar127);
  auVar17 = vshufps_avx(auVar6,auVar6,0);
  auVar18 = vshufps_avx(auVar6,auVar6,0x55);
  local_9e0._16_16_ = auVar18;
  local_9e0._0_16_ = auVar18;
  auVar329 = ZEXT3264(local_9e0);
  auVar18 = vshufps_avx(auVar6,auVar6,0xaa);
  local_960._16_16_ = auVar18;
  local_960._0_16_ = auVar18;
  auVar351 = ZEXT3264(local_960);
  auVar18 = vshufps_avx(auVar6,auVar6,0xff);
  local_980._16_16_ = auVar18;
  local_980._0_16_ = auVar18;
  auVar362 = ZEXT3264(local_980);
  auVar18 = vshufps_avx(auVar7,auVar7,0);
  auVar268._16_16_ = auVar18;
  auVar268._0_16_ = auVar18;
  auVar18 = vshufps_avx(auVar7,auVar7,0x55);
  local_740._16_16_ = auVar18;
  local_740._0_16_ = auVar18;
  auVar391 = ZEXT3264(local_740);
  auVar18 = vshufps_avx(auVar7,auVar7,0xaa);
  auVar127 = vshufps_avx(auVar7,auVar7,0xff);
  local_9c0._16_16_ = auVar127;
  local_9c0._0_16_ = auVar127;
  auVar127 = vshufps_avx(auVar5,auVar5,0);
  local_2c0._16_16_ = auVar127;
  local_2c0._0_16_ = auVar127;
  auVar127 = vshufps_avx(auVar5,auVar5,0x55);
  local_2e0._16_16_ = auVar127;
  local_2e0._0_16_ = auVar127;
  auVar127 = vshufps_avx(auVar5,auVar5,0xaa);
  register0x00001290 = auVar127;
  _local_1e0 = auVar127;
  auVar127 = vshufps_avx(auVar5,auVar5,0xff);
  auVar276 = ZEXT3264(local_9c0);
  register0x00001290 = auVar127;
  _local_200 = auVar127;
  auVar127 = vshufps_avx(auVar8,auVar8,0);
  register0x00001290 = auVar127;
  _local_220 = auVar127;
  auVar127 = vshufps_avx(auVar8,auVar8,0x55);
  register0x00001290 = auVar127;
  _local_240 = auVar127;
  auVar127 = vshufps_avx(auVar8,auVar8,0xaa);
  register0x00001290 = auVar127;
  _local_260 = auVar127;
  auVar127 = vshufps_avx(auVar8,auVar8,0xff);
  register0x00001290 = auVar127;
  _local_280 = auVar127;
  auVar127 = ZEXT416((uint)(fVar173 * fVar173 + fVar198 * fVar198 + fVar199 * fVar199));
  auVar127 = vshufps_avx(auVar127,auVar127,0);
  local_2a0._16_16_ = auVar127;
  local_2a0._0_16_ = auVar127;
  fVar173 = *(float *)(ray + k * 4 + 0x30);
  local_810 = ZEXT416((uint)fVar200);
  auVar127 = vshufps_avx(ZEXT416((uint)(fVar173 - fVar200)),ZEXT416((uint)(fVar173 - fVar200)),0);
  local_300._16_16_ = auVar127;
  local_300._0_16_ = auVar127;
  local_670 = vpshufd_avx(ZEXT416(uVar82),0);
  local_680 = vpshufd_avx(ZEXT416(*(uint *)(local_7e8 + lVar85 * 4 + 6)),0);
  local_c00 = auVar233._0_8_;
  uStack_bf8 = auVar233._8_8_;
  local_880 = local_c00;
  uStack_878 = uStack_bf8;
  uStack_870 = local_c00;
  uStack_868 = uStack_bf8;
  uVar84 = 0;
  local_c08 = 1;
  auVar103._8_4_ = 0x7fffffff;
  auVar103._0_8_ = 0x7fffffff7fffffff;
  auVar103._12_4_ = 0x7fffffff;
  auVar103._16_4_ = 0x7fffffff;
  auVar103._20_4_ = 0x7fffffff;
  auVar103._24_4_ = 0x7fffffff;
  auVar103._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_2a0,auVar103);
  auVar127 = vsqrtss_avx(local_900,local_900);
  auVar4 = vsqrtss_avx(local_900,local_900);
  local_470 = ZEXT816(0x3f80000000000000);
  local_420 = auVar268;
  do {
    auVar193._8_4_ = 0x3f800000;
    auVar193._0_8_ = 0x3f8000003f800000;
    auVar193._12_4_ = 0x3f800000;
    auVar193._16_4_ = 0x3f800000;
    auVar193._20_4_ = 0x3f800000;
    iVar83 = (int)uVar84;
    auVar193._24_4_ = 0x3f800000;
    auVar193._28_4_ = 0x3f800000;
    auVar233 = vmovshdup_avx(local_470);
    auVar182 = vsubps_avx(auVar233,local_470);
    auVar233 = vshufps_avx(local_470,local_470,0);
    local_6c0._16_16_ = auVar233;
    local_6c0._0_16_ = auVar233;
    auVar128 = vshufps_avx(auVar182,auVar182,0);
    local_6e0._16_16_ = auVar128;
    local_6e0._0_16_ = auVar128;
    fVar124 = auVar128._0_4_;
    fVar154 = auVar128._4_4_;
    fVar155 = auVar128._8_4_;
    fVar156 = auVar128._12_4_;
    fVar86 = auVar233._0_4_;
    auVar145._0_4_ = fVar86 + fVar124 * 0.0;
    fVar115 = auVar233._4_4_;
    auVar145._4_4_ = fVar115 + fVar154 * 0.14285715;
    fVar117 = auVar233._8_4_;
    auVar145._8_4_ = fVar117 + fVar155 * 0.2857143;
    fVar119 = auVar233._12_4_;
    auVar145._12_4_ = fVar119 + fVar156 * 0.42857146;
    auVar145._16_4_ = fVar86 + fVar124 * 0.5714286;
    auVar145._20_4_ = fVar115 + fVar154 * 0.71428573;
    auVar145._24_4_ = fVar117 + fVar155 * 0.8571429;
    auVar145._28_4_ = fVar119 + fVar156;
    auVar99 = vsubps_avx(auVar193,auVar145);
    fVar392 = auVar18._0_4_;
    fVar396 = auVar18._4_4_;
    fVar397 = auVar18._8_4_;
    fVar220 = auVar268._28_4_;
    fVar198 = auVar99._0_4_;
    fVar199 = auVar99._4_4_;
    fVar200 = auVar99._8_4_;
    fVar201 = auVar99._12_4_;
    fVar202 = auVar99._16_4_;
    fVar203 = auVar99._20_4_;
    fVar204 = auVar99._24_4_;
    fVar251 = auVar276._28_4_ + fVar220 + auVar17._12_4_ + 1.0 + 1.0;
    fVar259 = local_2c0._0_4_ * auVar145._0_4_ + auVar268._0_4_ * fVar198;
    fVar277 = local_2c0._4_4_ * auVar145._4_4_ + auVar268._4_4_ * fVar199;
    fVar280 = local_2c0._8_4_ * auVar145._8_4_ + auVar268._8_4_ * fVar200;
    fVar283 = local_2c0._12_4_ * auVar145._12_4_ + auVar268._12_4_ * fVar201;
    fVar286 = local_2c0._16_4_ * auVar145._16_4_ + auVar268._16_4_ * fVar202;
    fVar289 = local_2c0._20_4_ * auVar145._20_4_ + auVar268._20_4_ * fVar203;
    fVar292 = local_2c0._24_4_ * auVar145._24_4_ + auVar268._24_4_ * fVar204;
    fVar222 = local_2e0._0_4_ * auVar145._0_4_ + auVar391._0_4_ * fVar198;
    fVar224 = local_2e0._4_4_ * auVar145._4_4_ + auVar391._4_4_ * fVar199;
    fVar226 = local_2e0._8_4_ * auVar145._8_4_ + auVar391._8_4_ * fVar200;
    fVar228 = local_2e0._12_4_ * auVar145._12_4_ + auVar391._12_4_ * fVar201;
    fVar230 = local_2e0._16_4_ * auVar145._16_4_ + auVar391._16_4_ * fVar202;
    fVar247 = local_2e0._20_4_ * auVar145._20_4_ + auVar391._20_4_ * fVar203;
    fVar249 = local_2e0._24_4_ * auVar145._24_4_ + auVar391._24_4_ * fVar204;
    fVar253 = (float)local_1e0._0_4_ * auVar145._0_4_ + fVar392 * fVar198;
    fVar255 = (float)local_1e0._4_4_ * auVar145._4_4_ + fVar396 * fVar199;
    fVar257 = fStack_1d8 * auVar145._8_4_ + fVar397 * fVar200;
    fVar223 = fStack_1d4 * auVar145._12_4_ + auVar18._12_4_ * fVar201;
    fVar225 = fStack_1d0 * auVar145._16_4_ + fVar392 * fVar202;
    fVar227 = fStack_1cc * auVar145._20_4_ + fVar396 * fVar203;
    fVar229 = fStack_1c8 * auVar145._24_4_ + fVar397 * fVar204;
    fVar231 = (float)local_200._0_4_ * auVar145._0_4_ + auVar276._0_4_ * fVar198;
    fVar248 = (float)local_200._4_4_ * auVar145._4_4_ + auVar276._4_4_ * fVar199;
    fVar250 = fStack_1f8 * auVar145._8_4_ + auVar276._8_4_ * fVar200;
    fVar252 = fStack_1f4 * auVar145._12_4_ + auVar276._12_4_ * fVar201;
    fVar254 = fStack_1f0 * auVar145._16_4_ + auVar276._16_4_ * fVar202;
    fVar256 = fStack_1ec * auVar145._20_4_ + auVar276._20_4_ * fVar203;
    fVar258 = fStack_1e8 * auVar145._24_4_ + auVar276._24_4_ * fVar204;
    fVar358 = auVar351._28_4_;
    fVar369 = auVar362._28_4_ + fVar358;
    auVar332._0_4_ =
         fVar198 * (auVar268._0_4_ * auVar145._0_4_ + auVar17._0_4_ * fVar198) +
         auVar145._0_4_ * fVar259;
    auVar332._4_4_ =
         fVar199 * (auVar268._4_4_ * auVar145._4_4_ + auVar17._4_4_ * fVar199) +
         auVar145._4_4_ * fVar277;
    auVar332._8_4_ =
         fVar200 * (auVar268._8_4_ * auVar145._8_4_ + auVar17._8_4_ * fVar200) +
         auVar145._8_4_ * fVar280;
    auVar332._12_4_ =
         fVar201 * (auVar268._12_4_ * auVar145._12_4_ + auVar17._12_4_ * fVar201) +
         auVar145._12_4_ * fVar283;
    auVar332._16_4_ =
         fVar202 * (auVar268._16_4_ * auVar145._16_4_ + auVar17._0_4_ * fVar202) +
         auVar145._16_4_ * fVar286;
    auVar332._20_4_ =
         fVar203 * (auVar268._20_4_ * auVar145._20_4_ + auVar17._4_4_ * fVar203) +
         auVar145._20_4_ * fVar289;
    auVar332._24_4_ =
         fVar204 * (auVar268._24_4_ * auVar145._24_4_ + auVar17._8_4_ * fVar204) +
         auVar145._24_4_ * fVar292;
    auVar332._28_4_ = local_2e0._28_4_ + fVar358;
    auVar338._0_4_ =
         fVar198 * (auVar391._0_4_ * auVar145._0_4_ + auVar329._0_4_ * fVar198) +
         auVar145._0_4_ * fVar222;
    auVar338._4_4_ =
         fVar199 * (auVar391._4_4_ * auVar145._4_4_ + auVar329._4_4_ * fVar199) +
         auVar145._4_4_ * fVar224;
    auVar338._8_4_ =
         fVar200 * (auVar391._8_4_ * auVar145._8_4_ + auVar329._8_4_ * fVar200) +
         auVar145._8_4_ * fVar226;
    auVar338._12_4_ =
         fVar201 * (auVar391._12_4_ * auVar145._12_4_ + auVar329._12_4_ * fVar201) +
         auVar145._12_4_ * fVar228;
    auVar338._16_4_ =
         fVar202 * (auVar391._16_4_ * auVar145._16_4_ + auVar329._16_4_ * fVar202) +
         auVar145._16_4_ * fVar230;
    auVar338._20_4_ =
         fVar203 * (auVar391._20_4_ * auVar145._20_4_ + auVar329._20_4_ * fVar203) +
         auVar145._20_4_ * fVar247;
    auVar338._24_4_ =
         fVar204 * (auVar391._24_4_ * auVar145._24_4_ + auVar329._24_4_ * fVar204) +
         auVar145._24_4_ * fVar249;
    auVar338._28_4_ = fStack_1c4 + fVar358;
    fVar221 = local_2c0._28_4_;
    auVar348._0_4_ =
         fVar198 * (fVar392 * auVar145._0_4_ + auVar351._0_4_ * fVar198) + auVar145._0_4_ * fVar253;
    auVar348._4_4_ =
         fVar199 * (fVar396 * auVar145._4_4_ + auVar351._4_4_ * fVar199) + auVar145._4_4_ * fVar255;
    auVar348._8_4_ =
         fVar200 * (fVar397 * auVar145._8_4_ + auVar351._8_4_ * fVar200) + auVar145._8_4_ * fVar257;
    auVar348._12_4_ =
         fVar201 * (auVar18._12_4_ * auVar145._12_4_ + auVar351._12_4_ * fVar201) +
         auVar145._12_4_ * fVar223;
    auVar348._16_4_ =
         fVar202 * (fVar392 * auVar145._16_4_ + auVar351._16_4_ * fVar202) +
         auVar145._16_4_ * fVar225;
    auVar348._20_4_ =
         fVar203 * (fVar396 * auVar145._20_4_ + auVar351._20_4_ * fVar203) +
         auVar145._20_4_ * fVar227;
    auVar348._24_4_ =
         fVar204 * (fVar397 * auVar145._24_4_ + auVar351._24_4_ * fVar204) +
         auVar145._24_4_ * fVar229;
    auVar348._28_4_ = fVar221 + fVar358;
    auVar303._0_4_ =
         auVar145._0_4_ * fVar231 +
         fVar198 * (auVar276._0_4_ * auVar145._0_4_ + auVar362._0_4_ * fVar198);
    auVar303._4_4_ =
         auVar145._4_4_ * fVar248 +
         fVar199 * (auVar276._4_4_ * auVar145._4_4_ + auVar362._4_4_ * fVar199);
    auVar303._8_4_ =
         auVar145._8_4_ * fVar250 +
         fVar200 * (auVar276._8_4_ * auVar145._8_4_ + auVar362._8_4_ * fVar200);
    auVar303._12_4_ =
         auVar145._12_4_ * fVar252 +
         fVar201 * (auVar276._12_4_ * auVar145._12_4_ + auVar362._12_4_ * fVar201);
    auVar303._16_4_ =
         auVar145._16_4_ * fVar254 +
         fVar202 * (auVar276._16_4_ * auVar145._16_4_ + auVar362._16_4_ * fVar202);
    auVar303._20_4_ =
         auVar145._20_4_ * fVar256 +
         fVar203 * (auVar276._20_4_ * auVar145._20_4_ + auVar362._20_4_ * fVar203);
    auVar303._24_4_ =
         auVar145._24_4_ * fVar258 +
         fVar204 * (auVar276._24_4_ * auVar145._24_4_ + auVar362._24_4_ * fVar204);
    auVar303._28_4_ = fVar221 + fStack_1e4;
    auVar269._0_4_ =
         (auVar145._0_4_ * (float)local_220._0_4_ + local_2c0._0_4_ * fVar198) * auVar145._0_4_ +
         fVar198 * fVar259;
    auVar269._4_4_ =
         (auVar145._4_4_ * (float)local_220._4_4_ + local_2c0._4_4_ * fVar199) * auVar145._4_4_ +
         fVar199 * fVar277;
    auVar269._8_4_ =
         (auVar145._8_4_ * fStack_218 + local_2c0._8_4_ * fVar200) * auVar145._8_4_ +
         fVar200 * fVar280;
    auVar269._12_4_ =
         (auVar145._12_4_ * fStack_214 + local_2c0._12_4_ * fVar201) * auVar145._12_4_ +
         fVar201 * fVar283;
    auVar269._16_4_ =
         (auVar145._16_4_ * fStack_210 + local_2c0._16_4_ * fVar202) * auVar145._16_4_ +
         fVar202 * fVar286;
    auVar269._20_4_ =
         (auVar145._20_4_ * fStack_20c + local_2c0._20_4_ * fVar203) * auVar145._20_4_ +
         fVar203 * fVar289;
    auVar269._24_4_ =
         (auVar145._24_4_ * fStack_208 + local_2c0._24_4_ * fVar204) * auVar145._24_4_ +
         fVar204 * fVar292;
    auVar269._28_4_ = fVar221 + fVar251 + auVar276._28_4_;
    auVar194._0_4_ =
         (auVar145._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar198) * auVar145._0_4_ +
         fVar198 * fVar222;
    auVar194._4_4_ =
         (auVar145._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar199) * auVar145._4_4_ +
         fVar199 * fVar224;
    auVar194._8_4_ =
         (auVar145._8_4_ * fStack_238 + local_2e0._8_4_ * fVar200) * auVar145._8_4_ +
         fVar200 * fVar226;
    auVar194._12_4_ =
         (auVar145._12_4_ * fStack_234 + local_2e0._12_4_ * fVar201) * auVar145._12_4_ +
         fVar201 * fVar228;
    auVar194._16_4_ =
         (auVar145._16_4_ * fStack_230 + local_2e0._16_4_ * fVar202) * auVar145._16_4_ +
         fVar202 * fVar230;
    auVar194._20_4_ =
         (auVar145._20_4_ * fStack_22c + local_2e0._20_4_ * fVar203) * auVar145._20_4_ +
         fVar203 * fVar247;
    auVar194._24_4_ =
         (auVar145._24_4_ * fStack_228 + local_2e0._24_4_ * fVar204) * auVar145._24_4_ +
         fVar204 * fVar249;
    auVar194._28_4_ = fVar221 + fVar251 + 1.0;
    auVar215._0_4_ =
         (auVar145._0_4_ * (float)local_260._0_4_ + (float)local_1e0._0_4_ * fVar198) *
         auVar145._0_4_ + fVar198 * fVar253;
    auVar215._4_4_ =
         (auVar145._4_4_ * (float)local_260._4_4_ + (float)local_1e0._4_4_ * fVar199) *
         auVar145._4_4_ + fVar199 * fVar255;
    auVar215._8_4_ =
         (auVar145._8_4_ * fStack_258 + fStack_1d8 * fVar200) * auVar145._8_4_ + fVar200 * fVar257;
    auVar215._12_4_ =
         (auVar145._12_4_ * fStack_254 + fStack_1d4 * fVar201) * auVar145._12_4_ + fVar201 * fVar223
    ;
    auVar215._16_4_ =
         (auVar145._16_4_ * fStack_250 + fStack_1d0 * fVar202) * auVar145._16_4_ + fVar202 * fVar225
    ;
    auVar215._20_4_ =
         (auVar145._20_4_ * fStack_24c + fStack_1cc * fVar203) * auVar145._20_4_ + fVar203 * fVar227
    ;
    auVar215._24_4_ =
         (auVar145._24_4_ * fStack_248 + fStack_1c8 * fVar204) * auVar145._24_4_ + fVar204 * fVar229
    ;
    auVar215._28_4_ = fVar369 + fVar220 + 1.0;
    auVar240._0_4_ =
         (auVar145._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar198) *
         auVar145._0_4_ + fVar198 * fVar231;
    auVar240._4_4_ =
         (auVar145._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar199) *
         auVar145._4_4_ + fVar199 * fVar248;
    auVar240._8_4_ =
         (auVar145._8_4_ * fStack_278 + fStack_1f8 * fVar200) * auVar145._8_4_ + fVar200 * fVar250;
    auVar240._12_4_ =
         (auVar145._12_4_ * fStack_274 + fStack_1f4 * fVar201) * auVar145._12_4_ + fVar201 * fVar252
    ;
    auVar240._16_4_ =
         (auVar145._16_4_ * fStack_270 + fStack_1f0 * fVar202) * auVar145._16_4_ + fVar202 * fVar254
    ;
    auVar240._20_4_ =
         (auVar145._20_4_ * fStack_26c + fStack_1ec * fVar203) * auVar145._20_4_ + fVar203 * fVar256
    ;
    auVar240._24_4_ =
         (auVar145._24_4_ * fStack_268 + fStack_1e8 * fVar204) * auVar145._24_4_ + fVar204 * fVar258
    ;
    auVar240._28_4_ = fVar358 + fVar220 + fVar358 + fVar220;
    auVar372._0_4_ = auVar332._0_4_ * fVar198 + auVar145._0_4_ * auVar269._0_4_;
    auVar372._4_4_ = auVar332._4_4_ * fVar199 + auVar145._4_4_ * auVar269._4_4_;
    auVar372._8_4_ = auVar332._8_4_ * fVar200 + auVar145._8_4_ * auVar269._8_4_;
    auVar372._12_4_ = auVar332._12_4_ * fVar201 + auVar145._12_4_ * auVar269._12_4_;
    auVar372._16_4_ = auVar332._16_4_ * fVar202 + auVar145._16_4_ * auVar269._16_4_;
    auVar372._20_4_ = auVar332._20_4_ * fVar203 + auVar145._20_4_ * auVar269._20_4_;
    auVar372._24_4_ = auVar332._24_4_ * fVar204 + auVar145._24_4_ * auVar269._24_4_;
    auVar372._28_4_ = fVar358 + fVar220 + fVar221;
    auVar386._0_4_ = auVar338._0_4_ * fVar198 + auVar145._0_4_ * auVar194._0_4_;
    auVar386._4_4_ = auVar338._4_4_ * fVar199 + auVar145._4_4_ * auVar194._4_4_;
    auVar386._8_4_ = auVar338._8_4_ * fVar200 + auVar145._8_4_ * auVar194._8_4_;
    auVar386._12_4_ = auVar338._12_4_ * fVar201 + auVar145._12_4_ * auVar194._12_4_;
    auVar386._16_4_ = auVar338._16_4_ * fVar202 + auVar145._16_4_ * auVar194._16_4_;
    auVar386._20_4_ = auVar338._20_4_ * fVar203 + auVar145._20_4_ * auVar194._20_4_;
    auVar386._24_4_ = auVar338._24_4_ * fVar204 + auVar145._24_4_ * auVar194._24_4_;
    auVar386._28_4_ = fVar221 + fVar369;
    local_4e0._0_4_ = auVar348._0_4_ * fVar198 + auVar145._0_4_ * auVar215._0_4_;
    local_4e0._4_4_ = auVar348._4_4_ * fVar199 + auVar145._4_4_ * auVar215._4_4_;
    local_4e0._8_4_ = auVar348._8_4_ * fVar200 + auVar145._8_4_ * auVar215._8_4_;
    local_4e0._12_4_ = auVar348._12_4_ * fVar201 + auVar145._12_4_ * auVar215._12_4_;
    local_4e0._16_4_ = auVar348._16_4_ * fVar202 + auVar145._16_4_ * auVar215._16_4_;
    local_4e0._20_4_ = auVar348._20_4_ * fVar203 + auVar145._20_4_ * auVar215._20_4_;
    local_4e0._24_4_ = auVar348._24_4_ * fVar204 + auVar145._24_4_ * auVar215._24_4_;
    local_4e0._28_4_ = fVar369 + fVar221;
    local_bc0 = auVar182._0_4_;
    local_700._0_4_ = fVar198 * auVar303._0_4_ + auVar145._0_4_ * auVar240._0_4_;
    local_700._4_4_ = fVar199 * auVar303._4_4_ + auVar145._4_4_ * auVar240._4_4_;
    local_700._8_4_ = fVar200 * auVar303._8_4_ + auVar145._8_4_ * auVar240._8_4_;
    local_700._12_4_ = fVar201 * auVar303._12_4_ + auVar145._12_4_ * auVar240._12_4_;
    local_700._16_4_ = fVar202 * auVar303._16_4_ + auVar145._16_4_ * auVar240._16_4_;
    local_700._20_4_ = fVar203 * auVar303._20_4_ + auVar145._20_4_ * auVar240._20_4_;
    local_700._24_4_ = fVar204 * auVar303._24_4_ + auVar145._24_4_ * auVar240._24_4_;
    local_700._28_4_ = auVar99._28_4_ + auVar145._28_4_;
    auVar99 = vsubps_avx(auVar269,auVar332);
    auVar153 = vsubps_avx(auVar194,auVar338);
    auVar349 = vsubps_avx(auVar215,auVar348);
    auVar13 = vsubps_avx(auVar240,auVar303);
    auVar233 = vshufps_avx(ZEXT416((uint)(local_bc0 * 0.04761905)),
                           ZEXT416((uint)(local_bc0 * 0.04761905)),0);
    fVar203 = auVar233._0_4_;
    fVar260 = fVar203 * auVar99._0_4_ * 3.0;
    fVar220 = auVar233._4_4_;
    fVar278 = fVar220 * auVar99._4_4_ * 3.0;
    local_a20._4_4_ = fVar278;
    local_a20._0_4_ = fVar260;
    fVar230 = auVar233._8_4_;
    fVar281 = fVar230 * auVar99._8_4_ * 3.0;
    fStack_a18 = fVar281;
    fVar257 = auVar233._12_4_;
    fVar284 = fVar257 * auVar99._12_4_ * 3.0;
    fStack_a14 = fVar284;
    fVar287 = fVar203 * auVar99._16_4_ * 3.0;
    unique0x1000a80c = fVar287;
    fVar290 = fVar220 * auVar99._20_4_ * 3.0;
    unique0x1000a810 = fVar290;
    fVar293 = fVar230 * auVar99._24_4_ * 3.0;
    unique0x1000a814 = fVar293;
    unique0x1000a818 = auVar269._28_4_;
    fVar295 = fVar203 * auVar153._0_4_ * 3.0;
    fVar306 = fVar220 * auVar153._4_4_ * 3.0;
    auVar27._4_4_ = fVar306;
    auVar27._0_4_ = fVar295;
    fVar308 = fVar230 * auVar153._8_4_ * 3.0;
    auVar27._8_4_ = fVar308;
    fVar311 = fVar257 * auVar153._12_4_ * 3.0;
    auVar27._12_4_ = fVar311;
    fVar314 = fVar203 * auVar153._16_4_ * 3.0;
    auVar27._16_4_ = fVar314;
    fVar317 = fVar220 * auVar153._20_4_ * 3.0;
    auVar27._20_4_ = fVar317;
    fVar320 = fVar230 * auVar153._24_4_ * 3.0;
    auVar27._24_4_ = fVar320;
    auVar27._28_4_ = auVar303._28_4_;
    fVar359 = fVar203 * auVar349._0_4_ * 3.0;
    fVar363 = fVar220 * auVar349._4_4_ * 3.0;
    auVar28._4_4_ = fVar363;
    auVar28._0_4_ = fVar359;
    fVar364 = fVar230 * auVar349._8_4_ * 3.0;
    auVar28._8_4_ = fVar364;
    fVar365 = fVar257 * auVar349._12_4_ * 3.0;
    auVar28._12_4_ = fVar365;
    fVar366 = fVar203 * auVar349._16_4_ * 3.0;
    auVar28._16_4_ = fVar366;
    fVar367 = fVar220 * auVar349._20_4_ * 3.0;
    auVar28._20_4_ = fVar367;
    fVar368 = fVar230 * auVar349._24_4_ * 3.0;
    auVar28._24_4_ = fVar368;
    auVar28._28_4_ = fVar369;
    fVar204 = fVar203 * auVar13._0_4_ * 3.0;
    fVar228 = fVar220 * auVar13._4_4_ * 3.0;
    auVar29._4_4_ = fVar228;
    auVar29._0_4_ = fVar204;
    fVar247 = fVar230 * auVar13._8_4_ * 3.0;
    auVar29._8_4_ = fVar247;
    fVar223 = fVar257 * auVar13._12_4_ * 3.0;
    auVar29._12_4_ = fVar223;
    fVar203 = fVar203 * auVar13._16_4_ * 3.0;
    auVar29._16_4_ = fVar203;
    fVar220 = fVar220 * auVar13._20_4_ * 3.0;
    auVar29._20_4_ = fVar220;
    fVar230 = fVar230 * auVar13._24_4_ * 3.0;
    auVar29._24_4_ = fVar230;
    auVar29._28_4_ = fVar257;
    auVar99 = vperm2f128_avx(auVar386,auVar386,1);
    auVar99 = vshufps_avx(auVar99,auVar386,0x30);
    auVar13 = vshufps_avx(auVar386,auVar99,0x29);
    auVar99 = vperm2f128_avx(local_4e0,local_4e0,1);
    auVar99 = vshufps_avx(auVar99,local_4e0,0x30);
    local_a00 = vshufps_avx(local_4e0,auVar99,0x29);
    auVar153 = vsubps_avx(local_700,auVar29);
    auVar99 = vperm2f128_avx(auVar153,auVar153,1);
    auVar99 = vshufps_avx(auVar99,auVar153,0x30);
    auVar165 = vshufps_avx(auVar153,auVar99,0x29);
    local_500 = vsubps_avx(auVar13,auVar386);
    _local_580 = vsubps_avx(local_a00,local_4e0);
    fVar199 = local_500._0_4_;
    fVar221 = local_500._4_4_;
    auVar30._4_4_ = fVar363 * fVar221;
    auVar30._0_4_ = fVar359 * fVar199;
    fVar249 = local_500._8_4_;
    auVar30._8_4_ = fVar364 * fVar249;
    fVar227 = local_500._12_4_;
    auVar30._12_4_ = fVar365 * fVar227;
    fVar256 = local_500._16_4_;
    auVar30._16_4_ = fVar366 * fVar256;
    fVar289 = local_500._20_4_;
    auVar30._20_4_ = fVar367 * fVar289;
    fVar19 = local_500._24_4_;
    auVar30._24_4_ = fVar368 * fVar19;
    auVar30._28_4_ = auVar153._28_4_;
    fVar345 = local_580._0_4_;
    fVar352 = local_580._4_4_;
    auVar31._4_4_ = fVar352 * fVar306;
    auVar31._0_4_ = fVar345 * fVar295;
    fVar353 = local_580._8_4_;
    auVar31._8_4_ = fVar353 * fVar308;
    fVar354 = local_580._12_4_;
    auVar31._12_4_ = fVar354 * fVar311;
    fVar355 = local_580._16_4_;
    auVar31._16_4_ = fVar355 * fVar314;
    fVar356 = local_580._20_4_;
    auVar31._20_4_ = fVar356 * fVar317;
    fVar357 = local_580._24_4_;
    auVar31._24_4_ = fVar357 * fVar320;
    auVar31._28_4_ = auVar99._28_4_;
    auVar377 = vsubps_avx(auVar31,auVar30);
    auVar99 = vperm2f128_avx(auVar372,auVar372,1);
    auVar99 = vshufps_avx(auVar99,auVar372,0x30);
    auVar14 = vshufps_avx(auVar372,auVar99,0x29);
    local_520 = vsubps_avx(auVar14,auVar372);
    auVar32._4_4_ = fVar352 * fVar278;
    auVar32._0_4_ = fVar345 * fVar260;
    auVar32._8_4_ = fVar353 * fVar281;
    auVar32._12_4_ = fVar354 * fVar284;
    auVar32._16_4_ = fVar355 * fVar287;
    auVar32._20_4_ = fVar356 * fVar290;
    auVar32._24_4_ = fVar357 * fVar293;
    auVar32._28_4_ = auVar14._28_4_;
    fVar200 = local_520._0_4_;
    fVar222 = local_520._4_4_;
    auVar33._4_4_ = fVar363 * fVar222;
    auVar33._0_4_ = fVar359 * fVar200;
    fVar251 = local_520._8_4_;
    auVar33._8_4_ = fVar364 * fVar251;
    fVar229 = local_520._12_4_;
    auVar33._12_4_ = fVar365 * fVar229;
    fVar258 = local_520._16_4_;
    auVar33._16_4_ = fVar366 * fVar258;
    fVar292 = local_520._20_4_;
    auVar33._20_4_ = fVar367 * fVar292;
    fVar20 = local_520._24_4_;
    auVar33._24_4_ = fVar368 * fVar20;
    auVar33._28_4_ = local_a00._28_4_;
    auVar15 = vsubps_avx(auVar33,auVar32);
    auVar34._4_4_ = fVar222 * fVar306;
    auVar34._0_4_ = fVar200 * fVar295;
    auVar34._8_4_ = fVar251 * fVar308;
    auVar34._12_4_ = fVar229 * fVar311;
    auVar34._16_4_ = fVar258 * fVar314;
    auVar34._20_4_ = fVar292 * fVar317;
    auVar34._24_4_ = fVar20 * fVar320;
    auVar34._28_4_ = local_a00._28_4_;
    auVar35._4_4_ = fVar278 * fVar221;
    auVar35._0_4_ = fVar260 * fVar199;
    auVar35._8_4_ = fVar281 * fVar249;
    auVar35._12_4_ = fVar284 * fVar227;
    auVar35._16_4_ = fVar287 * fVar256;
    auVar35._20_4_ = fVar290 * fVar289;
    auVar35._24_4_ = fVar293 * fVar19;
    auVar35._28_4_ = auVar338._28_4_;
    auVar16 = vsubps_avx(auVar35,auVar34);
    fVar198 = auVar16._28_4_;
    auVar164._0_4_ = fVar200 * fVar200 + fVar199 * fVar199 + fVar345 * fVar345;
    auVar164._4_4_ = fVar222 * fVar222 + fVar221 * fVar221 + fVar352 * fVar352;
    auVar164._8_4_ = fVar251 * fVar251 + fVar249 * fVar249 + fVar353 * fVar353;
    auVar164._12_4_ = fVar229 * fVar229 + fVar227 * fVar227 + fVar354 * fVar354;
    auVar164._16_4_ = fVar258 * fVar258 + fVar256 * fVar256 + fVar355 * fVar355;
    auVar164._20_4_ = fVar292 * fVar292 + fVar289 * fVar289 + fVar356 * fVar356;
    auVar164._24_4_ = fVar20 * fVar20 + fVar19 * fVar19 + fVar357 * fVar357;
    auVar164._28_4_ = fVar198 + fVar198 + auVar377._28_4_;
    auVar99 = vrcpps_avx(auVar164);
    fVar225 = auVar99._0_4_;
    fVar250 = auVar99._4_4_;
    auVar36._4_4_ = fVar250 * auVar164._4_4_;
    auVar36._0_4_ = fVar225 * auVar164._0_4_;
    fVar252 = auVar99._8_4_;
    auVar36._8_4_ = fVar252 * auVar164._8_4_;
    fVar254 = auVar99._12_4_;
    auVar36._12_4_ = fVar254 * auVar164._12_4_;
    fVar280 = auVar99._16_4_;
    auVar36._16_4_ = fVar280 * auVar164._16_4_;
    fVar283 = auVar99._20_4_;
    auVar36._20_4_ = fVar283 * auVar164._20_4_;
    fVar286 = auVar99._24_4_;
    auVar36._24_4_ = fVar286 * auVar164._24_4_;
    auVar36._28_4_ = auVar338._28_4_;
    auVar373._8_4_ = 0x3f800000;
    auVar373._0_8_ = 0x3f8000003f800000;
    auVar373._12_4_ = 0x3f800000;
    auVar373._16_4_ = 0x3f800000;
    auVar373._20_4_ = 0x3f800000;
    auVar373._24_4_ = 0x3f800000;
    auVar373._28_4_ = 0x3f800000;
    auVar350 = vsubps_avx(auVar373,auVar36);
    fVar225 = auVar350._0_4_ * fVar225 + fVar225;
    fVar250 = auVar350._4_4_ * fVar250 + fVar250;
    fVar252 = auVar350._8_4_ * fVar252 + fVar252;
    fVar254 = auVar350._12_4_ * fVar254 + fVar254;
    fVar280 = auVar350._16_4_ * fVar280 + fVar280;
    fVar283 = auVar350._20_4_ * fVar283 + fVar283;
    fVar286 = auVar350._24_4_ * fVar286 + fVar286;
    auVar153 = vperm2f128_avx(auVar27,auVar27,1);
    auVar153 = vshufps_avx(auVar153,auVar27,0x30);
    auVar153 = vshufps_avx(auVar27,auVar153,0x29);
    auVar349 = vperm2f128_avx(auVar28,auVar28,1);
    auVar349 = vshufps_avx(auVar349,auVar28,0x30);
    local_6a0 = vshufps_avx(auVar28,auVar349,0x29);
    fVar370 = local_6a0._0_4_;
    fVar378 = local_6a0._4_4_;
    auVar37._4_4_ = fVar378 * fVar221;
    auVar37._0_4_ = fVar370 * fVar199;
    fVar379 = local_6a0._8_4_;
    auVar37._8_4_ = fVar379 * fVar249;
    fVar380 = local_6a0._12_4_;
    auVar37._12_4_ = fVar380 * fVar227;
    fVar381 = local_6a0._16_4_;
    auVar37._16_4_ = fVar381 * fVar256;
    fVar382 = local_6a0._20_4_;
    auVar37._20_4_ = fVar382 * fVar289;
    fVar383 = local_6a0._24_4_;
    auVar37._24_4_ = fVar383 * fVar19;
    auVar37._28_4_ = auVar349._28_4_;
    fVar201 = auVar153._0_4_;
    fVar224 = auVar153._4_4_;
    auVar38._4_4_ = fVar352 * fVar224;
    auVar38._0_4_ = fVar345 * fVar201;
    fVar253 = auVar153._8_4_;
    auVar38._8_4_ = fVar353 * fVar253;
    fVar231 = auVar153._12_4_;
    auVar38._12_4_ = fVar354 * fVar231;
    fVar259 = auVar153._16_4_;
    auVar38._16_4_ = fVar355 * fVar259;
    fVar358 = auVar153._20_4_;
    auVar38._20_4_ = fVar356 * fVar358;
    fVar21 = auVar153._24_4_;
    auVar38._24_4_ = fVar357 * fVar21;
    auVar38._28_4_ = fVar369;
    auVar349 = vsubps_avx(auVar38,auVar37);
    auVar153 = vperm2f128_avx(_local_a20,_local_a20,1);
    auVar153 = vshufps_avx(auVar153,_local_a20,0x30);
    local_920 = vshufps_avx(_local_a20,auVar153,0x29);
    fVar202 = local_920._0_4_;
    fVar226 = local_920._4_4_;
    auVar39._4_4_ = fVar352 * fVar226;
    auVar39._0_4_ = fVar345 * fVar202;
    fVar255 = local_920._8_4_;
    auVar39._8_4_ = fVar353 * fVar255;
    fVar248 = local_920._12_4_;
    auVar39._12_4_ = fVar354 * fVar248;
    fVar277 = local_920._16_4_;
    auVar39._16_4_ = fVar355 * fVar277;
    fVar369 = local_920._20_4_;
    auVar39._20_4_ = fVar356 * fVar369;
    fVar22 = local_920._24_4_;
    auVar39._24_4_ = fVar357 * fVar22;
    auVar39._28_4_ = auVar153._28_4_;
    auVar40._4_4_ = fVar378 * fVar222;
    auVar40._0_4_ = fVar370 * fVar200;
    auVar40._8_4_ = fVar379 * fVar251;
    auVar40._12_4_ = fVar380 * fVar229;
    auVar40._16_4_ = fVar381 * fVar258;
    auVar40._20_4_ = fVar382 * fVar292;
    uVar80 = local_6a0._28_4_;
    auVar40._24_4_ = fVar383 * fVar20;
    auVar40._28_4_ = uVar80;
    auVar153 = vsubps_avx(auVar40,auVar39);
    auVar41._4_4_ = fVar222 * fVar224;
    auVar41._0_4_ = fVar200 * fVar201;
    auVar41._8_4_ = fVar251 * fVar253;
    auVar41._12_4_ = fVar229 * fVar231;
    auVar41._16_4_ = fVar258 * fVar259;
    auVar41._20_4_ = fVar292 * fVar358;
    auVar41._24_4_ = fVar20 * fVar21;
    auVar41._28_4_ = uVar80;
    auVar42._4_4_ = fVar226 * fVar221;
    auVar42._0_4_ = fVar202 * fVar199;
    auVar42._8_4_ = fVar255 * fVar249;
    auVar42._12_4_ = fVar248 * fVar227;
    auVar42._16_4_ = fVar277 * fVar256;
    auVar42._20_4_ = fVar369 * fVar289;
    auVar42._24_4_ = fVar22 * fVar19;
    auVar42._28_4_ = auVar386._28_4_;
    auVar26 = vsubps_avx(auVar42,auVar41);
    auVar43._4_4_ =
         (auVar377._4_4_ * auVar377._4_4_ +
         auVar15._4_4_ * auVar15._4_4_ + auVar16._4_4_ * auVar16._4_4_) * fVar250;
    auVar43._0_4_ =
         (auVar377._0_4_ * auVar377._0_4_ +
         auVar15._0_4_ * auVar15._0_4_ + auVar16._0_4_ * auVar16._0_4_) * fVar225;
    auVar43._8_4_ =
         (auVar377._8_4_ * auVar377._8_4_ +
         auVar15._8_4_ * auVar15._8_4_ + auVar16._8_4_ * auVar16._8_4_) * fVar252;
    auVar43._12_4_ =
         (auVar377._12_4_ * auVar377._12_4_ +
         auVar15._12_4_ * auVar15._12_4_ + auVar16._12_4_ * auVar16._12_4_) * fVar254;
    auVar43._16_4_ =
         (auVar377._16_4_ * auVar377._16_4_ +
         auVar15._16_4_ * auVar15._16_4_ + auVar16._16_4_ * auVar16._16_4_) * fVar280;
    auVar43._20_4_ =
         (auVar377._20_4_ * auVar377._20_4_ +
         auVar15._20_4_ * auVar15._20_4_ + auVar16._20_4_ * auVar16._20_4_) * fVar283;
    auVar43._24_4_ =
         (auVar377._24_4_ * auVar377._24_4_ +
         auVar15._24_4_ * auVar15._24_4_ + auVar16._24_4_ * auVar16._24_4_) * fVar286;
    auVar43._28_4_ = auVar377._28_4_ + auVar15._28_4_ + fVar198;
    auVar44._4_4_ =
         (auVar349._4_4_ * auVar349._4_4_ +
         auVar153._4_4_ * auVar153._4_4_ + auVar26._4_4_ * auVar26._4_4_) * fVar250;
    auVar44._0_4_ =
         (auVar349._0_4_ * auVar349._0_4_ +
         auVar153._0_4_ * auVar153._0_4_ + auVar26._0_4_ * auVar26._0_4_) * fVar225;
    auVar44._8_4_ =
         (auVar349._8_4_ * auVar349._8_4_ +
         auVar153._8_4_ * auVar153._8_4_ + auVar26._8_4_ * auVar26._8_4_) * fVar252;
    auVar44._12_4_ =
         (auVar349._12_4_ * auVar349._12_4_ +
         auVar153._12_4_ * auVar153._12_4_ + auVar26._12_4_ * auVar26._12_4_) * fVar254;
    auVar44._16_4_ =
         (auVar349._16_4_ * auVar349._16_4_ +
         auVar153._16_4_ * auVar153._16_4_ + auVar26._16_4_ * auVar26._16_4_) * fVar280;
    auVar44._20_4_ =
         (auVar349._20_4_ * auVar349._20_4_ +
         auVar153._20_4_ * auVar153._20_4_ + auVar26._20_4_ * auVar26._20_4_) * fVar283;
    auVar44._24_4_ =
         (auVar349._24_4_ * auVar349._24_4_ +
         auVar153._24_4_ * auVar153._24_4_ + auVar26._24_4_ * auVar26._24_4_) * fVar286;
    auVar44._28_4_ = auVar350._28_4_ + auVar99._28_4_;
    auVar99 = vmaxps_avx(auVar43,auVar44);
    auVar153 = vperm2f128_avx(local_700,local_700,1);
    auVar153 = vshufps_avx(auVar153,local_700,0x30);
    auVar377 = vshufps_avx(local_700,auVar153,0x29);
    auVar104._0_4_ = (float)local_700._0_4_ + fVar204;
    auVar104._4_4_ = local_700._4_4_ + fVar228;
    auVar104._8_4_ = local_700._8_4_ + fVar247;
    auVar104._12_4_ = local_700._12_4_ + fVar223;
    auVar104._16_4_ = local_700._16_4_ + fVar203;
    auVar104._20_4_ = local_700._20_4_ + fVar220;
    auVar104._24_4_ = local_700._24_4_ + fVar230;
    auVar104._28_4_ = local_700._28_4_ + fVar257;
    auVar153 = vmaxps_avx(local_700,auVar104);
    auVar349 = vmaxps_avx(auVar165,auVar377);
    auVar153 = vmaxps_avx(auVar153,auVar349);
    auVar349 = vrsqrtps_avx(auVar164);
    fVar198 = auVar349._0_4_;
    fVar203 = auVar349._4_4_;
    fVar204 = auVar349._8_4_;
    fVar220 = auVar349._12_4_;
    fVar228 = auVar349._16_4_;
    fVar230 = auVar349._20_4_;
    fVar247 = auVar349._24_4_;
    local_340 = fVar198 * 1.5 + fVar198 * fVar198 * fVar198 * auVar164._0_4_ * -0.5;
    fStack_33c = fVar203 * 1.5 + fVar203 * fVar203 * fVar203 * auVar164._4_4_ * -0.5;
    fStack_338 = fVar204 * 1.5 + fVar204 * fVar204 * fVar204 * auVar164._8_4_ * -0.5;
    fStack_334 = fVar220 * 1.5 + fVar220 * fVar220 * fVar220 * auVar164._12_4_ * -0.5;
    fStack_330 = fVar228 * 1.5 + fVar228 * fVar228 * fVar228 * auVar164._16_4_ * -0.5;
    fStack_32c = fVar230 * 1.5 + fVar230 * fVar230 * fVar230 * auVar164._20_4_ * -0.5;
    fStack_328 = fVar247 * 1.5 + fVar247 * fVar247 * fVar247 * auVar164._24_4_ * -0.5;
    auVar15 = vsubps_avx(ZEXT832(0) << 0x20,auVar386);
    auVar16 = vsubps_avx(ZEXT832(0) << 0x20,local_4e0);
    fVar203 = auVar16._0_4_;
    fVar228 = auVar16._4_4_;
    fVar257 = auVar16._8_4_;
    fVar250 = auVar16._12_4_;
    fVar280 = auVar16._16_4_;
    fVar392 = auVar16._20_4_;
    fVar23 = auVar16._24_4_;
    fVar204 = auVar15._0_4_;
    fVar230 = auVar15._4_4_;
    fVar223 = auVar15._8_4_;
    fVar252 = auVar15._12_4_;
    fVar283 = auVar15._16_4_;
    fVar396 = auVar15._20_4_;
    fVar24 = auVar15._24_4_;
    auVar350 = vsubps_avx(ZEXT832(0) << 0x20,auVar372);
    fVar220 = auVar350._0_4_;
    fVar247 = auVar350._4_4_;
    fVar225 = auVar350._8_4_;
    fVar254 = auVar350._12_4_;
    fVar286 = auVar350._16_4_;
    fVar397 = auVar350._20_4_;
    fVar25 = auVar350._24_4_;
    auVar374._0_4_ =
         (float)local_780._0_4_ * fVar220 +
         (float)local_8a0._0_4_ * fVar204 + (float)local_720._0_4_ * fVar203;
    auVar374._4_4_ =
         (float)local_780._4_4_ * fVar247 +
         (float)local_8a0._4_4_ * fVar230 + (float)local_720._4_4_ * fVar228;
    auVar374._8_4_ = fStack_778 * fVar225 + fStack_898 * fVar223 + fStack_718 * fVar257;
    auVar374._12_4_ = fStack_774 * fVar254 + fStack_894 * fVar252 + fStack_714 * fVar250;
    auVar374._16_4_ = fStack_770 * fVar286 + fStack_890 * fVar283 + fStack_710 * fVar280;
    auVar374._20_4_ = fStack_76c * fVar397 + fStack_88c * fVar396 + fStack_70c * fVar392;
    auVar374._24_4_ = fStack_768 * fVar25 + fStack_888 * fVar24 + fStack_708 * fVar23;
    auVar374._28_4_ = auVar386._28_4_ + auVar26._28_4_ + 1.5;
    auVar387._0_4_ = fVar220 * fVar220 + fVar204 * fVar204 + fVar203 * fVar203;
    auVar387._4_4_ = fVar247 * fVar247 + fVar230 * fVar230 + fVar228 * fVar228;
    auVar387._8_4_ = fVar225 * fVar225 + fVar223 * fVar223 + fVar257 * fVar257;
    auVar387._12_4_ = fVar254 * fVar254 + fVar252 * fVar252 + fVar250 * fVar250;
    auVar387._16_4_ = fVar286 * fVar286 + fVar283 * fVar283 + fVar280 * fVar280;
    auVar387._20_4_ = fVar397 * fVar397 + fVar396 * fVar396 + fVar392 * fVar392;
    auVar387._24_4_ = fVar25 * fVar25 + fVar24 * fVar24 + fVar23 * fVar23;
    auVar387._28_4_ = local_4e0._28_4_ + local_4e0._28_4_ + auVar386._28_4_;
    local_460 = (float)local_780._0_4_ * fVar200 * local_340 +
                local_340 * fVar199 * (float)local_8a0._0_4_ +
                (float)local_720._0_4_ * fVar345 * local_340;
    fStack_45c = (float)local_780._4_4_ * fVar222 * fStack_33c +
                 fStack_33c * fVar221 * (float)local_8a0._4_4_ +
                 (float)local_720._4_4_ * fVar352 * fStack_33c;
    fStack_458 = fStack_778 * fVar251 * fStack_338 +
                 fStack_338 * fVar249 * fStack_898 + fStack_718 * fVar353 * fStack_338;
    fStack_454 = fStack_774 * fVar229 * fStack_334 +
                 fStack_334 * fVar227 * fStack_894 + fStack_714 * fVar354 * fStack_334;
    fStack_450 = fStack_770 * fVar258 * fStack_330 +
                 fStack_330 * fVar256 * fStack_890 + fStack_710 * fVar355 * fStack_330;
    fStack_44c = fStack_76c * fVar292 * fStack_32c +
                 fStack_32c * fVar289 * fStack_88c + fStack_70c * fVar356 * fStack_32c;
    fStack_448 = fStack_768 * fVar20 * fStack_328 +
                 fStack_328 * fVar19 * fStack_888 + fStack_708 * fVar357 * fStack_328;
    fVar198 = fStack_764 + fStack_884 + 0.0;
    fVar296 = fVar220 * fVar200 * local_340 +
              local_340 * fVar199 * fVar204 + fVar345 * local_340 * fVar203;
    fVar307 = fVar247 * fVar222 * fStack_33c +
              fStack_33c * fVar221 * fVar230 + fVar352 * fStack_33c * fVar228;
    fVar309 = fVar225 * fVar251 * fStack_338 +
              fStack_338 * fVar249 * fVar223 + fVar353 * fStack_338 * fVar257;
    fVar312 = fVar254 * fVar229 * fStack_334 +
              fStack_334 * fVar227 * fVar252 + fVar354 * fStack_334 * fVar250;
    fVar315 = fVar286 * fVar258 * fStack_330 +
              fStack_330 * fVar256 * fVar283 + fVar355 * fStack_330 * fVar280;
    fVar318 = fVar397 * fVar292 * fStack_32c +
              fStack_32c * fVar289 * fVar396 + fVar356 * fStack_32c * fVar392;
    fVar321 = fVar25 * fVar20 * fStack_328 +
              fStack_328 * fVar19 * fVar24 + fVar357 * fStack_328 * fVar23;
    fVar323 = fStack_884 + fVar198;
    auVar45._4_4_ = fStack_45c * fVar307;
    auVar45._0_4_ = local_460 * fVar296;
    auVar45._8_4_ = fStack_458 * fVar309;
    auVar45._12_4_ = fStack_454 * fVar312;
    auVar45._16_4_ = fStack_450 * fVar315;
    auVar45._20_4_ = fStack_44c * fVar318;
    auVar45._24_4_ = fStack_448 * fVar321;
    auVar45._28_4_ = fVar198;
    auVar26 = vsubps_avx(auVar374,auVar45);
    auVar46._4_4_ = fVar307 * fVar307;
    auVar46._0_4_ = fVar296 * fVar296;
    auVar46._8_4_ = fVar309 * fVar309;
    auVar46._12_4_ = fVar312 * fVar312;
    auVar46._16_4_ = fVar315 * fVar315;
    auVar46._20_4_ = fVar318 * fVar318;
    auVar46._24_4_ = fVar321 * fVar321;
    auVar46._28_4_ = fStack_884;
    auVar100 = vsubps_avx(auVar387,auVar46);
    local_4c0 = vsqrtps_avx(auVar99);
    fVar198 = (local_4c0._0_4_ + auVar153._0_4_) * 1.0000002;
    fVar116 = (local_4c0._4_4_ + auVar153._4_4_) * 1.0000002;
    fVar118 = (local_4c0._8_4_ + auVar153._8_4_) * 1.0000002;
    fVar120 = (local_4c0._12_4_ + auVar153._12_4_) * 1.0000002;
    fVar121 = (local_4c0._16_4_ + auVar153._16_4_) * 1.0000002;
    fVar122 = (local_4c0._20_4_ + auVar153._20_4_) * 1.0000002;
    fVar123 = (local_4c0._24_4_ + auVar153._24_4_) * 1.0000002;
    auVar47._4_4_ = fVar116 * fVar116;
    auVar47._0_4_ = fVar198 * fVar198;
    auVar47._8_4_ = fVar118 * fVar118;
    auVar47._12_4_ = fVar120 * fVar120;
    auVar47._16_4_ = fVar121 * fVar121;
    auVar47._20_4_ = fVar122 * fVar122;
    auVar47._24_4_ = fVar123 * fVar123;
    auVar47._28_4_ = local_4c0._28_4_ + auVar153._28_4_;
    fVar335 = auVar26._0_4_ + auVar26._0_4_;
    fVar344 = auVar26._4_4_ + auVar26._4_4_;
    local_8e0._0_8_ = CONCAT44(fVar344,fVar335);
    local_8e0._8_4_ = auVar26._8_4_ + auVar26._8_4_;
    local_8e0._12_4_ = auVar26._12_4_ + auVar26._12_4_;
    local_8e0._16_4_ = auVar26._16_4_ + auVar26._16_4_;
    local_8e0._20_4_ = auVar26._20_4_ + auVar26._20_4_;
    local_8e0._24_4_ = auVar26._24_4_ + auVar26._24_4_;
    local_8e0._28_4_ = auVar26._28_4_ + auVar26._28_4_;
    auVar153 = vsubps_avx(auVar100,auVar47);
    local_360._4_4_ = fStack_45c * fStack_45c;
    local_360._0_4_ = local_460 * local_460;
    local_360._8_4_ = fStack_458 * fStack_458;
    local_360._12_4_ = fStack_454 * fStack_454;
    local_360._16_4_ = fStack_450 * fStack_450;
    local_360._20_4_ = fStack_44c * fStack_44c;
    local_360._24_4_ = fStack_448 * fStack_448;
    local_360._28_4_ = local_580._28_4_;
    auVar26 = vsubps_avx(local_2a0,local_360);
    local_560._4_4_ = fVar344 * fVar344;
    local_560._0_4_ = fVar335 * fVar335;
    fStack_558 = local_8e0._8_4_ * local_8e0._8_4_;
    fStack_554 = local_8e0._12_4_ * local_8e0._12_4_;
    fStack_550 = local_8e0._16_4_ * local_8e0._16_4_;
    fStack_54c = local_8e0._20_4_ * local_8e0._20_4_;
    fStack_548 = local_8e0._24_4_ * local_8e0._24_4_;
    unique0x10010e8c = 0x3f800002;
    fVar116 = auVar26._0_4_;
    fVar118 = auVar26._4_4_;
    fVar120 = auVar26._8_4_;
    fStack_8b8 = fVar120 * 4.0;
    fVar121 = auVar26._12_4_;
    fStack_8b4 = fVar121 * 4.0;
    fVar122 = auVar26._16_4_;
    fStack_8b0 = fVar122 * 4.0;
    fVar123 = auVar26._20_4_;
    fStack_8ac = fVar123 * 4.0;
    fVar334 = auVar26._24_4_;
    fStack_8a8 = fVar334 * 4.0;
    uStack_8a4 = 0x40800000;
    auVar48._4_4_ = auVar153._4_4_ * fVar118 * 4.0;
    auVar48._0_4_ = auVar153._0_4_ * fVar116 * 4.0;
    auVar48._8_4_ = auVar153._8_4_ * fStack_8b8;
    auVar48._12_4_ = auVar153._12_4_ * fStack_8b4;
    auVar48._16_4_ = auVar153._16_4_ * fStack_8b0;
    auVar48._20_4_ = auVar153._20_4_ * fStack_8ac;
    auVar48._24_4_ = auVar153._24_4_ * fStack_8a8;
    auVar48._28_4_ = 0x40800000;
    auVar101 = vsubps_avx(_local_560,auVar48);
    auVar99 = vcmpps_avx(auVar101,ZEXT832(0) << 0x20,5);
    auVar329 = ZEXT3264(auVar99);
    fVar198 = auVar26._28_4_;
    if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar99 >> 0x7f,0) == '\0') &&
          (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar99 >> 0xbf,0) == '\0') &&
        (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar99[0x1f]) {
      auVar105._8_4_ = 0x7f800000;
      auVar105._0_8_ = 0x7f8000007f800000;
      auVar105._12_4_ = 0x7f800000;
      auVar105._16_4_ = 0x7f800000;
      auVar105._20_4_ = 0x7f800000;
      auVar105._24_4_ = 0x7f800000;
      auVar105._28_4_ = 0x7f800000;
      auVar388._8_4_ = 0xff800000;
      auVar388._0_8_ = 0xff800000ff800000;
      auVar388._12_4_ = 0xff800000;
      auVar388._16_4_ = 0xff800000;
      auVar388._20_4_ = 0xff800000;
      auVar388._24_4_ = 0xff800000;
      auVar388._28_4_ = 0xff800000;
    }
    else {
      auVar141 = vcmpps_avx(auVar101,ZEXT832(0) << 0x20,5);
      auVar142 = vsqrtps_avx(auVar101);
      auVar270._0_4_ = fVar116 + fVar116;
      auVar270._4_4_ = fVar118 + fVar118;
      auVar270._8_4_ = fVar120 + fVar120;
      auVar270._12_4_ = fVar121 + fVar121;
      auVar270._16_4_ = fVar122 + fVar122;
      auVar270._20_4_ = fVar123 + fVar123;
      auVar270._24_4_ = fVar334 + fVar334;
      auVar270._28_4_ = fVar198 + fVar198;
      auVar101 = vrcpps_avx(auVar270);
      fVar261 = auVar101._0_4_;
      fVar279 = auVar101._4_4_;
      auVar49._4_4_ = auVar270._4_4_ * fVar279;
      auVar49._0_4_ = auVar270._0_4_ * fVar261;
      fVar282 = auVar101._8_4_;
      auVar49._8_4_ = auVar270._8_4_ * fVar282;
      fVar285 = auVar101._12_4_;
      auVar49._12_4_ = auVar270._12_4_ * fVar285;
      fVar288 = auVar101._16_4_;
      auVar49._16_4_ = auVar270._16_4_ * fVar288;
      fVar291 = auVar101._20_4_;
      auVar49._20_4_ = auVar270._20_4_ * fVar291;
      fVar294 = auVar101._24_4_;
      auVar49._24_4_ = auVar270._24_4_ * fVar294;
      auVar49._28_4_ = auVar270._28_4_;
      auVar328._8_4_ = 0x3f800000;
      auVar328._0_8_ = 0x3f8000003f800000;
      auVar328._12_4_ = 0x3f800000;
      auVar328._16_4_ = 0x3f800000;
      auVar328._20_4_ = 0x3f800000;
      auVar328._24_4_ = 0x3f800000;
      auVar328._28_4_ = 0x3f800000;
      auVar101 = vsubps_avx(auVar328,auVar49);
      fVar261 = fVar261 + fVar261 * auVar101._0_4_;
      fVar279 = fVar279 + fVar279 * auVar101._4_4_;
      fVar282 = fVar282 + fVar282 * auVar101._8_4_;
      fVar285 = fVar285 + fVar285 * auVar101._12_4_;
      fVar288 = fVar288 + fVar288 * auVar101._16_4_;
      fVar291 = fVar291 + fVar291 * auVar101._20_4_;
      fVar294 = fVar294 + fVar294 * auVar101._24_4_;
      auVar304._0_8_ = CONCAT44(fVar344,fVar335) ^ 0x8000000080000000;
      auVar304._8_4_ = -local_8e0._8_4_;
      auVar304._12_4_ = -local_8e0._12_4_;
      auVar304._16_4_ = -local_8e0._16_4_;
      auVar304._20_4_ = -local_8e0._20_4_;
      auVar304._24_4_ = -local_8e0._24_4_;
      auVar304._28_4_ = -local_8e0._28_4_;
      auVar101 = vsubps_avx(auVar304,auVar142);
      fVar335 = auVar101._0_4_ * fVar261;
      fVar344 = auVar101._4_4_ * fVar279;
      auVar50._4_4_ = fVar344;
      auVar50._0_4_ = fVar335;
      fVar310 = auVar101._8_4_ * fVar282;
      auVar50._8_4_ = fVar310;
      fVar313 = auVar101._12_4_ * fVar285;
      auVar50._12_4_ = fVar313;
      fVar316 = auVar101._16_4_ * fVar288;
      auVar50._16_4_ = fVar316;
      fVar319 = auVar101._20_4_ * fVar291;
      auVar50._20_4_ = fVar319;
      fVar322 = auVar101._24_4_ * fVar294;
      auVar50._24_4_ = fVar322;
      auVar50._28_4_ = auVar101._28_4_;
      auVar101 = vsubps_avx(auVar142,local_8e0);
      fVar261 = auVar101._0_4_ * fVar261;
      fVar279 = auVar101._4_4_ * fVar279;
      auVar51._4_4_ = fVar279;
      auVar51._0_4_ = fVar261;
      fVar282 = auVar101._8_4_ * fVar282;
      auVar51._8_4_ = fVar282;
      fVar285 = auVar101._12_4_ * fVar285;
      auVar51._12_4_ = fVar285;
      fVar288 = auVar101._16_4_ * fVar288;
      auVar51._16_4_ = fVar288;
      fVar291 = auVar101._20_4_ * fVar291;
      auVar51._20_4_ = fVar291;
      fVar294 = auVar101._24_4_ * fVar294;
      auVar51._24_4_ = fVar294;
      auVar51._28_4_ = auVar101._28_4_;
      local_540 = local_340 * (fVar296 + local_460 * fVar335);
      fStack_53c = fStack_33c * (fVar307 + fStack_45c * fVar344);
      fStack_538 = fStack_338 * (fVar309 + fStack_458 * fVar310);
      fStack_534 = fStack_334 * (fVar312 + fStack_454 * fVar313);
      fStack_530 = fStack_330 * (fVar315 + fStack_450 * fVar316);
      fStack_52c = fStack_32c * (fVar318 + fStack_44c * fVar319);
      fStack_528 = fStack_328 * (fVar321 + fStack_448 * fVar322);
      fStack_524 = local_8e0._28_4_;
      auVar339._8_4_ = 0x7fffffff;
      auVar339._0_8_ = 0x7fffffff7fffffff;
      auVar339._12_4_ = 0x7fffffff;
      auVar339._16_4_ = 0x7fffffff;
      auVar339._20_4_ = 0x7fffffff;
      auVar339._24_4_ = 0x7fffffff;
      auVar339._28_4_ = 0x7fffffff;
      auVar101 = vandps_avx(local_360,auVar339);
      auVar101 = vmaxps_avx(local_440,auVar101);
      auVar52._4_4_ = auVar101._4_4_ * 1.9073486e-06;
      auVar52._0_4_ = auVar101._0_4_ * 1.9073486e-06;
      auVar52._8_4_ = auVar101._8_4_ * 1.9073486e-06;
      auVar52._12_4_ = auVar101._12_4_ * 1.9073486e-06;
      auVar52._16_4_ = auVar101._16_4_ * 1.9073486e-06;
      auVar52._20_4_ = auVar101._20_4_ * 1.9073486e-06;
      auVar52._24_4_ = auVar101._24_4_ * 1.9073486e-06;
      auVar52._28_4_ = auVar101._28_4_;
      auVar101 = vandps_avx(auVar26,auVar339);
      auVar101 = vcmpps_avx(auVar101,auVar52,1);
      auVar340._8_4_ = 0x7f800000;
      auVar340._0_8_ = 0x7f8000007f800000;
      auVar340._12_4_ = 0x7f800000;
      auVar340._16_4_ = 0x7f800000;
      auVar340._20_4_ = 0x7f800000;
      auVar340._24_4_ = 0x7f800000;
      auVar340._28_4_ = 0x7f800000;
      auVar105 = vblendvps_avx(auVar340,auVar50,auVar141);
      local_5a0 = auVar105;
      local_5c0._4_4_ = fStack_33c * (fVar307 + fStack_45c * fVar279);
      local_5c0._0_4_ = local_340 * (fVar296 + local_460 * fVar261);
      fStack_5b8 = fStack_338 * (fVar309 + fStack_458 * fVar282);
      fStack_5b4 = fStack_334 * (fVar312 + fStack_454 * fVar285);
      fStack_5b0 = fStack_330 * (fVar315 + fStack_450 * fVar288);
      fStack_5ac = fStack_32c * (fVar318 + fStack_44c * fVar291);
      fStack_5a8 = fStack_328 * (fVar321 + fStack_448 * fVar294);
      uStack_5a4 = auVar105._28_4_;
      auVar271._8_4_ = 0xff800000;
      auVar271._0_8_ = 0xff800000ff800000;
      auVar271._12_4_ = 0xff800000;
      auVar271._16_4_ = 0xff800000;
      auVar271._20_4_ = 0xff800000;
      auVar271._24_4_ = 0xff800000;
      auVar271._28_4_ = 0xff800000;
      auVar388 = vblendvps_avx(auVar271,auVar51,auVar141);
      auVar142 = auVar141 & auVar101;
      if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar142 >> 0x7f,0) == '\0') &&
            (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar142 >> 0xbf,0) == '\0') &&
          (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar142[0x1f]) {
        auVar329 = ZEXT3264(auVar99);
      }
      else {
        auVar99 = vandps_avx(auVar101,auVar141);
        auVar233 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
        auVar101 = vcmpps_avx(auVar153,ZEXT832(0) << 0x20,2);
        auVar394._8_4_ = 0xff800000;
        auVar394._0_8_ = 0xff800000ff800000;
        auVar394._12_4_ = 0xff800000;
        auVar394._16_4_ = 0xff800000;
        auVar394._20_4_ = 0xff800000;
        auVar394._24_4_ = 0xff800000;
        auVar394._28_4_ = 0xff800000;
        auVar376._8_4_ = 0x7f800000;
        auVar376._0_8_ = 0x7f8000007f800000;
        auVar376._12_4_ = 0x7f800000;
        auVar376._16_4_ = 0x7f800000;
        auVar376._20_4_ = 0x7f800000;
        auVar376._24_4_ = 0x7f800000;
        auVar376._28_4_ = 0x7f800000;
        auVar153 = vblendvps_avx(auVar376,auVar394,auVar101);
        auVar128 = vpmovsxwd_avx(auVar233);
        auVar233 = vpunpckhwd_avx(auVar233,auVar233);
        auVar246._16_16_ = auVar233;
        auVar246._0_16_ = auVar128;
        auVar105 = vblendvps_avx(auVar105,auVar153,auVar246);
        auVar153 = vblendvps_avx(auVar394,auVar376,auVar101);
        auVar388 = vblendvps_avx(auVar388,auVar153,auVar246);
        auVar153 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar112._0_4_ = auVar99._0_4_ ^ auVar153._0_4_;
        auVar112._4_4_ = auVar99._4_4_ ^ auVar153._4_4_;
        auVar112._8_4_ = auVar99._8_4_ ^ auVar153._8_4_;
        auVar112._12_4_ = auVar99._12_4_ ^ auVar153._12_4_;
        auVar112._16_4_ = auVar99._16_4_ ^ auVar153._16_4_;
        auVar112._20_4_ = auVar99._20_4_ ^ auVar153._20_4_;
        auVar112._24_4_ = auVar99._24_4_ ^ auVar153._24_4_;
        auVar112._28_4_ = auVar99._28_4_ ^ auVar153._28_4_;
        auVar99 = vorps_avx(auVar101,auVar112);
        auVar99 = vandps_avx(auVar141,auVar99);
        auVar329 = ZEXT3264(auVar99);
      }
    }
    auVar99 = local_400 & auVar329._0_32_;
    auVar276 = ZEXT3264(local_9c0);
    if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar99 >> 0x7f,0) == '\0') &&
          (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar99 >> 0xbf,0) == '\0') &&
        (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar99[0x1f]) {
      auVar329 = ZEXT3264(local_9e0);
      auVar351 = ZEXT3264(local_960);
      auVar362 = ZEXT3264(local_980);
      auVar391 = ZEXT3264(local_740);
    }
    else {
      fStack_444 = fStack_764 + fStack_884 + 0.0;
      fStack_324 = auVar349._28_4_ + auVar164._28_4_;
      auVar128 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      local_5a0._0_16_ = auVar128;
      auVar233 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_810._0_4_));
      auVar233 = vshufps_avx(auVar233,auVar233,0);
      auVar241._16_16_ = auVar233;
      auVar241._0_16_ = auVar233;
      auVar101 = vminps_avx(auVar241,auVar388);
      fVar291 = auVar16._28_4_;
      auVar146._0_4_ =
           (float)local_780._0_4_ * fVar260 +
           fVar295 * (float)local_8a0._0_4_ + (float)local_720._0_4_ * fVar359;
      auVar146._4_4_ =
           (float)local_780._4_4_ * fVar278 +
           fVar306 * (float)local_8a0._4_4_ + (float)local_720._4_4_ * fVar363;
      auVar146._8_4_ = fStack_778 * fVar281 + fVar308 * fStack_898 + fStack_718 * fVar364;
      auVar146._12_4_ = fStack_774 * fVar284 + fVar311 * fStack_894 + fStack_714 * fVar365;
      auVar146._16_4_ = fStack_770 * fVar287 + fVar314 * fStack_890 + fStack_710 * fVar366;
      auVar146._20_4_ = fStack_76c * fVar290 + fVar317 * fStack_88c + fStack_70c * fVar367;
      auVar146._24_4_ = fStack_768 * fVar293 + fVar320 * fStack_888 + fStack_708 * fVar368;
      auVar146._28_4_ = fVar291 + auVar303._28_4_ + fVar291;
      auVar99 = vrcpps_avx(auVar146);
      fVar335 = auVar99._0_4_;
      fVar344 = auVar99._4_4_;
      auVar53._4_4_ = auVar146._4_4_ * fVar344;
      auVar53._0_4_ = auVar146._0_4_ * fVar335;
      fVar261 = auVar99._8_4_;
      auVar53._8_4_ = auVar146._8_4_ * fVar261;
      fVar279 = auVar99._12_4_;
      auVar53._12_4_ = auVar146._12_4_ * fVar279;
      fVar282 = auVar99._16_4_;
      auVar53._16_4_ = auVar146._16_4_ * fVar282;
      fVar285 = auVar99._20_4_;
      auVar53._20_4_ = auVar146._20_4_ * fVar285;
      fVar288 = auVar99._24_4_;
      auVar53._24_4_ = auVar146._24_4_ * fVar288;
      auVar53._28_4_ = auVar350._28_4_;
      auVar341._8_4_ = 0x3f800000;
      auVar341._0_8_ = 0x3f8000003f800000;
      auVar341._12_4_ = 0x3f800000;
      auVar341._16_4_ = 0x3f800000;
      auVar341._20_4_ = 0x3f800000;
      auVar341._24_4_ = 0x3f800000;
      auVar341._28_4_ = 0x3f800000;
      auVar349 = vsubps_avx(auVar341,auVar53);
      auVar305._8_4_ = 0x7fffffff;
      auVar305._0_8_ = 0x7fffffff7fffffff;
      auVar305._12_4_ = 0x7fffffff;
      auVar305._16_4_ = 0x7fffffff;
      auVar305._20_4_ = 0x7fffffff;
      auVar305._24_4_ = 0x7fffffff;
      auVar305._28_4_ = 0x7fffffff;
      auVar99 = vandps_avx(auVar146,auVar305);
      auVar333._8_4_ = 0x219392ef;
      auVar333._0_8_ = 0x219392ef219392ef;
      auVar333._12_4_ = 0x219392ef;
      auVar333._16_4_ = 0x219392ef;
      auVar333._20_4_ = 0x219392ef;
      auVar333._24_4_ = 0x219392ef;
      auVar333._28_4_ = 0x219392ef;
      auVar153 = vcmpps_avx(auVar99,auVar333,1);
      auVar54._4_4_ =
           (fVar344 + fVar344 * auVar349._4_4_) *
           -(fVar247 * fVar278 + fVar230 * fVar306 + fVar228 * fVar363);
      auVar54._0_4_ =
           (fVar335 + fVar335 * auVar349._0_4_) *
           -(fVar220 * fVar260 + fVar204 * fVar295 + fVar203 * fVar359);
      auVar54._8_4_ =
           (fVar261 + fVar261 * auVar349._8_4_) *
           -(fVar225 * fVar281 + fVar223 * fVar308 + fVar257 * fVar364);
      auVar54._12_4_ =
           (fVar279 + fVar279 * auVar349._12_4_) *
           -(fVar254 * fVar284 + fVar252 * fVar311 + fVar250 * fVar365);
      auVar54._16_4_ =
           (fVar282 + fVar282 * auVar349._16_4_) *
           -(fVar286 * fVar287 + fVar283 * fVar314 + fVar280 * fVar366);
      auVar54._20_4_ =
           (fVar285 + fVar285 * auVar349._20_4_) *
           -(fVar397 * fVar290 + fVar396 * fVar317 + fVar392 * fVar367);
      auVar54._24_4_ =
           (fVar288 + fVar288 * auVar349._24_4_) *
           -(fVar25 * fVar293 + fVar24 * fVar320 + fVar23 * fVar368);
      auVar54._28_4_ = -(fVar291 + auVar15._28_4_ + fVar291);
      auVar349 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar99 = vcmpps_avx(auVar146,auVar349,1);
      auVar99 = vorps_avx(auVar153,auVar99);
      auVar389._8_4_ = 0xff800000;
      auVar389._0_8_ = 0xff800000ff800000;
      auVar389._12_4_ = 0xff800000;
      auVar389._16_4_ = 0xff800000;
      auVar389._20_4_ = 0xff800000;
      auVar389._24_4_ = 0xff800000;
      auVar389._28_4_ = 0xff800000;
      auVar99 = vblendvps_avx(auVar54,auVar389,auVar99);
      auVar349 = vcmpps_avx(auVar146,auVar349,6);
      auVar153 = vorps_avx(auVar153,auVar349);
      auVar393._8_4_ = 0x7f800000;
      auVar393._0_8_ = 0x7f8000007f800000;
      auVar393._12_4_ = 0x7f800000;
      auVar393._16_4_ = 0x7f800000;
      auVar393._20_4_ = 0x7f800000;
      auVar393._24_4_ = 0x7f800000;
      auVar393._28_4_ = 0x7f800000;
      auVar153 = vblendvps_avx(auVar54,auVar393,auVar153);
      auVar349 = vmaxps_avx(local_300,auVar105);
      auVar349 = vmaxps_avx(auVar349,auVar99);
      auVar15 = vminps_avx(auVar101,auVar153);
      auVar350 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar99 = vsubps_avx(auVar350,auVar13);
      auVar153 = vsubps_avx(auVar350,local_a00);
      auVar55._4_4_ = auVar153._4_4_ * -fVar378;
      auVar55._0_4_ = auVar153._0_4_ * -fVar370;
      auVar55._8_4_ = auVar153._8_4_ * -fVar379;
      auVar55._12_4_ = auVar153._12_4_ * -fVar380;
      auVar55._16_4_ = auVar153._16_4_ * -fVar381;
      auVar55._20_4_ = auVar153._20_4_ * -fVar382;
      auVar55._24_4_ = auVar153._24_4_ * -fVar383;
      auVar55._28_4_ = auVar153._28_4_;
      auVar56._4_4_ = fVar224 * auVar99._4_4_;
      auVar56._0_4_ = fVar201 * auVar99._0_4_;
      auVar56._8_4_ = fVar253 * auVar99._8_4_;
      auVar56._12_4_ = fVar231 * auVar99._12_4_;
      auVar56._16_4_ = fVar259 * auVar99._16_4_;
      auVar56._20_4_ = fVar358 * auVar99._20_4_;
      auVar56._24_4_ = fVar21 * auVar99._24_4_;
      auVar56._28_4_ = auVar99._28_4_;
      auVar99 = vsubps_avx(auVar55,auVar56);
      auVar153 = vsubps_avx(auVar350,auVar14);
      auVar57._4_4_ = fVar226 * auVar153._4_4_;
      auVar57._0_4_ = fVar202 * auVar153._0_4_;
      auVar57._8_4_ = fVar255 * auVar153._8_4_;
      auVar57._12_4_ = fVar248 * auVar153._12_4_;
      auVar57._16_4_ = fVar277 * auVar153._16_4_;
      auVar57._20_4_ = fVar369 * auVar153._20_4_;
      uVar2 = auVar153._28_4_;
      auVar57._24_4_ = fVar22 * auVar153._24_4_;
      auVar57._28_4_ = uVar2;
      auVar13 = vsubps_avx(auVar99,auVar57);
      auVar58._4_4_ = (float)local_720._4_4_ * -fVar378;
      auVar58._0_4_ = (float)local_720._0_4_ * -fVar370;
      auVar58._8_4_ = fStack_718 * -fVar379;
      auVar58._12_4_ = fStack_714 * -fVar380;
      auVar58._16_4_ = fStack_710 * -fVar381;
      auVar58._20_4_ = fStack_70c * -fVar382;
      auVar58._24_4_ = fStack_708 * -fVar383;
      auVar58._28_4_ = uVar80 ^ 0x80000000;
      auVar375._8_4_ = 0x3f800000;
      auVar375._0_8_ = 0x3f8000003f800000;
      auVar375._12_4_ = 0x3f800000;
      auVar375._16_4_ = 0x3f800000;
      auVar375._20_4_ = 0x3f800000;
      auVar375._24_4_ = 0x3f800000;
      auVar375._28_4_ = 0x3f800000;
      auVar59._4_4_ = fVar224 * (float)local_8a0._4_4_;
      auVar59._0_4_ = fVar201 * (float)local_8a0._0_4_;
      auVar59._8_4_ = fVar253 * fStack_898;
      auVar59._12_4_ = fVar231 * fStack_894;
      auVar59._16_4_ = fVar259 * fStack_890;
      auVar59._20_4_ = fVar358 * fStack_88c;
      auVar59._24_4_ = fVar21 * fStack_888;
      auVar59._28_4_ = uVar2;
      auVar99 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = (float)local_780._4_4_ * fVar226;
      auVar60._0_4_ = (float)local_780._0_4_ * fVar202;
      auVar60._8_4_ = fStack_778 * fVar255;
      auVar60._12_4_ = fStack_774 * fVar248;
      auVar60._16_4_ = fStack_770 * fVar277;
      auVar60._20_4_ = fStack_76c * fVar369;
      auVar60._24_4_ = fStack_768 * fVar22;
      auVar60._28_4_ = uVar2;
      auVar14 = vsubps_avx(auVar99,auVar60);
      auVar99 = vrcpps_avx(auVar14);
      fVar201 = auVar99._0_4_;
      fVar202 = auVar99._4_4_;
      auVar61._4_4_ = auVar14._4_4_ * fVar202;
      auVar61._0_4_ = auVar14._0_4_ * fVar201;
      fVar203 = auVar99._8_4_;
      auVar61._8_4_ = auVar14._8_4_ * fVar203;
      fVar204 = auVar99._12_4_;
      auVar61._12_4_ = auVar14._12_4_ * fVar204;
      fVar220 = auVar99._16_4_;
      auVar61._16_4_ = auVar14._16_4_ * fVar220;
      fVar224 = auVar99._20_4_;
      auVar61._20_4_ = auVar14._20_4_ * fVar224;
      fVar226 = auVar99._24_4_;
      auVar61._24_4_ = auVar14._24_4_ * fVar226;
      auVar61._28_4_ = fStack_764;
      auVar16 = vsubps_avx(auVar375,auVar61);
      auVar99 = vandps_avx(auVar14,auVar305);
      auVar153 = vcmpps_avx(auVar99,auVar333,1);
      auVar62._4_4_ = (fVar202 + fVar202 * auVar16._4_4_) * -auVar13._4_4_;
      auVar62._0_4_ = (fVar201 + fVar201 * auVar16._0_4_) * -auVar13._0_4_;
      auVar62._8_4_ = (fVar203 + fVar203 * auVar16._8_4_) * -auVar13._8_4_;
      auVar62._12_4_ = (fVar204 + fVar204 * auVar16._12_4_) * -auVar13._12_4_;
      auVar62._16_4_ = (fVar220 + fVar220 * auVar16._16_4_) * -auVar13._16_4_;
      auVar62._20_4_ = (fVar224 + fVar224 * auVar16._20_4_) * -auVar13._20_4_;
      auVar62._24_4_ = (fVar226 + fVar226 * auVar16._24_4_) * -auVar13._24_4_;
      auVar62._28_4_ = auVar13._28_4_ ^ 0x80000000;
      auVar99 = vcmpps_avx(auVar14,auVar350,1);
      auVar99 = vorps_avx(auVar153,auVar99);
      auVar99 = vblendvps_avx(auVar62,auVar389,auVar99);
      _local_9a0 = vmaxps_avx(auVar349,auVar99);
      auVar99 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,6);
      auVar99 = vorps_avx(auVar153,auVar99);
      auVar153 = vblendvps_avx(auVar62,auVar393,auVar99);
      auVar99 = vandps_avx(auVar329._0_32_,local_400);
      local_380 = vminps_avx(auVar15,auVar153);
      auVar153 = vcmpps_avx(_local_9a0,local_380,2);
      auVar349 = auVar99 & auVar153;
      if ((((((((auVar349 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar349 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar349 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar349 >> 0x7f,0) != '\0') ||
            (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar349 >> 0xbf,0) != '\0') ||
          (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar349[0x1f] < '\0') {
        auVar349 = vminps_avx(local_700,auVar104);
        auVar13 = vminps_avx(auVar165,auVar377);
        auVar349 = vminps_avx(auVar349,auVar13);
        auVar349 = vsubps_avx(auVar349,local_4c0);
        auVar99 = vandps_avx(auVar153,auVar99);
        auVar75._4_4_ = fStack_53c;
        auVar75._0_4_ = local_540;
        auVar75._8_4_ = fStack_538;
        auVar75._12_4_ = fStack_534;
        auVar75._16_4_ = fStack_530;
        auVar75._20_4_ = fStack_52c;
        auVar75._24_4_ = fStack_528;
        auVar75._28_4_ = fStack_524;
        auVar153 = vminps_avx(auVar75,auVar375);
        auVar153 = vmaxps_avx(auVar153,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar86 + fVar124 * (auVar153._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar115 + fVar154 * (auVar153._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar117 + fVar155 * (auVar153._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar119 + fVar156 * (auVar153._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar86 + fVar124 * (auVar153._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar115 + fVar154 * (auVar153._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar117 + fVar155 * (auVar153._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar119 + auVar153._28_4_ + 7.0;
        auVar153 = vminps_avx(_local_5c0,auVar375);
        auVar153 = vmaxps_avx(auVar153,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar86 + fVar124 * (auVar153._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar115 + fVar154 * (auVar153._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar117 + fVar155 * (auVar153._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar119 + fVar156 * (auVar153._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar86 + fVar124 * (auVar153._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar115 + fVar154 * (auVar153._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar117 + fVar155 * (auVar153._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar119 + auVar153._28_4_ + 7.0;
        auVar63._4_4_ = auVar349._4_4_ * 0.99999976;
        auVar63._0_4_ = auVar349._0_4_ * 0.99999976;
        auVar63._8_4_ = auVar349._8_4_ * 0.99999976;
        auVar63._12_4_ = auVar349._12_4_ * 0.99999976;
        auVar63._16_4_ = auVar349._16_4_ * 0.99999976;
        auVar63._20_4_ = auVar349._20_4_ * 0.99999976;
        auVar63._24_4_ = auVar349._24_4_ * 0.99999976;
        auVar63._28_4_ = 0x3f7ffffc;
        auVar153 = vmaxps_avx(ZEXT832(0) << 0x20,auVar63);
        auVar64._4_4_ = auVar153._4_4_ * auVar153._4_4_;
        auVar64._0_4_ = auVar153._0_4_ * auVar153._0_4_;
        auVar64._8_4_ = auVar153._8_4_ * auVar153._8_4_;
        auVar64._12_4_ = auVar153._12_4_ * auVar153._12_4_;
        auVar64._16_4_ = auVar153._16_4_ * auVar153._16_4_;
        auVar64._20_4_ = auVar153._20_4_ * auVar153._20_4_;
        auVar64._24_4_ = auVar153._24_4_ * auVar153._24_4_;
        auVar64._28_4_ = auVar153._28_4_;
        local_860 = vsubps_avx(auVar100,auVar64);
        auVar65._4_4_ = local_860._4_4_ * fVar118 * 4.0;
        auVar65._0_4_ = local_860._0_4_ * fVar116 * 4.0;
        auVar65._8_4_ = local_860._8_4_ * fStack_8b8;
        auVar65._12_4_ = local_860._12_4_ * fStack_8b4;
        auVar65._16_4_ = local_860._16_4_ * fStack_8b0;
        auVar65._20_4_ = local_860._20_4_ * fStack_8ac;
        auVar65._24_4_ = local_860._24_4_ * fStack_8a8;
        auVar65._28_4_ = auVar153._28_4_;
        auVar349 = vsubps_avx(_local_560,auVar65);
        auVar153 = vcmpps_avx(auVar349,ZEXT832(0) << 0x20,5);
        if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar153 >> 0x7f,0) == '\0') &&
              (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar153 >> 0xbf,0) == '\0') &&
            (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar153[0x1f]) {
          auVar165 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_7c0 = ZEXT832(0) << 0x20;
          _local_560 = ZEXT832(0) << 0x20;
          auVar189 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar214 = ZEXT828(0) << 0x20;
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar272._8_4_ = 0xff800000;
          auVar272._0_8_ = 0xff800000ff800000;
          auVar272._12_4_ = 0xff800000;
          auVar272._16_4_ = 0xff800000;
          auVar272._20_4_ = 0xff800000;
          auVar272._24_4_ = 0xff800000;
          auVar272._28_4_ = 0xff800000;
          local_860 = auVar28;
          _local_7a0 = _local_7c0;
        }
        else {
          auVar165 = vsqrtps_avx(auVar349);
          auVar195._0_4_ = fVar116 + fVar116;
          auVar195._4_4_ = fVar118 + fVar118;
          auVar195._8_4_ = fVar120 + fVar120;
          auVar195._12_4_ = fVar121 + fVar121;
          auVar195._16_4_ = fVar122 + fVar122;
          auVar195._20_4_ = fVar123 + fVar123;
          auVar195._24_4_ = fVar334 + fVar334;
          auVar195._28_4_ = fVar198 + fVar198;
          auVar13 = vrcpps_avx(auVar195);
          fVar198 = auVar13._0_4_;
          fVar201 = auVar13._4_4_;
          auVar66._4_4_ = auVar195._4_4_ * fVar201;
          auVar66._0_4_ = auVar195._0_4_ * fVar198;
          fVar202 = auVar13._8_4_;
          auVar66._8_4_ = auVar195._8_4_ * fVar202;
          fVar203 = auVar13._12_4_;
          auVar66._12_4_ = auVar195._12_4_ * fVar203;
          fVar204 = auVar13._16_4_;
          auVar66._16_4_ = auVar195._16_4_ * fVar204;
          fVar220 = auVar13._20_4_;
          auVar66._20_4_ = auVar195._20_4_ * fVar220;
          fVar224 = auVar13._24_4_;
          auVar66._24_4_ = auVar195._24_4_ * fVar224;
          auVar66._28_4_ = auVar195._28_4_;
          auVar14 = vsubps_avx(auVar375,auVar66);
          fVar198 = fVar198 + fVar198 * auVar14._0_4_;
          fVar201 = fVar201 + fVar201 * auVar14._4_4_;
          fVar202 = fVar202 + fVar202 * auVar14._8_4_;
          fVar203 = fVar203 + fVar203 * auVar14._12_4_;
          fVar204 = fVar204 + fVar204 * auVar14._16_4_;
          fVar220 = fVar220 + fVar220 * auVar14._20_4_;
          fVar224 = fVar224 + fVar224 * auVar14._24_4_;
          fVar226 = auVar13._28_4_ + auVar14._28_4_;
          auVar216._0_8_ = local_8e0._0_8_ ^ 0x8000000080000000;
          auVar216._8_4_ = -local_8e0._8_4_;
          auVar216._12_4_ = -local_8e0._12_4_;
          auVar216._16_4_ = -local_8e0._16_4_;
          auVar216._20_4_ = -local_8e0._20_4_;
          auVar216._24_4_ = -local_8e0._24_4_;
          auVar216._28_4_ = -local_8e0._28_4_;
          auVar13 = vsubps_avx(auVar216,auVar165);
          fVar228 = auVar13._0_4_ * fVar198;
          fVar230 = auVar13._4_4_ * fVar201;
          auVar67._4_4_ = fVar230;
          auVar67._0_4_ = fVar228;
          fVar247 = auVar13._8_4_ * fVar202;
          auVar67._8_4_ = fVar247;
          fVar253 = auVar13._12_4_ * fVar203;
          auVar67._12_4_ = fVar253;
          fVar255 = auVar13._16_4_ * fVar204;
          auVar67._16_4_ = fVar255;
          fVar257 = auVar13._20_4_ * fVar220;
          auVar67._20_4_ = fVar257;
          fVar223 = auVar13._24_4_ * fVar224;
          auVar67._24_4_ = fVar223;
          auVar67._28_4_ = 0x3f800000;
          auVar165 = vsubps_avx(auVar165,local_8e0);
          auVar276._0_4_ = auVar165._0_4_ * fVar198;
          auVar276._4_4_ = auVar165._4_4_ * fVar201;
          auVar276._8_4_ = auVar165._8_4_ * fVar202;
          auVar276._12_4_ = auVar165._12_4_ * fVar203;
          auVar276._16_4_ = auVar165._16_4_ * fVar204;
          auVar276._20_4_ = auVar165._20_4_ * fVar220;
          auVar276._28_36_ = auVar329._28_36_;
          auVar276._24_4_ = auVar165._24_4_ * fVar224;
          fVar198 = local_340 * (fVar228 * local_460 + fVar296);
          fVar201 = fStack_33c * (fVar230 * fStack_45c + fVar307);
          fVar202 = fStack_338 * (fVar247 * fStack_458 + fVar309);
          fVar203 = fStack_334 * (fVar253 * fStack_454 + fVar312);
          fVar204 = fStack_330 * (fVar255 * fStack_450 + fVar315);
          fVar220 = fStack_32c * (fVar257 * fStack_44c + fVar318);
          fVar224 = fStack_328 * (fVar223 * fStack_448 + fVar321);
          auVar166._0_4_ = auVar372._0_4_ + fVar200 * fVar198;
          auVar166._4_4_ = auVar372._4_4_ + fVar222 * fVar201;
          auVar166._8_4_ = auVar372._8_4_ + fVar251 * fVar202;
          auVar166._12_4_ = auVar372._12_4_ + fVar229 * fVar203;
          auVar166._16_4_ = auVar372._16_4_ + fVar258 * fVar204;
          auVar166._20_4_ = auVar372._20_4_ + fVar292 * fVar220;
          auVar166._24_4_ = auVar372._24_4_ + fVar20 * fVar224;
          auVar166._28_4_ = auVar372._28_4_ + auVar165._28_4_ + fVar323;
          auVar68._4_4_ = fVar230 * (float)local_780._4_4_;
          auVar68._0_4_ = fVar228 * (float)local_780._0_4_;
          auVar68._8_4_ = fVar247 * fStack_778;
          auVar68._12_4_ = fVar253 * fStack_774;
          auVar68._16_4_ = fVar255 * fStack_770;
          auVar68._20_4_ = fVar257 * fStack_76c;
          auVar68._24_4_ = fVar223 * fStack_768;
          auVar68._28_4_ = fVar226;
          auVar165 = vsubps_avx(auVar68,auVar166);
          auVar196._0_4_ = auVar386._0_4_ + fVar199 * fVar198;
          auVar196._4_4_ = auVar386._4_4_ + fVar221 * fVar201;
          auVar196._8_4_ = auVar386._8_4_ + fVar249 * fVar202;
          auVar196._12_4_ = auVar386._12_4_ + fVar227 * fVar203;
          auVar196._16_4_ = auVar386._16_4_ + fVar256 * fVar204;
          auVar196._20_4_ = auVar386._20_4_ + fVar289 * fVar220;
          auVar196._24_4_ = auVar386._24_4_ + fVar19 * fVar224;
          auVar196._28_4_ = auVar386._28_4_ + fVar226;
          auVar243._0_4_ = (float)local_8a0._0_4_ * fVar228;
          auVar243._4_4_ = (float)local_8a0._4_4_ * fVar230;
          auVar243._8_4_ = fStack_898 * fVar247;
          auVar243._12_4_ = fStack_894 * fVar253;
          auVar243._16_4_ = fStack_890 * fVar255;
          auVar243._20_4_ = fStack_88c * fVar257;
          auVar243._24_4_ = fStack_888 * fVar223;
          auVar243._28_4_ = 0;
          _local_a20 = vsubps_avx(auVar243,auVar196);
          auVar217._0_4_ = local_4e0._0_4_ + fVar345 * fVar198;
          auVar217._4_4_ = local_4e0._4_4_ + fVar352 * fVar201;
          auVar217._8_4_ = local_4e0._8_4_ + fVar353 * fVar202;
          auVar217._12_4_ = local_4e0._12_4_ + fVar354 * fVar203;
          auVar217._16_4_ = local_4e0._16_4_ + fVar355 * fVar204;
          auVar217._20_4_ = local_4e0._20_4_ + fVar356 * fVar220;
          auVar217._24_4_ = local_4e0._24_4_ + fVar357 * fVar224;
          auVar217._28_4_ = local_4e0._28_4_ + auVar13._28_4_;
          auVar69._4_4_ = (float)local_720._4_4_ * fVar230;
          auVar69._0_4_ = (float)local_720._0_4_ * fVar228;
          auVar69._8_4_ = fStack_718 * fVar247;
          auVar69._12_4_ = fStack_714 * fVar253;
          auVar69._16_4_ = fStack_710 * fVar255;
          auVar69._20_4_ = fStack_70c * fVar257;
          auVar69._24_4_ = fStack_708 * fVar223;
          auVar69._28_4_ = 0;
          auVar13 = vsubps_avx(auVar69,auVar217);
          auVar214 = auVar13._0_28_;
          fVar198 = local_340 * (auVar276._0_4_ * local_460 + fVar296);
          fVar201 = fStack_33c * (auVar276._4_4_ * fStack_45c + fVar307);
          fVar202 = fStack_338 * (auVar276._8_4_ * fStack_458 + fVar309);
          fVar203 = fStack_334 * (auVar276._12_4_ * fStack_454 + fVar312);
          fVar204 = fStack_330 * (auVar276._16_4_ * fStack_450 + fVar315);
          fVar220 = fStack_32c * (auVar276._20_4_ * fStack_44c + fVar318);
          fVar224 = fStack_328 * (auVar276._24_4_ * fStack_448 + fVar321);
          auVar273._0_4_ = auVar372._0_4_ + fVar200 * fVar198;
          auVar273._4_4_ = auVar372._4_4_ + fVar222 * fVar201;
          auVar273._8_4_ = auVar372._8_4_ + fVar251 * fVar202;
          auVar273._12_4_ = auVar372._12_4_ + fVar229 * fVar203;
          auVar273._16_4_ = auVar372._16_4_ + fVar258 * fVar204;
          auVar273._20_4_ = auVar372._20_4_ + fVar292 * fVar220;
          auVar273._24_4_ = auVar372._24_4_ + fVar20 * fVar224;
          auVar273._28_4_ = auVar372._28_4_ + (float)local_520._28_4_;
          auVar70._4_4_ = auVar276._4_4_ * (float)local_780._4_4_;
          auVar70._0_4_ = auVar276._0_4_ * (float)local_780._0_4_;
          auVar70._8_4_ = auVar276._8_4_ * fStack_778;
          auVar70._12_4_ = auVar276._12_4_ * fStack_774;
          auVar70._16_4_ = auVar276._16_4_ * fStack_770;
          auVar70._20_4_ = auVar276._20_4_ * fStack_76c;
          auVar70._24_4_ = auVar276._24_4_ * fStack_768;
          auVar70._28_4_ = fStack_764;
          _local_7a0 = vsubps_avx(auVar70,auVar273);
          auVar274._0_4_ = auVar386._0_4_ + fVar199 * fVar198;
          auVar274._4_4_ = auVar386._4_4_ + fVar221 * fVar201;
          auVar274._8_4_ = auVar386._8_4_ + fVar249 * fVar202;
          auVar274._12_4_ = auVar386._12_4_ + fVar227 * fVar203;
          auVar274._16_4_ = auVar386._16_4_ + fVar256 * fVar204;
          auVar274._20_4_ = auVar386._20_4_ + fVar289 * fVar220;
          auVar274._24_4_ = auVar386._24_4_ + fVar19 * fVar224;
          auVar274._28_4_ = auVar386._28_4_ + local_7a0._28_4_;
          auVar71._4_4_ = (float)local_8a0._4_4_ * auVar276._4_4_;
          auVar71._0_4_ = (float)local_8a0._0_4_ * auVar276._0_4_;
          auVar71._8_4_ = fStack_898 * auVar276._8_4_;
          auVar71._12_4_ = fStack_894 * auVar276._12_4_;
          auVar71._16_4_ = fStack_890 * auVar276._16_4_;
          auVar71._20_4_ = fStack_88c * auVar276._20_4_;
          auVar71._24_4_ = fStack_888 * auVar276._24_4_;
          auVar71._28_4_ = fStack_764;
          _local_7c0 = vsubps_avx(auVar71,auVar274);
          auVar244._0_4_ = local_4e0._0_4_ + fVar345 * fVar198;
          auVar244._4_4_ = local_4e0._4_4_ + fVar352 * fVar201;
          auVar244._8_4_ = local_4e0._8_4_ + fVar353 * fVar202;
          auVar244._12_4_ = local_4e0._12_4_ + fVar354 * fVar203;
          auVar244._16_4_ = local_4e0._16_4_ + fVar355 * fVar204;
          auVar244._20_4_ = local_4e0._20_4_ + fVar356 * fVar220;
          auVar244._24_4_ = local_4e0._24_4_ + fVar357 * fVar224;
          auVar244._28_4_ = local_4e0._28_4_ + fVar323 + 0.0;
          auVar72._4_4_ = (float)local_720._4_4_ * auVar276._4_4_;
          auVar72._0_4_ = (float)local_720._0_4_ * auVar276._0_4_;
          auVar72._8_4_ = fStack_718 * auVar276._8_4_;
          auVar72._12_4_ = fStack_714 * auVar276._12_4_;
          auVar72._16_4_ = fStack_710 * auVar276._16_4_;
          auVar72._20_4_ = fStack_70c * auVar276._20_4_;
          auVar72._24_4_ = fStack_708 * auVar276._24_4_;
          auVar72._28_4_ = local_7c0._28_4_;
          _local_560 = vsubps_avx(auVar72,auVar244);
          auVar13 = vcmpps_avx(auVar349,_DAT_01faff00,5);
          auVar245._8_4_ = 0x7f800000;
          auVar245._0_8_ = 0x7f8000007f800000;
          auVar245._12_4_ = 0x7f800000;
          auVar245._16_4_ = 0x7f800000;
          auVar245._20_4_ = 0x7f800000;
          auVar245._24_4_ = 0x7f800000;
          auVar245._28_4_ = 0x7f800000;
          auVar242 = vblendvps_avx(auVar245,auVar67,auVar13);
          auVar342._8_4_ = 0x7fffffff;
          auVar342._0_8_ = 0x7fffffff7fffffff;
          auVar342._12_4_ = 0x7fffffff;
          auVar342._16_4_ = 0x7fffffff;
          auVar342._20_4_ = 0x7fffffff;
          auVar342._24_4_ = 0x7fffffff;
          auVar342._28_4_ = 0x7fffffff;
          auVar349 = vandps_avx(auVar342,local_360);
          auVar349 = vmaxps_avx(local_440,auVar349);
          auVar73._4_4_ = auVar349._4_4_ * 1.9073486e-06;
          auVar73._0_4_ = auVar349._0_4_ * 1.9073486e-06;
          auVar73._8_4_ = auVar349._8_4_ * 1.9073486e-06;
          auVar73._12_4_ = auVar349._12_4_ * 1.9073486e-06;
          auVar73._16_4_ = auVar349._16_4_ * 1.9073486e-06;
          auVar73._20_4_ = auVar349._20_4_ * 1.9073486e-06;
          auVar73._24_4_ = auVar349._24_4_ * 1.9073486e-06;
          auVar73._28_4_ = auVar349._28_4_;
          auVar349 = vandps_avx(auVar342,auVar26);
          auVar349 = vcmpps_avx(auVar349,auVar73,1);
          auVar275._8_4_ = 0xff800000;
          auVar275._0_8_ = 0xff800000ff800000;
          auVar275._12_4_ = 0xff800000;
          auVar275._16_4_ = 0xff800000;
          auVar275._20_4_ = 0xff800000;
          auVar275._24_4_ = 0xff800000;
          auVar275._28_4_ = 0xff800000;
          auVar272 = vblendvps_avx(auVar275,auVar276._0_32_,auVar13);
          auVar14 = auVar13 & auVar349;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar153 = vandps_avx(auVar349,auVar13);
            auVar233 = vpackssdw_avx(auVar153._0_16_,auVar153._16_16_);
            auVar377 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar14 = vcmpps_avx(local_860,auVar377,2);
            auVar390._8_4_ = 0xff800000;
            auVar390._0_8_ = 0xff800000ff800000;
            auVar390._12_4_ = 0xff800000;
            auVar390._16_4_ = 0xff800000;
            auVar390._20_4_ = 0xff800000;
            auVar390._24_4_ = 0xff800000;
            auVar390._28_4_ = 0xff800000;
            auVar395._8_4_ = 0x7f800000;
            auVar395._0_8_ = 0x7f8000007f800000;
            auVar395._12_4_ = 0x7f800000;
            auVar395._16_4_ = 0x7f800000;
            auVar395._20_4_ = 0x7f800000;
            auVar395._24_4_ = 0x7f800000;
            auVar395._28_4_ = 0x7f800000;
            auVar349 = vblendvps_avx(auVar395,auVar390,auVar14);
            auVar182 = vpmovsxwd_avx(auVar233);
            auVar233 = vpunpckhwd_avx(auVar233,auVar233);
            auVar343._16_16_ = auVar233;
            auVar343._0_16_ = auVar182;
            auVar242 = vblendvps_avx(auVar242,auVar349,auVar343);
            auVar349 = vblendvps_avx(auVar390,auVar395,auVar14);
            auVar272 = vblendvps_avx(auVar272,auVar349,auVar343);
            auVar349 = vcmpps_avx(auVar377,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar113._0_4_ = auVar349._0_4_ ^ auVar153._0_4_;
            auVar113._4_4_ = auVar349._4_4_ ^ auVar153._4_4_;
            auVar113._8_4_ = auVar349._8_4_ ^ auVar153._8_4_;
            auVar113._12_4_ = auVar349._12_4_ ^ auVar153._12_4_;
            auVar113._16_4_ = auVar349._16_4_ ^ auVar153._16_4_;
            auVar113._20_4_ = auVar349._20_4_ ^ auVar153._20_4_;
            auVar113._24_4_ = auVar349._24_4_ ^ auVar153._24_4_;
            auVar113._28_4_ = auVar349._28_4_ ^ auVar153._28_4_;
            auVar153 = vorps_avx(auVar14,auVar113);
            auVar153 = vandps_avx(auVar13,auVar153);
          }
          auVar189 = local_a20._0_28_;
          local_a00 = auVar165;
        }
        _local_3e0 = _local_9a0;
        local_3c0 = vminps_avx(local_380,auVar242);
        local_3a0 = vmaxps_avx(_local_9a0,auVar272);
        auVar349 = vcmpps_avx(_local_9a0,local_3c0,2);
        local_4c0 = vandps_avx(auVar99,auVar349);
        auVar349 = vcmpps_avx(local_3a0,local_380,2);
        local_500 = vandps_avx(auVar99,auVar349);
        auVar99 = vorps_avx(local_500,local_4c0);
        if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar99 >> 0x7f,0) != '\0') ||
              (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar99 >> 0xbf,0) != '\0') ||
            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar99[0x1f] < '\0') {
          _local_580 = local_3a0;
          auVar349 = _local_580;
          _local_5c0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_520._0_4_ = auVar153._0_4_ ^ local_5c0._0_4_;
          local_520._4_4_ = auVar153._4_4_ ^ local_5c0._4_4_;
          local_520._8_4_ = auVar153._8_4_ ^ local_5c0._8_4_;
          local_520._12_4_ = auVar153._12_4_ ^ local_5c0._12_4_;
          local_520._16_4_ = auVar153._16_4_ ^ local_5c0._16_4_;
          local_520._20_4_ = auVar153._20_4_ ^ local_5c0._20_4_;
          local_520._24_4_ = auVar153._24_4_ ^ local_5c0._24_4_;
          local_520._28_4_ = (uint)auVar153._28_4_ ^ (uint)local_5c0._28_4_;
          auVar108._0_4_ =
               auVar165._0_4_ * (float)local_780._0_4_ +
               auVar189._0_4_ * (float)local_8a0._0_4_ + (float)local_720._0_4_ * auVar214._0_4_;
          auVar108._4_4_ =
               auVar165._4_4_ * (float)local_780._4_4_ +
               auVar189._4_4_ * (float)local_8a0._4_4_ + (float)local_720._4_4_ * auVar214._4_4_;
          auVar108._8_4_ =
               auVar165._8_4_ * fStack_778 +
               auVar189._8_4_ * fStack_898 + fStack_718 * auVar214._8_4_;
          auVar108._12_4_ =
               auVar165._12_4_ * fStack_774 +
               auVar189._12_4_ * fStack_894 + fStack_714 * auVar214._12_4_;
          auVar108._16_4_ =
               auVar165._16_4_ * fStack_770 +
               auVar189._16_4_ * fStack_890 + fStack_710 * auVar214._16_4_;
          auVar108._20_4_ =
               auVar165._20_4_ * fStack_76c +
               auVar189._20_4_ * fStack_88c + fStack_70c * auVar214._20_4_;
          auVar108._24_4_ =
               auVar165._24_4_ * fStack_768 +
               auVar189._24_4_ * fStack_888 + fStack_708 * auVar214._24_4_;
          auVar108._28_4_ = auVar153._28_4_ + local_5c0._28_4_ + auVar165._28_4_;
          auVar148._8_4_ = 0x7fffffff;
          auVar148._0_8_ = 0x7fffffff7fffffff;
          auVar148._12_4_ = 0x7fffffff;
          auVar148._16_4_ = 0x7fffffff;
          auVar148._20_4_ = 0x7fffffff;
          auVar148._24_4_ = 0x7fffffff;
          auVar148._28_4_ = 0x7fffffff;
          auVar99 = vandps_avx(auVar108,auVar148);
          auVar149._8_4_ = 0x3e99999a;
          auVar149._0_8_ = 0x3e99999a3e99999a;
          auVar149._12_4_ = 0x3e99999a;
          auVar149._16_4_ = 0x3e99999a;
          auVar149._20_4_ = 0x3e99999a;
          auVar149._24_4_ = 0x3e99999a;
          auVar149._28_4_ = 0x3e99999a;
          auVar99 = vcmpps_avx(auVar99,auVar149,1);
          auVar99 = vorps_avx(auVar99,local_520);
          auVar150._8_4_ = 3;
          auVar150._0_8_ = 0x300000003;
          auVar150._12_4_ = 3;
          auVar150._16_4_ = 3;
          auVar150._20_4_ = 3;
          auVar150._24_4_ = 3;
          auVar150._28_4_ = 3;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar99 = vblendvps_avx(auVar167,auVar150,auVar99);
          local_7e0 = ZEXT432(local_c08);
          auVar182 = vpshufd_avx(ZEXT416(local_c08),0);
          auVar233 = vpcmpgtd_avx(auVar99._16_16_,auVar182);
          local_540 = auVar182._0_4_;
          fStack_53c = auVar182._4_4_;
          fStack_538 = auVar182._8_4_;
          fStack_534 = auVar182._12_4_;
          auVar182 = vpcmpgtd_avx(auVar99._0_16_,auVar182);
          auVar151._16_16_ = auVar233;
          auVar151._0_16_ = auVar182;
          local_4e0 = vblendps_avx(ZEXT1632(auVar182),auVar151,0xf0);
          local_4a0 = vandnps_avx(local_4e0,local_4c0);
          auVar329 = ZEXT3264(local_4a0);
          auVar99 = local_4c0 & ~local_4e0;
          auVar276 = ZEXT3264(local_9c0);
          local_a80 = auVar7._0_4_;
          fStack_a7c = auVar7._4_4_;
          fStack_a78 = auVar7._8_4_;
          fStack_a74 = auVar7._12_4_;
          local_a60 = auVar6._0_4_;
          fStack_a5c = auVar6._4_4_;
          fStack_a58 = auVar6._8_4_;
          fStack_a54 = auVar6._12_4_;
          local_a70 = auVar5._0_4_;
          fStack_a6c = auVar5._4_4_;
          fStack_a68 = auVar5._8_4_;
          fStack_a64 = auVar5._12_4_;
          local_a90 = auVar8._0_4_;
          fStack_a8c = auVar8._4_4_;
          fStack_a88 = auVar8._8_4_;
          fStack_a84 = auVar8._12_4_;
          if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar99 >> 0x7f,0) == '\0') &&
                (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar99 >> 0xbf,0) == '\0') &&
              (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar99[0x1f]) {
            auVar233 = vshufps_avx(auVar128,auVar128,0);
            auVar109._16_16_ = auVar233;
            auVar109._0_16_ = auVar233;
            local_580._0_4_ = local_3a0._0_4_;
            local_580._4_4_ = local_3a0._4_4_;
            fStack_578 = local_3a0._8_4_;
            fStack_574 = local_3a0._12_4_;
            fStack_570 = local_3a0._16_4_;
            fStack_56c = local_3a0._20_4_;
            fStack_568 = local_3a0._24_4_;
            fStack_564 = local_3a0._28_4_;
            auVar214 = local_780._0_28_;
            fVar198 = (float)local_580._0_4_;
            fVar199 = (float)local_580._4_4_;
            fVar200 = fStack_578;
            fVar201 = fStack_574;
            fVar202 = fStack_570;
            fVar203 = fStack_56c;
            fVar204 = fStack_568;
            fVar220 = fStack_564;
            _local_580 = auVar349;
          }
          else {
            local_760._4_4_ = (float)local_9a0._4_4_ + local_880._4_4_;
            local_760._0_4_ = (float)local_9a0._0_4_ + (float)local_880;
            fStack_758 = fStack_998 + (float)uStack_878;
            fStack_754 = fStack_994 + uStack_878._4_4_;
            fStack_750 = fStack_990 + (float)uStack_870;
            fStack_74c = fStack_98c + uStack_870._4_4_;
            fStack_748 = fStack_988 + (float)uStack_868;
            fStack_744 = fStack_984 + uStack_868._4_4_;
            do {
              auVar110._8_4_ = 0x7f800000;
              auVar110._0_8_ = 0x7f8000007f800000;
              auVar110._12_4_ = 0x7f800000;
              auVar110._16_4_ = 0x7f800000;
              auVar110._20_4_ = 0x7f800000;
              auVar110._24_4_ = 0x7f800000;
              auVar110._28_4_ = 0x7f800000;
              auVar99 = auVar329._0_32_;
              auVar153 = vblendvps_avx(auVar110,_local_9a0,auVar99);
              auVar349 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar349 = vminps_avx(auVar153,auVar349);
              auVar13 = vshufpd_avx(auVar349,auVar349,5);
              auVar349 = vminps_avx(auVar349,auVar13);
              auVar13 = vperm2f128_avx(auVar349,auVar349,1);
              auVar349 = vminps_avx(auVar349,auVar13);
              auVar153 = vcmpps_avx(auVar153,auVar349,0);
              auVar349 = auVar99 & auVar153;
              if ((((((((auVar349 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar349 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar349 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar349 >> 0x7f,0) != '\0') ||
                    (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar349 >> 0xbf,0) != '\0') ||
                  (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar349[0x1f] < '\0') {
                auVar99 = vandps_avx(auVar153,auVar99);
              }
              uVar77 = vmovmskps_avx(auVar99);
              uVar80 = 0;
              if (uVar77 != 0) {
                for (; (uVar77 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
                }
              }
              uVar79 = (ulong)uVar80;
              *(undefined4 *)(local_4a0 + uVar79 * 4) = 0;
              fVar198 = local_1a0[uVar79];
              uVar80 = *(uint *)(local_3e0 + uVar79 * 4);
              fVar199 = auVar127._0_4_;
              if ((float)local_900._0_4_ < 0.0) {
                fVar199 = sqrtf((float)local_900._0_4_);
              }
              auVar128 = vminps_avx(auVar6,auVar7);
              auVar233 = vmaxps_avx(auVar6,auVar7);
              auVar182 = vminps_avx(auVar5,auVar8);
              auVar95 = vminps_avx(auVar128,auVar182);
              auVar128 = vmaxps_avx(auVar5,auVar8);
              auVar182 = vmaxps_avx(auVar233,auVar128);
              auVar176._8_4_ = 0x7fffffff;
              auVar176._0_8_ = 0x7fffffff7fffffff;
              auVar176._12_4_ = 0x7fffffff;
              auVar233 = vandps_avx(auVar95,auVar176);
              auVar128 = vandps_avx(auVar182,auVar176);
              auVar233 = vmaxps_avx(auVar233,auVar128);
              auVar128 = vmovshdup_avx(auVar233);
              auVar128 = vmaxss_avx(auVar128,auVar233);
              auVar233 = vshufpd_avx(auVar233,auVar233,1);
              auVar233 = vmaxss_avx(auVar233,auVar128);
              local_a00._0_4_ = auVar233._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar199 * 1.9073486e-06;
              local_700._0_16_ = vshufps_avx(auVar182,auVar182,0xff);
              auVar233 = vinsertps_avx(ZEXT416(uVar80),ZEXT416((uint)fVar198),0x10);
              lVar85 = 5;
              do {
                auVar128 = vmovshdup_avx(auVar233);
                fVar230 = auVar128._0_4_;
                fVar202 = 1.0 - fVar230;
                auVar128 = vshufps_avx(auVar233,auVar233,0x55);
                fVar198 = auVar128._0_4_;
                fVar199 = auVar128._4_4_;
                fVar200 = auVar128._8_4_;
                fVar201 = auVar128._12_4_;
                auVar128 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
                fVar203 = auVar128._0_4_;
                fVar204 = auVar128._4_4_;
                fVar220 = auVar128._8_4_;
                fVar221 = auVar128._12_4_;
                fVar222 = local_a70 * fVar198 + local_a80 * fVar203;
                fVar224 = fStack_a6c * fVar199 + fStack_a7c * fVar204;
                fVar226 = fStack_a68 * fVar200 + fStack_a78 * fVar220;
                fVar228 = fStack_a64 * fVar201 + fStack_a74 * fVar221;
                auVar234._0_4_ =
                     fVar203 * (local_a80 * fVar198 + fVar203 * local_a60) + fVar198 * fVar222;
                auVar234._4_4_ =
                     fVar204 * (fStack_a7c * fVar199 + fVar204 * fStack_a5c) + fVar199 * fVar224;
                auVar234._8_4_ =
                     fVar220 * (fStack_a78 * fVar200 + fVar220 * fStack_a58) + fVar200 * fVar226;
                auVar234._12_4_ =
                     fVar221 * (fStack_a74 * fVar201 + fVar221 * fStack_a54) + fVar201 * fVar228;
                auVar177._0_4_ =
                     fVar203 * fVar222 + fVar198 * (fVar198 * local_a90 + local_a70 * fVar203);
                auVar177._4_4_ =
                     fVar204 * fVar224 + fVar199 * (fVar199 * fStack_a8c + fStack_a6c * fVar204);
                auVar177._8_4_ =
                     fVar220 * fVar226 + fVar200 * (fVar200 * fStack_a88 + fStack_a68 * fVar220);
                auVar177._12_4_ =
                     fVar221 * fVar228 + fVar201 * (fVar201 * fStack_a84 + fStack_a64 * fVar221);
                auVar128 = vshufps_avx(auVar233,auVar233,0);
                auVar129._0_4_ = auVar128._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar129._4_4_ = auVar128._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar129._8_4_ = auVar128._8_4_ * fStack_8e8 + 0.0;
                auVar129._12_4_ = auVar128._12_4_ * fStack_8e4 + 0.0;
                auVar91._0_4_ = fVar203 * auVar234._0_4_ + fVar198 * auVar177._0_4_;
                auVar91._4_4_ = fVar204 * auVar234._4_4_ + fVar199 * auVar177._4_4_;
                auVar91._8_4_ = fVar220 * auVar234._8_4_ + fVar200 * auVar177._8_4_;
                auVar91._12_4_ = fVar221 * auVar234._12_4_ + fVar201 * auVar177._12_4_;
                local_860._0_16_ = auVar91;
                auVar128 = vsubps_avx(auVar129,auVar91);
                _local_a20 = auVar128;
                auVar128 = vdpps_avx(auVar128,auVar128,0x7f);
                fVar198 = auVar128._0_4_;
                if (fVar198 < 0.0) {
                  fVar199 = sqrtf(fVar198);
                }
                else {
                  auVar182 = vsqrtss_avx(auVar128,auVar128);
                  fVar199 = auVar182._0_4_;
                }
                auVar182 = vsubps_avx(auVar177,auVar234);
                auVar263._0_4_ = auVar182._0_4_ * 3.0;
                auVar263._4_4_ = auVar182._4_4_ * 3.0;
                auVar263._8_4_ = auVar182._8_4_ * 3.0;
                auVar263._12_4_ = auVar182._12_4_ * 3.0;
                auVar182 = vshufps_avx(ZEXT416((uint)(fVar230 * 6.0)),ZEXT416((uint)(fVar230 * 6.0))
                                       ,0);
                auVar95 = ZEXT416((uint)((fVar202 - (fVar230 + fVar230)) * 6.0));
                auVar87 = vshufps_avx(auVar95,auVar95,0);
                auVar95 = ZEXT416((uint)((fVar230 - (fVar202 + fVar202)) * 6.0));
                auVar125 = vshufps_avx(auVar95,auVar95,0);
                auVar126 = vshufps_avx(ZEXT416((uint)(fVar202 * 6.0)),ZEXT416((uint)(fVar202 * 6.0))
                                       ,0);
                auVar95 = vdpps_avx(auVar263,auVar263,0x7f);
                auVar130._0_4_ =
                     auVar126._0_4_ * local_a60 +
                     auVar125._0_4_ * local_a80 +
                     auVar182._0_4_ * local_a90 + auVar87._0_4_ * local_a70;
                auVar130._4_4_ =
                     auVar126._4_4_ * fStack_a5c +
                     auVar125._4_4_ * fStack_a7c +
                     auVar182._4_4_ * fStack_a8c + auVar87._4_4_ * fStack_a6c;
                auVar130._8_4_ =
                     auVar126._8_4_ * fStack_a58 +
                     auVar125._8_4_ * fStack_a78 +
                     auVar182._8_4_ * fStack_a88 + auVar87._8_4_ * fStack_a68;
                auVar130._12_4_ =
                     auVar126._12_4_ * fStack_a54 +
                     auVar125._12_4_ * fStack_a74 +
                     auVar182._12_4_ * fStack_a84 + auVar87._12_4_ * fStack_a64;
                auVar182 = vblendps_avx(auVar95,_DAT_01f7aa10,0xe);
                auVar87 = vrsqrtss_avx(auVar182,auVar182);
                fVar201 = auVar87._0_4_;
                fVar200 = auVar95._0_4_;
                auVar87 = vdpps_avx(auVar263,auVar130,0x7f);
                auVar125 = vshufps_avx(auVar95,auVar95,0);
                auVar131._0_4_ = auVar130._0_4_ * auVar125._0_4_;
                auVar131._4_4_ = auVar130._4_4_ * auVar125._4_4_;
                auVar131._8_4_ = auVar130._8_4_ * auVar125._8_4_;
                auVar131._12_4_ = auVar130._12_4_ * auVar125._12_4_;
                auVar87 = vshufps_avx(auVar87,auVar87,0);
                auVar206._0_4_ = auVar263._0_4_ * auVar87._0_4_;
                auVar206._4_4_ = auVar263._4_4_ * auVar87._4_4_;
                auVar206._8_4_ = auVar263._8_4_ * auVar87._8_4_;
                auVar206._12_4_ = auVar263._12_4_ * auVar87._12_4_;
                auVar126 = vsubps_avx(auVar131,auVar206);
                auVar87 = vrcpss_avx(auVar182,auVar182);
                auVar182 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(auVar233._0_4_ * (float)local_6a0._0_4_)));
                auVar87 = ZEXT416((uint)(auVar87._0_4_ * (2.0 - fVar200 * auVar87._0_4_)));
                auVar87 = vshufps_avx(auVar87,auVar87,0);
                uVar79 = CONCAT44(auVar263._4_4_,auVar263._0_4_);
                auVar324._0_8_ = uVar79 ^ 0x8000000080000000;
                auVar324._8_4_ = -auVar263._8_4_;
                auVar324._12_4_ = -auVar263._12_4_;
                auVar125 = ZEXT416((uint)(fVar201 * 1.5 +
                                         fVar200 * -0.5 * fVar201 * fVar201 * fVar201));
                auVar125 = vshufps_avx(auVar125,auVar125,0);
                auVar178._0_4_ = auVar125._0_4_ * auVar126._0_4_ * auVar87._0_4_;
                auVar178._4_4_ = auVar125._4_4_ * auVar126._4_4_ * auVar87._4_4_;
                auVar178._8_4_ = auVar125._8_4_ * auVar126._8_4_ * auVar87._8_4_;
                auVar178._12_4_ = auVar125._12_4_ * auVar126._12_4_ * auVar87._12_4_;
                local_920._0_4_ = auVar263._0_4_ * auVar125._0_4_;
                local_920._4_4_ = auVar263._4_4_ * auVar125._4_4_;
                local_920._8_4_ = auVar263._8_4_ * auVar125._8_4_;
                local_920._12_4_ = auVar263._12_4_ * auVar125._12_4_;
                if (fVar200 < 0.0) {
                  fVar200 = sqrtf(fVar200);
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  fVar200 = auVar95._0_4_;
                }
                auVar95 = vdpps_avx(_local_a20,local_920._0_16_,0x7f);
                fVar199 = ((float)local_a00._0_4_ / fVar200) * (fVar199 + 1.0) +
                          fVar199 * (float)local_a00._0_4_ + auVar182._0_4_;
                auVar87 = vdpps_avx(auVar324,local_920._0_16_,0x7f);
                auVar125 = vdpps_avx(_local_a20,auVar178,0x7f);
                auVar126 = vdpps_avx(_local_8f0,local_920._0_16_,0x7f);
                auVar157 = vdpps_avx(_local_a20,auVar324,0x7f);
                fVar200 = auVar87._0_4_ + auVar125._0_4_;
                fVar201 = auVar95._0_4_;
                auVar92._0_4_ = fVar201 * fVar201;
                auVar92._4_4_ = auVar95._4_4_ * auVar95._4_4_;
                auVar92._8_4_ = auVar95._8_4_ * auVar95._8_4_;
                auVar92._12_4_ = auVar95._12_4_ * auVar95._12_4_;
                auVar125 = vsubps_avx(auVar128,auVar92);
                local_920._0_16_ = ZEXT416((uint)fVar200);
                auVar87 = vdpps_avx(_local_a20,_local_8f0,0x7f);
                fVar202 = auVar157._0_4_ - fVar201 * fVar200;
                fVar201 = auVar87._0_4_ - fVar201 * auVar126._0_4_;
                auVar87 = vrsqrtss_avx(auVar125,auVar125);
                fVar203 = auVar125._0_4_;
                fVar200 = auVar87._0_4_;
                fVar200 = fVar200 * 1.5 + fVar203 * -0.5 * fVar200 * fVar200 * fVar200;
                if (fVar203 < 0.0) {
                  local_8e0._0_4_ = fVar202;
                  local_6c0._0_4_ = fVar201;
                  local_6e0._0_4_ = fVar200;
                  fVar203 = sqrtf(fVar203);
                  fVar200 = (float)local_6e0._0_4_;
                  fVar202 = (float)local_8e0._0_4_;
                  fVar201 = (float)local_6c0._0_4_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar125,auVar125);
                  fVar203 = auVar87._0_4_;
                }
                auVar157 = vpermilps_avx(local_860._0_16_,0xff);
                auVar174 = vshufps_avx(auVar263,auVar263,0xff);
                fVar202 = fVar202 * fVar200 - auVar174._0_4_;
                auVar207._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
                auVar207._8_4_ = auVar126._8_4_ ^ 0x80000000;
                auVar207._12_4_ = auVar126._12_4_ ^ 0x80000000;
                auVar235._0_4_ = -fVar202;
                auVar235._4_4_ = 0x80000000;
                auVar235._8_4_ = 0x80000000;
                auVar235._12_4_ = 0x80000000;
                auVar87 = vinsertps_avx(auVar235,ZEXT416((uint)(fVar201 * fVar200)),0x1c);
                auVar126 = vmovsldup_avx(ZEXT416((uint)(local_920._0_4_ * fVar201 * fVar200 -
                                                       auVar126._0_4_ * fVar202)));
                auVar87 = vdivps_avx(auVar87,auVar126);
                auVar125 = vinsertps_avx(local_920._0_16_,auVar207,0x10);
                auVar125 = vdivps_avx(auVar125,auVar126);
                auVar126 = vmovsldup_avx(auVar95);
                auVar97 = ZEXT416((uint)(fVar203 - auVar157._0_4_));
                auVar157 = vmovsldup_avx(auVar97);
                auVar158._0_4_ = auVar126._0_4_ * auVar87._0_4_ + auVar157._0_4_ * auVar125._0_4_;
                auVar158._4_4_ = auVar126._4_4_ * auVar87._4_4_ + auVar157._4_4_ * auVar125._4_4_;
                auVar158._8_4_ = auVar126._8_4_ * auVar87._8_4_ + auVar157._8_4_ * auVar125._8_4_;
                auVar158._12_4_ =
                     auVar126._12_4_ * auVar87._12_4_ + auVar157._12_4_ * auVar125._12_4_;
                auVar233 = vsubps_avx(auVar233,auVar158);
                auVar159._8_4_ = 0x7fffffff;
                auVar159._0_8_ = 0x7fffffff7fffffff;
                auVar159._12_4_ = 0x7fffffff;
                auVar95 = vandps_avx(auVar95,auVar159);
                if (auVar95._0_4_ < fVar199) {
                  auVar179._8_4_ = 0x7fffffff;
                  auVar179._0_8_ = 0x7fffffff7fffffff;
                  auVar179._12_4_ = 0x7fffffff;
                  auVar95 = vandps_avx(auVar97,auVar179);
                  if (auVar95._0_4_ <
                      (float)local_700._0_4_ * 1.9073486e-06 + fVar199 + auVar182._0_4_) {
                    fVar199 = auVar233._0_4_ + (float)local_810._0_4_;
                    auVar276 = ZEXT3264(local_9c0);
                    if ((fVar173 <= fVar199) &&
                       (fVar200 = *(float *)(ray + k * 4 + 0x80), fVar199 <= fVar200)) {
                      auVar182 = vmovshdup_avx(auVar233);
                      fVar201 = auVar182._0_4_;
                      if ((0.0 <= fVar201) && (fVar201 <= 1.0)) {
                        auVar128 = vrsqrtss_avx(auVar128,auVar128);
                        fVar202 = auVar128._0_4_;
                        pGVar10 = (context->scene->geometries).items[uVar82].ptr;
                        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar128 = ZEXT416((uint)(fVar202 * 1.5 +
                                                   fVar198 * -0.5 * fVar202 * fVar202 * fVar202));
                          auVar128 = vshufps_avx(auVar128,auVar128,0);
                          auVar180._0_4_ = auVar128._0_4_ * (float)local_a20._0_4_;
                          auVar180._4_4_ = auVar128._4_4_ * (float)local_a20._4_4_;
                          auVar180._8_4_ = auVar128._8_4_ * fStack_a18;
                          auVar180._12_4_ = auVar128._12_4_ * fStack_a14;
                          auVar132._0_4_ = auVar263._0_4_ + auVar174._0_4_ * auVar180._0_4_;
                          auVar132._4_4_ = auVar263._4_4_ + auVar174._4_4_ * auVar180._4_4_;
                          auVar132._8_4_ = auVar263._8_4_ + auVar174._8_4_ * auVar180._8_4_;
                          auVar132._12_4_ = auVar263._12_4_ + auVar174._12_4_ * auVar180._12_4_;
                          auVar128 = vshufps_avx(auVar180,auVar180,0xc9);
                          auVar182 = vshufps_avx(auVar263,auVar263,0xc9);
                          auVar181._0_4_ = auVar182._0_4_ * auVar180._0_4_;
                          auVar181._4_4_ = auVar182._4_4_ * auVar180._4_4_;
                          auVar181._8_4_ = auVar182._8_4_ * auVar180._8_4_;
                          auVar181._12_4_ = auVar182._12_4_ * auVar180._12_4_;
                          auVar208._0_4_ = auVar263._0_4_ * auVar128._0_4_;
                          auVar208._4_4_ = auVar263._4_4_ * auVar128._4_4_;
                          auVar208._8_4_ = auVar263._8_4_ * auVar128._8_4_;
                          auVar208._12_4_ = auVar263._12_4_ * auVar128._12_4_;
                          auVar95 = vsubps_avx(auVar208,auVar181);
                          auVar128 = vshufps_avx(auVar95,auVar95,0xc9);
                          auVar182 = vshufps_avx(auVar132,auVar132,0xc9);
                          auVar209._0_4_ = auVar182._0_4_ * auVar128._0_4_;
                          auVar209._4_4_ = auVar182._4_4_ * auVar128._4_4_;
                          auVar209._8_4_ = auVar182._8_4_ * auVar128._8_4_;
                          auVar209._12_4_ = auVar182._12_4_ * auVar128._12_4_;
                          auVar128 = vshufps_avx(auVar95,auVar95,0xd2);
                          auVar133._0_4_ = auVar132._0_4_ * auVar128._0_4_;
                          auVar133._4_4_ = auVar132._4_4_ * auVar128._4_4_;
                          auVar133._8_4_ = auVar132._8_4_ * auVar128._8_4_;
                          auVar133._12_4_ = auVar132._12_4_ * auVar128._12_4_;
                          auVar128 = vsubps_avx(auVar209,auVar133);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar199;
                            uVar2 = vextractps_avx(auVar128,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar128,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(int *)(ray + k * 4 + 0xe0) = auVar128._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar201;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar82;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_630 = vshufps_avx(auVar233,auVar233,0x55);
                            auVar233 = vshufps_avx(auVar128,auVar128,0x55);
                            auStack_650 = vshufps_avx(auVar128,auVar128,0xaa);
                            local_640 = vshufps_avx(auVar128,auVar128,0);
                            local_660 = (RTCHitN  [16])auVar233;
                            local_620 = ZEXT816(0) << 0x20;
                            local_610 = local_680._0_8_;
                            uStack_608 = local_680._8_8_;
                            local_600 = local_670._0_8_;
                            uStack_5f8 = local_670._8_8_;
                            uVar80 = context->user->instID[0];
                            _local_5f0 = CONCAT44(uVar80,uVar80);
                            _uStack_5e8 = CONCAT44(uVar80,uVar80);
                            uVar80 = context->user->instPrimID[0];
                            auVar134._4_4_ = uVar80;
                            auVar134._0_4_ = uVar80;
                            auVar134._8_4_ = uVar80;
                            auVar134._12_4_ = uVar80;
                            auStack_5e0 = auVar134;
                            *(float *)(ray + k * 4 + 0x80) = fVar199;
                            local_840._0_16_ = *local_928;
                            local_a50.valid = (int *)local_840;
                            local_a50.geometryUserPtr = pGVar10->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_660;
                            local_a50.N = 4;
                            auVar128 = *local_928;
                            local_a50.ray = (RTCRayN *)ray;
                            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar10->intersectionFilterN)(&local_a50);
                              auVar329._8_56_ = extraout_var;
                              auVar329._0_8_ = extraout_XMM1_Qa;
                              auVar134 = auVar329._0_16_;
                              auVar276 = ZEXT3264(local_9c0);
                              auVar128 = local_840._0_16_;
                            }
                            if (auVar128 == (undefined1  [16])0x0) {
                              auVar233 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar128 = vpcmpeqd_avx(auVar134,auVar134);
                              auVar233 = auVar233 ^ auVar128;
                            }
                            else {
                              p_Var12 = context->args->filter;
                              auVar182 = vpcmpeqd_avx(auVar233,auVar233);
                              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var12)(&local_a50);
                                auVar276 = ZEXT3264(local_9c0);
                                auVar182 = vpcmpeqd_avx(auVar182,auVar182);
                                auVar128 = local_840._0_16_;
                              }
                              auVar95 = vpcmpeqd_avx(auVar128,_DAT_01f7aa10);
                              auVar233 = auVar95 ^ auVar182;
                              if (auVar128 != (undefined1  [16])0x0) {
                                auVar95 = auVar95 ^ auVar182;
                                auVar128 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                                   local_a50.hit);
                                *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x10));
                                *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x20));
                                *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x30));
                                *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x40));
                                *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x50));
                                *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x60));
                                *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x70));
                                *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                                   (local_a50.hit + 0x80));
                                *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar128;
                              }
                            }
                            auVar93._8_8_ = 0x100000001;
                            auVar93._0_8_ = 0x100000001;
                            if ((auVar93 & auVar233) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar200;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar85 = lVar85 + -1;
                auVar276 = ZEXT3264(local_9c0);
              } while (lVar85 != 0);
              auVar153 = local_4a0;
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar109._4_4_ = uVar2;
              auVar109._0_4_ = uVar2;
              auVar109._8_4_ = uVar2;
              auVar109._12_4_ = uVar2;
              auVar109._16_4_ = uVar2;
              auVar109._20_4_ = uVar2;
              auVar109._24_4_ = uVar2;
              auVar109._28_4_ = uVar2;
              auVar99 = vcmpps_avx(_local_760,auVar109,2);
              local_4a0 = vandps_avx(auVar99,local_4a0);
              auVar329 = ZEXT3264(local_4a0);
              auVar153 = auVar153 & auVar99;
              auVar214 = local_780._0_28_;
            } while ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar153 >> 0x7f,0) != '\0') ||
                       (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar153 >> 0xbf,0) != '\0') ||
                     (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar153[0x1f] < '\0');
            auVar329 = ZEXT3264(local_3a0);
            fVar198 = (float)local_580._0_4_;
            fVar199 = (float)local_580._4_4_;
            fVar200 = fStack_578;
            fVar201 = fStack_574;
            fVar202 = fStack_570;
            fVar203 = fStack_56c;
            fVar204 = fStack_568;
            fVar220 = fStack_564;
          }
          auVar152._0_4_ =
               auVar214._0_4_ * (float)local_7a0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_7c0._0_4_ +
               (float)local_720._0_4_ * (float)local_560._0_4_;
          auVar152._4_4_ =
               auVar214._4_4_ * (float)local_7a0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_7c0._4_4_ +
               (float)local_720._4_4_ * (float)local_560._4_4_;
          auVar152._8_4_ =
               auVar214._8_4_ * fStack_798 + fStack_898 * fStack_7b8 + fStack_718 * fStack_558;
          auVar152._12_4_ =
               auVar214._12_4_ * fStack_794 + fStack_894 * fStack_7b4 + fStack_714 * fStack_554;
          auVar152._16_4_ =
               auVar214._16_4_ * fStack_790 + fStack_890 * fStack_7b0 + fStack_710 * fStack_550;
          auVar152._20_4_ =
               auVar214._20_4_ * fStack_78c + fStack_88c * fStack_7ac + fStack_70c * fStack_54c;
          auVar152._24_4_ =
               auVar214._24_4_ * fStack_788 + fStack_888 * fStack_7a8 + fStack_708 * fStack_548;
          auVar152._28_4_ = fStack_884 + fStack_884 + auVar329._28_4_;
          auVar168._8_4_ = 0x7fffffff;
          auVar168._0_8_ = 0x7fffffff7fffffff;
          auVar168._12_4_ = 0x7fffffff;
          auVar168._16_4_ = 0x7fffffff;
          auVar168._20_4_ = 0x7fffffff;
          auVar168._24_4_ = 0x7fffffff;
          auVar168._28_4_ = 0x7fffffff;
          auVar99 = vandps_avx(auVar152,auVar168);
          auVar169._8_4_ = 0x3e99999a;
          auVar169._0_8_ = 0x3e99999a3e99999a;
          auVar169._12_4_ = 0x3e99999a;
          auVar169._16_4_ = 0x3e99999a;
          auVar169._20_4_ = 0x3e99999a;
          auVar169._24_4_ = 0x3e99999a;
          auVar169._28_4_ = 0x3e99999a;
          auVar99 = vcmpps_avx(auVar99,auVar169,1);
          auVar153 = vorps_avx(auVar99,local_520);
          auVar170._0_4_ = fVar198 + (float)local_880;
          auVar170._4_4_ = fVar199 + local_880._4_4_;
          auVar170._8_4_ = fVar200 + (float)uStack_878;
          auVar170._12_4_ = fVar201 + uStack_878._4_4_;
          auVar170._16_4_ = fVar202 + (float)uStack_870;
          auVar170._20_4_ = fVar203 + uStack_870._4_4_;
          auVar170._24_4_ = fVar204 + (float)uStack_868;
          auVar170._28_4_ = fVar220 + uStack_868._4_4_;
          auVar99 = vcmpps_avx(auVar170,auVar109,2);
          _local_7c0 = vandps_avx(auVar99,local_500);
          auVar171._8_4_ = 3;
          auVar171._0_8_ = 0x300000003;
          auVar171._12_4_ = 3;
          auVar171._16_4_ = 3;
          auVar171._20_4_ = 3;
          auVar171._24_4_ = 3;
          auVar171._28_4_ = 3;
          auVar197._8_4_ = 2;
          auVar197._0_8_ = 0x200000002;
          auVar197._12_4_ = 2;
          auVar197._16_4_ = 2;
          auVar197._20_4_ = 2;
          auVar197._24_4_ = 2;
          auVar197._28_4_ = 2;
          auVar99 = vblendvps_avx(auVar197,auVar171,auVar153);
          auVar74._4_4_ = fStack_53c;
          auVar74._0_4_ = local_540;
          auVar74._8_4_ = fStack_538;
          auVar74._12_4_ = fStack_534;
          auVar233 = vpcmpgtd_avx(auVar99._16_16_,auVar74);
          auVar128 = vpshufd_avx(local_7e0._0_16_,0);
          auVar128 = vpcmpgtd_avx(auVar99._0_16_,auVar128);
          auVar172._16_16_ = auVar233;
          auVar172._0_16_ = auVar109._0_16_;
          _local_7a0 = vblendps_avx(ZEXT1632(auVar128),auVar172,0xf0);
          auVar99 = vandnps_avx(_local_7a0,_local_7c0);
          auVar153 = _local_7c0 & ~_local_7a0;
          local_840 = auVar99;
          if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar153 >> 0x7f,0) != '\0') ||
                (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar153 >> 0xbf,0) != '\0') ||
              (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar153[0x1f] < '\0') {
            local_760._4_4_ = local_880._4_4_ + local_3a0._4_4_;
            local_760._0_4_ = (float)local_880 + local_3a0._0_4_;
            fStack_758 = (float)uStack_878 + local_3a0._8_4_;
            fStack_754 = uStack_878._4_4_ + local_3a0._12_4_;
            fStack_750 = (float)uStack_870 + local_3a0._16_4_;
            fStack_74c = uStack_870._4_4_ + local_3a0._20_4_;
            fStack_748 = (float)uStack_868 + local_3a0._24_4_;
            fStack_744 = uStack_868._4_4_ + local_3a0._28_4_;
            _local_9a0 = local_3a0;
            do {
              auVar111._8_4_ = 0x7f800000;
              auVar111._0_8_ = 0x7f8000007f800000;
              auVar111._12_4_ = 0x7f800000;
              auVar111._16_4_ = 0x7f800000;
              auVar111._20_4_ = 0x7f800000;
              auVar111._24_4_ = 0x7f800000;
              auVar111._28_4_ = 0x7f800000;
              auVar153 = vblendvps_avx(auVar111,_local_9a0,auVar99);
              auVar349 = vshufps_avx(auVar153,auVar153,0xb1);
              auVar349 = vminps_avx(auVar153,auVar349);
              auVar13 = vshufpd_avx(auVar349,auVar349,5);
              auVar349 = vminps_avx(auVar349,auVar13);
              auVar13 = vperm2f128_avx(auVar349,auVar349,1);
              auVar349 = vminps_avx(auVar349,auVar13);
              auVar349 = vcmpps_avx(auVar153,auVar349,0);
              auVar13 = auVar99 & auVar349;
              auVar153 = auVar99;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar153 = vandps_avx(auVar349,auVar99);
              }
              uVar77 = vmovmskps_avx(auVar153);
              uVar80 = 0;
              if (uVar77 != 0) {
                for (; (uVar77 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
                }
              }
              uVar79 = (ulong)uVar80;
              local_840 = auVar99;
              *(undefined4 *)(local_840 + uVar79 * 4) = 0;
              fVar198 = local_1c0[uVar79];
              uVar80 = *(uint *)(local_380 + uVar79 * 4);
              fVar199 = auVar4._0_4_;
              if ((float)local_900._0_4_ < 0.0) {
                fVar199 = sqrtf((float)local_900._0_4_);
              }
              auVar128 = vminps_avx(auVar6,auVar7);
              auVar233 = vmaxps_avx(auVar6,auVar7);
              auVar182 = vminps_avx(auVar5,auVar8);
              auVar95 = vminps_avx(auVar128,auVar182);
              auVar128 = vmaxps_avx(auVar5,auVar8);
              auVar182 = vmaxps_avx(auVar233,auVar128);
              auVar183._8_4_ = 0x7fffffff;
              auVar183._0_8_ = 0x7fffffff7fffffff;
              auVar183._12_4_ = 0x7fffffff;
              auVar233 = vandps_avx(auVar95,auVar183);
              auVar128 = vandps_avx(auVar182,auVar183);
              auVar233 = vmaxps_avx(auVar233,auVar128);
              auVar128 = vmovshdup_avx(auVar233);
              auVar128 = vmaxss_avx(auVar128,auVar233);
              auVar233 = vshufpd_avx(auVar233,auVar233,1);
              auVar233 = vmaxss_avx(auVar233,auVar128);
              local_a00._0_4_ = auVar233._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar199 * 1.9073486e-06;
              local_700._0_16_ = vshufps_avx(auVar182,auVar182,0xff);
              auVar233 = vinsertps_avx(ZEXT416(uVar80),ZEXT416((uint)fVar198),0x10);
              lVar85 = 5;
              do {
                auVar128 = vmovshdup_avx(auVar233);
                fVar230 = auVar128._0_4_;
                fVar202 = 1.0 - fVar230;
                auVar128 = vshufps_avx(auVar233,auVar233,0x55);
                fVar198 = auVar128._0_4_;
                fVar199 = auVar128._4_4_;
                fVar200 = auVar128._8_4_;
                fVar201 = auVar128._12_4_;
                auVar128 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
                fVar203 = auVar128._0_4_;
                fVar204 = auVar128._4_4_;
                fVar220 = auVar128._8_4_;
                fVar221 = auVar128._12_4_;
                fVar222 = local_a70 * fVar198 + local_a80 * fVar203;
                fVar224 = fStack_a6c * fVar199 + fStack_a7c * fVar204;
                fVar226 = fStack_a68 * fVar200 + fStack_a78 * fVar220;
                fVar228 = fStack_a64 * fVar201 + fStack_a74 * fVar221;
                auVar236._0_4_ =
                     fVar203 * (local_a80 * fVar198 + fVar203 * local_a60) + fVar198 * fVar222;
                auVar236._4_4_ =
                     fVar204 * (fStack_a7c * fVar199 + fVar204 * fStack_a5c) + fVar199 * fVar224;
                auVar236._8_4_ =
                     fVar220 * (fStack_a78 * fVar200 + fVar220 * fStack_a58) + fVar200 * fVar226;
                auVar236._12_4_ =
                     fVar221 * (fStack_a74 * fVar201 + fVar221 * fStack_a54) + fVar201 * fVar228;
                auVar184._0_4_ =
                     fVar203 * fVar222 + fVar198 * (fVar198 * local_a90 + local_a70 * fVar203);
                auVar184._4_4_ =
                     fVar204 * fVar224 + fVar199 * (fVar199 * fStack_a8c + fStack_a6c * fVar204);
                auVar184._8_4_ =
                     fVar220 * fVar226 + fVar200 * (fVar200 * fStack_a88 + fStack_a68 * fVar220);
                auVar184._12_4_ =
                     fVar221 * fVar228 + fVar201 * (fVar201 * fStack_a84 + fStack_a64 * fVar221);
                auVar128 = vshufps_avx(auVar233,auVar233,0);
                auVar135._0_4_ = auVar128._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar135._4_4_ = auVar128._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar135._8_4_ = auVar128._8_4_ * fStack_8e8 + 0.0;
                auVar135._12_4_ = auVar128._12_4_ * fStack_8e4 + 0.0;
                auVar94._0_4_ = fVar203 * auVar236._0_4_ + fVar198 * auVar184._0_4_;
                auVar94._4_4_ = fVar204 * auVar236._4_4_ + fVar199 * auVar184._4_4_;
                auVar94._8_4_ = fVar220 * auVar236._8_4_ + fVar200 * auVar184._8_4_;
                auVar94._12_4_ = fVar221 * auVar236._12_4_ + fVar201 * auVar184._12_4_;
                local_860._0_16_ = auVar94;
                auVar128 = vsubps_avx(auVar135,auVar94);
                _local_a20 = auVar128;
                auVar128 = vdpps_avx(auVar128,auVar128,0x7f);
                fVar198 = auVar128._0_4_;
                if (fVar198 < 0.0) {
                  fVar199 = sqrtf(fVar198);
                }
                else {
                  auVar182 = vsqrtss_avx(auVar128,auVar128);
                  fVar199 = auVar182._0_4_;
                }
                auVar182 = vsubps_avx(auVar184,auVar236);
                auVar264._0_4_ = auVar182._0_4_ * 3.0;
                auVar264._4_4_ = auVar182._4_4_ * 3.0;
                auVar264._8_4_ = auVar182._8_4_ * 3.0;
                auVar264._12_4_ = auVar182._12_4_ * 3.0;
                auVar182 = vshufps_avx(ZEXT416((uint)(fVar230 * 6.0)),ZEXT416((uint)(fVar230 * 6.0))
                                       ,0);
                auVar95 = ZEXT416((uint)((fVar202 - (fVar230 + fVar230)) * 6.0));
                auVar87 = vshufps_avx(auVar95,auVar95,0);
                auVar95 = ZEXT416((uint)((fVar230 - (fVar202 + fVar202)) * 6.0));
                auVar125 = vshufps_avx(auVar95,auVar95,0);
                auVar126 = vshufps_avx(ZEXT416((uint)(fVar202 * 6.0)),ZEXT416((uint)(fVar202 * 6.0))
                                       ,0);
                auVar95 = vdpps_avx(auVar264,auVar264,0x7f);
                auVar136._0_4_ =
                     auVar126._0_4_ * local_a60 +
                     auVar125._0_4_ * local_a80 +
                     auVar182._0_4_ * local_a90 + auVar87._0_4_ * local_a70;
                auVar136._4_4_ =
                     auVar126._4_4_ * fStack_a5c +
                     auVar125._4_4_ * fStack_a7c +
                     auVar182._4_4_ * fStack_a8c + auVar87._4_4_ * fStack_a6c;
                auVar136._8_4_ =
                     auVar126._8_4_ * fStack_a58 +
                     auVar125._8_4_ * fStack_a78 +
                     auVar182._8_4_ * fStack_a88 + auVar87._8_4_ * fStack_a68;
                auVar136._12_4_ =
                     auVar126._12_4_ * fStack_a54 +
                     auVar125._12_4_ * fStack_a74 +
                     auVar182._12_4_ * fStack_a84 + auVar87._12_4_ * fStack_a64;
                auVar182 = vblendps_avx(auVar95,_DAT_01f7aa10,0xe);
                auVar87 = vrsqrtss_avx(auVar182,auVar182);
                fVar201 = auVar87._0_4_;
                fVar200 = auVar95._0_4_;
                auVar87 = vdpps_avx(auVar264,auVar136,0x7f);
                auVar125 = vshufps_avx(auVar95,auVar95,0);
                auVar137._0_4_ = auVar136._0_4_ * auVar125._0_4_;
                auVar137._4_4_ = auVar136._4_4_ * auVar125._4_4_;
                auVar137._8_4_ = auVar136._8_4_ * auVar125._8_4_;
                auVar137._12_4_ = auVar136._12_4_ * auVar125._12_4_;
                auVar87 = vshufps_avx(auVar87,auVar87,0);
                auVar210._0_4_ = auVar264._0_4_ * auVar87._0_4_;
                auVar210._4_4_ = auVar264._4_4_ * auVar87._4_4_;
                auVar210._8_4_ = auVar264._8_4_ * auVar87._8_4_;
                auVar210._12_4_ = auVar264._12_4_ * auVar87._12_4_;
                auVar126 = vsubps_avx(auVar137,auVar210);
                auVar87 = vrcpss_avx(auVar182,auVar182);
                auVar182 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(auVar233._0_4_ * (float)local_6a0._0_4_)));
                auVar87 = ZEXT416((uint)(auVar87._0_4_ * (2.0 - fVar200 * auVar87._0_4_)));
                auVar87 = vshufps_avx(auVar87,auVar87,0);
                uVar79 = CONCAT44(auVar264._4_4_,auVar264._0_4_);
                auVar325._0_8_ = uVar79 ^ 0x8000000080000000;
                auVar325._8_4_ = -auVar264._8_4_;
                auVar325._12_4_ = -auVar264._12_4_;
                auVar125 = ZEXT416((uint)(fVar201 * 1.5 +
                                         fVar200 * -0.5 * fVar201 * fVar201 * fVar201));
                auVar125 = vshufps_avx(auVar125,auVar125,0);
                auVar185._0_4_ = auVar125._0_4_ * auVar126._0_4_ * auVar87._0_4_;
                auVar185._4_4_ = auVar125._4_4_ * auVar126._4_4_ * auVar87._4_4_;
                auVar185._8_4_ = auVar125._8_4_ * auVar126._8_4_ * auVar87._8_4_;
                auVar185._12_4_ = auVar125._12_4_ * auVar126._12_4_ * auVar87._12_4_;
                local_920._0_4_ = auVar264._0_4_ * auVar125._0_4_;
                local_920._4_4_ = auVar264._4_4_ * auVar125._4_4_;
                local_920._8_4_ = auVar264._8_4_ * auVar125._8_4_;
                local_920._12_4_ = auVar264._12_4_ * auVar125._12_4_;
                if (fVar200 < 0.0) {
                  fVar200 = sqrtf(fVar200);
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  fVar200 = auVar95._0_4_;
                }
                auVar95 = vdpps_avx(_local_a20,local_920._0_16_,0x7f);
                fVar199 = ((float)local_a00._0_4_ / fVar200) * (fVar199 + 1.0) +
                          fVar199 * (float)local_a00._0_4_ + auVar182._0_4_;
                auVar87 = vdpps_avx(auVar325,local_920._0_16_,0x7f);
                auVar125 = vdpps_avx(_local_a20,auVar185,0x7f);
                auVar126 = vdpps_avx(_local_8f0,local_920._0_16_,0x7f);
                auVar157 = vdpps_avx(_local_a20,auVar325,0x7f);
                fVar200 = auVar87._0_4_ + auVar125._0_4_;
                fVar201 = auVar95._0_4_;
                auVar96._0_4_ = fVar201 * fVar201;
                auVar96._4_4_ = auVar95._4_4_ * auVar95._4_4_;
                auVar96._8_4_ = auVar95._8_4_ * auVar95._8_4_;
                auVar96._12_4_ = auVar95._12_4_ * auVar95._12_4_;
                auVar125 = vsubps_avx(auVar128,auVar96);
                local_920._0_16_ = ZEXT416((uint)fVar200);
                auVar87 = vdpps_avx(_local_a20,_local_8f0,0x7f);
                fVar202 = auVar157._0_4_ - fVar201 * fVar200;
                fVar201 = auVar87._0_4_ - fVar201 * auVar126._0_4_;
                auVar87 = vrsqrtss_avx(auVar125,auVar125);
                fVar203 = auVar125._0_4_;
                fVar200 = auVar87._0_4_;
                fVar200 = fVar200 * 1.5 + fVar203 * -0.5 * fVar200 * fVar200 * fVar200;
                if (fVar203 < 0.0) {
                  local_8e0._0_4_ = fVar202;
                  local_6c0._0_4_ = fVar201;
                  local_6e0._0_4_ = fVar200;
                  fVar203 = sqrtf(fVar203);
                  fVar200 = (float)local_6e0._0_4_;
                  fVar202 = (float)local_8e0._0_4_;
                  fVar201 = (float)local_6c0._0_4_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar125,auVar125);
                  fVar203 = auVar87._0_4_;
                }
                auVar157 = vpermilps_avx(local_860._0_16_,0xff);
                auVar174 = vshufps_avx(auVar264,auVar264,0xff);
                fVar202 = fVar202 * fVar200 - auVar174._0_4_;
                auVar211._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
                auVar211._8_4_ = auVar126._8_4_ ^ 0x80000000;
                auVar211._12_4_ = auVar126._12_4_ ^ 0x80000000;
                auVar237._0_4_ = -fVar202;
                auVar237._4_4_ = 0x80000000;
                auVar237._8_4_ = 0x80000000;
                auVar237._12_4_ = 0x80000000;
                auVar87 = vinsertps_avx(auVar237,ZEXT416((uint)(fVar201 * fVar200)),0x1c);
                auVar126 = vmovsldup_avx(ZEXT416((uint)(local_920._0_4_ * fVar201 * fVar200 -
                                                       auVar126._0_4_ * fVar202)));
                auVar87 = vdivps_avx(auVar87,auVar126);
                auVar125 = vinsertps_avx(local_920._0_16_,auVar211,0x10);
                auVar125 = vdivps_avx(auVar125,auVar126);
                auVar126 = vmovsldup_avx(auVar95);
                auVar97 = ZEXT416((uint)(fVar203 - auVar157._0_4_));
                auVar157 = vmovsldup_avx(auVar97);
                auVar160._0_4_ = auVar126._0_4_ * auVar87._0_4_ + auVar157._0_4_ * auVar125._0_4_;
                auVar160._4_4_ = auVar126._4_4_ * auVar87._4_4_ + auVar157._4_4_ * auVar125._4_4_;
                auVar160._8_4_ = auVar126._8_4_ * auVar87._8_4_ + auVar157._8_4_ * auVar125._8_4_;
                auVar160._12_4_ =
                     auVar126._12_4_ * auVar87._12_4_ + auVar157._12_4_ * auVar125._12_4_;
                auVar233 = vsubps_avx(auVar233,auVar160);
                auVar161._8_4_ = 0x7fffffff;
                auVar161._0_8_ = 0x7fffffff7fffffff;
                auVar161._12_4_ = 0x7fffffff;
                auVar95 = vandps_avx(auVar95,auVar161);
                if (auVar95._0_4_ < fVar199) {
                  auVar186._8_4_ = 0x7fffffff;
                  auVar186._0_8_ = 0x7fffffff7fffffff;
                  auVar186._12_4_ = 0x7fffffff;
                  auVar95 = vandps_avx(auVar97,auVar186);
                  if (auVar95._0_4_ <
                      (float)local_700._0_4_ * 1.9073486e-06 + fVar199 + auVar182._0_4_) {
                    fVar199 = auVar233._0_4_ + (float)local_810._0_4_;
                    auVar276 = ZEXT3264(local_9c0);
                    if ((fVar173 <= fVar199) &&
                       (fVar200 = *(float *)(ray + k * 4 + 0x80), fVar199 <= fVar200)) {
                      auVar182 = vmovshdup_avx(auVar233);
                      fVar201 = auVar182._0_4_;
                      if ((0.0 <= fVar201) && (fVar201 <= 1.0)) {
                        auVar128 = vrsqrtss_avx(auVar128,auVar128);
                        fVar202 = auVar128._0_4_;
                        pGVar10 = (context->scene->geometries).items[uVar82].ptr;
                        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar128 = ZEXT416((uint)(fVar202 * 1.5 +
                                                   fVar198 * -0.5 * fVar202 * fVar202 * fVar202));
                          auVar128 = vshufps_avx(auVar128,auVar128,0);
                          auVar187._0_4_ = auVar128._0_4_ * (float)local_a20._0_4_;
                          auVar187._4_4_ = auVar128._4_4_ * (float)local_a20._4_4_;
                          auVar187._8_4_ = auVar128._8_4_ * fStack_a18;
                          auVar187._12_4_ = auVar128._12_4_ * fStack_a14;
                          auVar138._0_4_ = auVar264._0_4_ + auVar174._0_4_ * auVar187._0_4_;
                          auVar138._4_4_ = auVar264._4_4_ + auVar174._4_4_ * auVar187._4_4_;
                          auVar138._8_4_ = auVar264._8_4_ + auVar174._8_4_ * auVar187._8_4_;
                          auVar138._12_4_ = auVar264._12_4_ + auVar174._12_4_ * auVar187._12_4_;
                          auVar128 = vshufps_avx(auVar187,auVar187,0xc9);
                          auVar182 = vshufps_avx(auVar264,auVar264,0xc9);
                          auVar188._0_4_ = auVar182._0_4_ * auVar187._0_4_;
                          auVar188._4_4_ = auVar182._4_4_ * auVar187._4_4_;
                          auVar188._8_4_ = auVar182._8_4_ * auVar187._8_4_;
                          auVar188._12_4_ = auVar182._12_4_ * auVar187._12_4_;
                          auVar212._0_4_ = auVar264._0_4_ * auVar128._0_4_;
                          auVar212._4_4_ = auVar264._4_4_ * auVar128._4_4_;
                          auVar212._8_4_ = auVar264._8_4_ * auVar128._8_4_;
                          auVar212._12_4_ = auVar264._12_4_ * auVar128._12_4_;
                          auVar95 = vsubps_avx(auVar212,auVar188);
                          auVar128 = vshufps_avx(auVar95,auVar95,0xc9);
                          auVar182 = vshufps_avx(auVar138,auVar138,0xc9);
                          auVar213._0_4_ = auVar182._0_4_ * auVar128._0_4_;
                          auVar213._4_4_ = auVar182._4_4_ * auVar128._4_4_;
                          auVar213._8_4_ = auVar182._8_4_ * auVar128._8_4_;
                          auVar213._12_4_ = auVar182._12_4_ * auVar128._12_4_;
                          auVar128 = vshufps_avx(auVar95,auVar95,0xd2);
                          auVar139._0_4_ = auVar138._0_4_ * auVar128._0_4_;
                          auVar139._4_4_ = auVar138._4_4_ * auVar128._4_4_;
                          auVar139._8_4_ = auVar138._8_4_ * auVar128._8_4_;
                          auVar139._12_4_ = auVar138._12_4_ * auVar128._12_4_;
                          auVar128 = vsubps_avx(auVar213,auVar139);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar199;
                            uVar2 = vextractps_avx(auVar128,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar128,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(int *)(ray + k * 4 + 0xe0) = auVar128._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar201;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar82;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_630 = vshufps_avx(auVar233,auVar233,0x55);
                            auVar233 = vshufps_avx(auVar128,auVar128,0x55);
                            auStack_650 = vshufps_avx(auVar128,auVar128,0xaa);
                            local_640 = vshufps_avx(auVar128,auVar128,0);
                            local_660 = (RTCHitN  [16])auVar233;
                            local_620 = ZEXT816(0) << 0x20;
                            local_610 = local_680._0_8_;
                            uStack_608 = local_680._8_8_;
                            local_600 = local_670._0_8_;
                            uStack_5f8 = local_670._8_8_;
                            uVar80 = context->user->instID[0];
                            _local_5f0 = CONCAT44(uVar80,uVar80);
                            _uStack_5e8 = CONCAT44(uVar80,uVar80);
                            uVar80 = context->user->instPrimID[0];
                            auVar140._4_4_ = uVar80;
                            auVar140._0_4_ = uVar80;
                            auVar140._8_4_ = uVar80;
                            auVar140._12_4_ = uVar80;
                            auStack_5e0 = auVar140;
                            *(float *)(ray + k * 4 + 0x80) = fVar199;
                            local_800 = *local_928;
                            local_a50.valid = (int *)local_800;
                            local_a50.geometryUserPtr = pGVar10->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_660;
                            local_a50.N = 4;
                            local_a50.ray = (RTCRayN *)ray;
                            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar10->intersectionFilterN)(&local_a50);
                              auVar351._8_56_ = extraout_var_00;
                              auVar351._0_8_ = extraout_XMM1_Qa_00;
                              auVar140 = auVar351._0_16_;
                              auVar276 = ZEXT3264(local_9c0);
                            }
                            if (local_800 == (undefined1  [16])0x0) {
                              auVar233 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar128 = vpcmpeqd_avx(auVar140,auVar140);
                              auVar233 = auVar233 ^ auVar128;
                            }
                            else {
                              p_Var12 = context->args->filter;
                              auVar128 = vpcmpeqd_avx(auVar233,auVar233);
                              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var12)(&local_a50);
                                auVar276 = ZEXT3264(local_9c0);
                                auVar128 = vpcmpeqd_avx(auVar128,auVar128);
                              }
                              auVar182 = vpcmpeqd_avx(local_800,_DAT_01f7aa10);
                              auVar233 = auVar182 ^ auVar128;
                              if (local_800 != (undefined1  [16])0x0) {
                                auVar182 = auVar182 ^ auVar128;
                                auVar128 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])
                                                                    local_a50.hit);
                                *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x10));
                                *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x20));
                                *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x30));
                                *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x40));
                                *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x50));
                                *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x60));
                                *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x70));
                                *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar128;
                                auVar128 = vmaskmovps_avx(auVar182,*(undefined1 (*) [16])
                                                                    (local_a50.hit + 0x80));
                                *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar128;
                              }
                            }
                            auVar98._8_8_ = 0x100000001;
                            auVar98._0_8_ = 0x100000001;
                            if ((auVar98 & auVar233) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar200;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar85 = lVar85 + -1;
                auVar276 = ZEXT3264(local_9c0);
              } while (lVar85 != 0);
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar109._4_4_ = uVar2;
              auVar109._0_4_ = uVar2;
              auVar109._8_4_ = uVar2;
              auVar109._12_4_ = uVar2;
              auVar109._16_4_ = uVar2;
              auVar109._20_4_ = uVar2;
              auVar109._24_4_ = uVar2;
              auVar109._28_4_ = uVar2;
              auVar153 = vcmpps_avx(_local_760,auVar109,2);
              auVar99 = vandps_avx(auVar153,local_840);
              auVar153 = local_840 & auVar153;
              local_840 = auVar99;
            } while ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar153 >> 0x7f,0) != '\0') ||
                       (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar153 >> 0xbf,0) != '\0') ||
                     (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar153[0x1f] < '\0');
          }
          auVar391 = ZEXT3264(local_740);
          auVar362 = ZEXT3264(local_980);
          auVar351 = ZEXT3264(local_960);
          auVar329 = ZEXT3264(local_9e0);
          auVar99 = vandps_avx(local_4e0,local_4c0);
          auVar153 = vandps_avx(_local_7c0,_local_7a0);
          auVar218._0_4_ = (float)local_880 + local_3e0._0_4_;
          auVar218._4_4_ = local_880._4_4_ + local_3e0._4_4_;
          auVar218._8_4_ = (float)uStack_878 + local_3e0._8_4_;
          auVar218._12_4_ = uStack_878._4_4_ + local_3e0._12_4_;
          auVar218._16_4_ = (float)uStack_870 + local_3e0._16_4_;
          auVar218._20_4_ = uStack_870._4_4_ + local_3e0._20_4_;
          auVar218._24_4_ = (float)uStack_868 + local_3e0._24_4_;
          auVar218._28_4_ = uStack_868._4_4_ + local_3e0._28_4_;
          auVar349 = vcmpps_avx(auVar218,auVar109,2);
          auVar99 = vandps_avx(auVar349,auVar99);
          auVar219._0_4_ = (float)local_880 + local_3a0._0_4_;
          auVar219._4_4_ = local_880._4_4_ + local_3a0._4_4_;
          auVar219._8_4_ = (float)uStack_878 + local_3a0._8_4_;
          auVar219._12_4_ = uStack_878._4_4_ + local_3a0._12_4_;
          auVar219._16_4_ = (float)uStack_870 + local_3a0._16_4_;
          auVar219._20_4_ = uStack_870._4_4_ + local_3a0._20_4_;
          auVar219._24_4_ = (float)uStack_868 + local_3a0._24_4_;
          auVar219._28_4_ = uStack_868._4_4_ + local_3a0._28_4_;
          auVar349 = vcmpps_avx(auVar219,auVar109,2);
          auVar153 = vandps_avx(auVar349,auVar153);
          auVar153 = vorps_avx(auVar99,auVar153);
          if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar153 >> 0x7f,0) != '\0') ||
                (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar153 >> 0xbf,0) != '\0') ||
              (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar153[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar84 * 0x60) = auVar153;
            auVar99 = vblendvps_avx(local_3a0,_local_3e0,auVar99);
            *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x60) = auVar99;
            uVar3 = vmovlps_avx(local_470);
            (&uStack_140)[uVar84 * 0xc] = uVar3;
            aiStack_138[uVar84 * 0x18] = local_c08 + 1;
            iVar83 = iVar83 + 1;
          }
          goto LAB_01045e27;
        }
      }
      auVar391 = ZEXT3264(local_740);
      auVar362 = ZEXT3264(local_980);
      auVar351 = ZEXT3264(local_960);
      auVar329 = ZEXT3264(local_9e0);
      auVar276 = ZEXT3264(local_9c0);
    }
LAB_01045e27:
    auVar268 = local_420;
    if (iVar83 == 0) break;
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar106._4_4_ = uVar2;
    auVar106._0_4_ = uVar2;
    auVar106._8_4_ = uVar2;
    auVar106._12_4_ = uVar2;
    auVar106._16_4_ = uVar2;
    auVar106._20_4_ = uVar2;
    auVar106._24_4_ = uVar2;
    auVar106._28_4_ = uVar2;
    uVar80 = -iVar83;
    pauVar78 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar83 - 1) * 0x60);
    while( true ) {
      auVar99 = pauVar78[1];
      auVar147._0_4_ = (float)local_880 + auVar99._0_4_;
      auVar147._4_4_ = local_880._4_4_ + auVar99._4_4_;
      auVar147._8_4_ = (float)uStack_878 + auVar99._8_4_;
      auVar147._12_4_ = uStack_878._4_4_ + auVar99._12_4_;
      auVar147._16_4_ = (float)uStack_870 + auVar99._16_4_;
      auVar147._20_4_ = uStack_870._4_4_ + auVar99._20_4_;
      auVar147._24_4_ = (float)uStack_868 + auVar99._24_4_;
      auVar147._28_4_ = uStack_868._4_4_ + auVar99._28_4_;
      auVar349 = vcmpps_avx(auVar147,auVar106,2);
      auVar153 = vandps_avx(auVar349,*pauVar78);
      _local_660 = auVar153;
      auVar349 = *pauVar78 & auVar349;
      if ((((((((auVar349 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar349 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar349 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar349 >> 0x7f,0) != '\0') ||
            (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar349 >> 0xbf,0) != '\0') ||
          (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar349[0x1f] < '\0') break;
      pauVar78 = pauVar78 + -3;
      uVar80 = uVar80 + 1;
      if (uVar80 == 0) goto LAB_010479f4;
    }
    auVar107._8_4_ = 0x7f800000;
    auVar107._0_8_ = 0x7f8000007f800000;
    auVar107._12_4_ = 0x7f800000;
    auVar107._16_4_ = 0x7f800000;
    auVar107._20_4_ = 0x7f800000;
    auVar107._24_4_ = 0x7f800000;
    auVar107._28_4_ = 0x7f800000;
    auVar99 = vblendvps_avx(auVar107,auVar99,auVar153);
    auVar349 = vshufps_avx(auVar99,auVar99,0xb1);
    auVar349 = vminps_avx(auVar99,auVar349);
    auVar13 = vshufpd_avx(auVar349,auVar349,5);
    auVar349 = vminps_avx(auVar349,auVar13);
    auVar13 = vperm2f128_avx(auVar349,auVar349,1);
    auVar349 = vminps_avx(auVar349,auVar13);
    auVar99 = vcmpps_avx(auVar99,auVar349,0);
    auVar349 = auVar153 & auVar99;
    if ((((((((auVar349 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar349 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar349 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar349 >> 0x7f,0) != '\0') ||
          (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar349 >> 0xbf,0) != '\0') ||
        (auVar349 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar349[0x1f] < '\0') {
      auVar153 = vandps_avx(auVar99,auVar153);
    }
    auVar90._8_8_ = 0;
    auVar90._0_8_ = *(ulong *)pauVar78[2];
    local_c08 = *(uint *)(pauVar78[2] + 8);
    uVar81 = vmovmskps_avx(auVar153);
    uVar77 = 0;
    if (uVar81 != 0) {
      for (; (uVar81 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
      }
    }
    *(undefined4 *)(local_660 + (ulong)uVar77 * 4) = 0;
    *pauVar78 = _local_660;
    uVar81 = ~uVar80;
    if ((((((((_local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_660 >> 0x7f,0) != '\0') ||
          (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_660 >> 0xbf,0) != '\0') ||
        (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_660[0x1f] < '\0') {
      uVar81 = -uVar80;
    }
    uVar84 = (ulong)uVar81;
    auVar233 = vshufps_avx(auVar90,auVar90,0);
    auVar128 = vshufps_avx(auVar90,auVar90,0x55);
    auVar128 = vsubps_avx(auVar128,auVar233);
    local_3e0._4_4_ = auVar233._4_4_ + auVar128._4_4_ * 0.14285715;
    local_3e0._0_4_ = auVar233._0_4_ + auVar128._0_4_ * 0.0;
    fStack_3d8 = auVar233._8_4_ + auVar128._8_4_ * 0.2857143;
    fStack_3d4 = auVar233._12_4_ + auVar128._12_4_ * 0.42857146;
    fStack_3d0 = auVar233._0_4_ + auVar128._0_4_ * 0.5714286;
    fStack_3cc = auVar233._4_4_ + auVar128._4_4_ * 0.71428573;
    fStack_3c8 = auVar233._8_4_ + auVar128._8_4_ * 0.8571429;
    fStack_3c4 = auVar233._12_4_ + auVar128._12_4_;
    local_470._8_8_ = 0;
    local_470._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar77 * 4);
  } while( true );
LAB_010479f4:
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar114._4_4_ = uVar2;
  auVar114._0_4_ = uVar2;
  auVar114._8_4_ = uVar2;
  auVar114._12_4_ = uVar2;
  auVar114._16_4_ = uVar2;
  auVar114._20_4_ = uVar2;
  auVar114._24_4_ = uVar2;
  auVar114._28_4_ = uVar2;
  auVar99 = vcmpps_avx(local_320,auVar114,2);
  uVar82 = vmovmskps_avx(auVar99);
  uVar76 = uVar76 - 1 & uVar76 & uVar82;
  if (uVar76 == 0) {
    return;
  }
  goto LAB_01044cec;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }